

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack16.h
# Opt level: O0

void ncnn::convolution_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined1 auVar105 [24];
  undefined1 auVar106 [32];
  undefined1 auVar107 [40];
  undefined1 auVar108 [48];
  undefined1 auVar109 [56];
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined1 auVar118 [24];
  undefined1 auVar119 [32];
  undefined1 auVar120 [40];
  undefined1 auVar121 [48];
  undefined1 auVar122 [56];
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m512 _wf;
  __m512 _we;
  __m512 _wd;
  __m512 _wc;
  __m512 _wb;
  __m512 _wa;
  __m512 _w9;
  __m512 _w8;
  __m512 _w7;
  __m512 _w6;
  __m512 _w5;
  __m512 _w4;
  __m512 _w3;
  __m512 _w2;
  __m512 _w1;
  __m512 _w0;
  __m512 _valf;
  __m512 _vale;
  __m512 _vald;
  __m512 _valc;
  __m512 _valb;
  __m512 _vala;
  __m512 _val9;
  __m512 _val8;
  __m512 _val7;
  __m512 _val6;
  __m512 _val5;
  __m512 _val4;
  __m512 _val3;
  __m512 _val2;
  __m512 _val1;
  __m512 _val0;
  float *slptr;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m512 _sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m512 _b;
  __m512 _a;
  __m512 max;
  __m512 min;
  __mmask16 _is_negative;
  __m512 one;
  __m512 one_7;
  __m512 pow2n_1;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_2;
  __m512i imm0_1;
  __m512 fx_1;
  __m512 tmp_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one_1;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m512 two;
  __m512 one_4;
  __m512 one_5;
  __m512 pow2n_2;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_6;
  __m512i imm0_3;
  __m512 fx_2;
  __m512 tmp_3;
  __m512 y_2;
  __m512 z;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_3;
  __m512i imm0_2;
  allocator_type *in_stack_ffffffffffff8218;
  size_type in_stack_ffffffffffff8220;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff8228;
  undefined8 local_7d80;
  undefined8 uStack_7d78;
  undefined8 uStack_7d70;
  undefined8 uStack_7d68;
  undefined8 uStack_7d60;
  undefined8 uStack_7d58;
  undefined8 uStack_7d50;
  undefined8 uStack_7d48;
  int local_71ec;
  undefined8 local_71e0;
  undefined8 local_71d8;
  undefined8 local_71d0;
  undefined4 local_71c8;
  long local_71c0;
  undefined4 local_71b8;
  undefined4 local_71b4;
  undefined4 local_71b0;
  undefined4 local_71ac;
  undefined4 local_71a8;
  undefined8 local_71a0;
  int local_7194;
  undefined8 local_7190;
  undefined8 local_7188;
  undefined8 local_7180;
  undefined4 local_7178;
  long local_7170;
  undefined4 local_7168;
  undefined4 local_7164;
  undefined4 local_7160;
  undefined4 local_715c;
  undefined4 local_7158;
  undefined8 local_7150;
  undefined1 (*local_7148) [64];
  undefined1 local_7140 [64];
  int local_70d0;
  int local_70cc;
  undefined8 local_70c8;
  undefined8 local_70c0;
  undefined8 local_70b8;
  undefined4 local_70b0;
  long local_70a8;
  undefined4 local_70a0;
  undefined4 local_709c;
  undefined4 local_7098;
  undefined4 local_7094;
  undefined4 local_7090;
  undefined8 local_7088;
  undefined1 (*local_7080) [64];
  int local_7074;
  long local_7070;
  int local_7064;
  int local_7060;
  int local_705c;
  int local_7058;
  int local_7054;
  reference local_7050;
  vector<int,_std::allocator<int>_> local_7030;
  int local_7018;
  int local_7014;
  int local_7010;
  int local_700c;
  int local_7008;
  int local_7004;
  int local_7000;
  int local_6ffc;
  long *local_6ff8;
  long *local_6ff0;
  long *local_6fe8;
  long *local_6fe0;
  undefined8 *local_6fd8;
  undefined8 *local_6fc8;
  undefined8 *local_6fb8;
  undefined8 *local_6f90;
  undefined8 *local_6f70;
  undefined8 *local_6f50;
  undefined1 local_6f45;
  int local_6f44;
  undefined8 *local_6f38;
  undefined8 *local_6f18;
  undefined8 *local_6f10;
  long *local_6f08;
  int local_6efc;
  undefined8 *local_6ef8;
  undefined1 local_6eed;
  int local_6eec;
  undefined8 *local_6ee0;
  undefined1 local_6ebd;
  int local_6ebc;
  undefined8 *local_6eb0;
  undefined1 (*local_6e48) [64];
  undefined1 local_6e40 [64];
  uint local_6dc4;
  undefined1 local_6dc0 [64];
  uint local_6d44;
  undefined1 local_6d40 [64];
  uint local_6cc4;
  undefined1 local_6cc0 [64];
  uint local_6c44;
  undefined1 local_6c40 [64];
  uint local_6bc4;
  undefined1 local_6bc0 [64];
  uint local_6b44;
  undefined1 local_6b40 [64];
  uint local_6ac4;
  undefined1 local_6ac0 [64];
  uint local_6a44;
  undefined1 local_6a40 [64];
  uint local_69c4;
  undefined1 local_69c0 [64];
  uint local_6944;
  undefined1 local_6940 [64];
  uint local_68c4;
  undefined1 local_68c0 [64];
  uint local_6844;
  undefined1 local_6840 [64];
  uint local_67c4;
  undefined1 local_67c0 [64];
  uint local_6744;
  undefined1 local_6740 [64];
  uint local_66c4;
  undefined1 local_66c0 [64];
  uint local_6644;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 uStack_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 uStack_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 uStack_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 uStack_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 uStack_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 uStack_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 uStack_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 uStack_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 uStack_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 uStack_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 uStack_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 uStack_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 uStack_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 uStack_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined8 uStack_62a0;
  undefined8 uStack_6298;
  undefined8 uStack_6290;
  undefined8 uStack_6288;
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 uStack_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 uStack_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 uStack_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 uStack_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 uStack_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 uStack_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 uStack_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 uStack_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 uStack_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 uStack_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 uStack_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 uStack_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  undefined8 uStack_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  undefined8 uStack_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 uStack_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 uStack_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 uStack_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 uStack_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 uStack_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 uStack_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 uStack_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 uStack_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 uStack_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 uStack_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 uStack_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 uStack_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 uStack_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 uStack_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 uStack_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 uStack_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 uStack_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 uStack_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 uStack_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined1 (*local_5a40) [64];
  undefined1 (*local_5a38) [64];
  undefined1 (*local_5a30) [64];
  undefined1 (*local_5a28) [64];
  undefined1 (*local_5a20) [64];
  undefined1 (*local_5a18) [64];
  undefined1 (*local_5a10) [64];
  undefined1 (*local_5a08) [64];
  undefined1 (*local_5a00) [64];
  undefined1 (*local_59f8) [64];
  undefined1 (*local_59f0) [64];
  undefined1 (*local_59e8) [64];
  undefined1 (*local_59e0) [64];
  undefined1 (*local_59d8) [64];
  undefined1 (*local_59d0) [64];
  undefined1 (*local_59c8) [64];
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  allocator_type *paStack_59a8;
  undefined8 uStack_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined1 (*local_5948) [64];
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 uStack_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined8 uStack_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined8 uStack_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 uStack_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 uStack_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  long *local_57d0;
  int local_57c4;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 uStack_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined1 local_5780 [32];
  undefined8 uStack_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5710;
  long *local_5708;
  undefined8 local_5700;
  long *local_56f8;
  undefined8 local_56f0;
  long *local_56e8;
  undefined8 local_56e0;
  long *local_56d8;
  undefined8 local_56d0;
  long *local_56c8;
  undefined1 local_56c0 [64];
  uint local_5644;
  undefined1 local_5640 [64];
  uint local_55c4;
  undefined1 local_55c0 [64];
  uint local_5544;
  undefined1 local_5540 [64];
  uint local_54c4;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 uStack_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 uStack_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 uStack_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 uStack_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 uStack_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  ushort local_5346;
  uint local_5344;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 uStack_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined1 local_5300 [64];
  uint local_5284;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 uStack_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 uStack_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined1 local_5200 [64];
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 uStack_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 uStack_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined1 local_5140 [64];
  undefined4 local_50c4;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 uStack_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 uStack_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 uStack_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 uStack_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 uStack_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 uStack_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined1 local_4f40 [64];
  undefined4 local_4ec4;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 uStack_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 uStack_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 uStack_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 uStack_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 uStack_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined1 local_4d80 [64];
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 uStack_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 uStack_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined1 local_4cc0 [64];
  undefined4 local_4c44;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 uStack_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 uStack_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 uStack_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 uStack_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 uStack_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 uStack_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 uStack_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 uStack_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 uStack_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 uStack_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  ushort local_4902;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 uStack_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 uStack_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 uStack_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined1 local_4840 [64];
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 uStack_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined1 local_47c0 [64];
  undefined1 local_4780 [8];
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 uStack_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  ushort local_4702;
  float local_4700 [16];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [16];
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 uStack_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 uStack_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 uStack_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  float local_4500 [16];
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 uStack_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 uStack_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  float local_4440 [16];
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 uStack_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 uStack_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  float local_4380 [16];
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 uStack_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 uStack_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  float local_42c0 [16];
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 uStack_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 uStack_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  float local_4200 [16];
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 uStack_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  float local_4180 [48];
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 uStack_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  float local_4080 [16];
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 uStack_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 uStack_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 uStack_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 uStack_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  float local_3ec0 [16];
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 uStack_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  float local_3e40 [16];
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 uStack_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [8];
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  ushort local_3d02;
  float local_3d00 [16];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [16];
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 uStack_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 uStack_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 uStack_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 uStack_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  float local_3b00 [16];
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 uStack_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  float local_3a40 [16];
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 uStack_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 uStack_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  float local_3980 [16];
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 uStack_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 uStack_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  float local_38c0 [16];
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 uStack_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 uStack_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  float local_3800 [16];
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 uStack_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  float local_3780 [48];
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 uStack_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  float local_3680 [16];
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 uStack_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 uStack_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 uStack_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 uStack_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 uStack_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  float local_34c0 [16];
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 uStack_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  float local_3440 [16];
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  float local_33c0 [16];
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 uStack_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  ushort local_3302;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 uStack_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  float local_32c0 [16];
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 uStack_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  float local_3240 [16];
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 uStack_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  ushort local_3182;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 uStack_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  float local_3140 [16];
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 uStack_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 uStack_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  float local_3080 [16];
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 uStack_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 uStack_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  float local_2fc0 [16];
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  float local_2f00 [16];
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 uStack_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  float local_2e40 [16];
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined4 local_2c04;
  undefined1 local_2c00 [64];
  undefined4 local_2b84;
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 local_2980 [64];
  undefined4 local_2904;
  undefined1 local_2900 [64];
  undefined4 local_2884;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined4 local_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [64];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [64];
  undefined1 local_2500 [8];
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  ushort local_2482;
  float local_2480 [16];
  undefined1 local_2440 [64];
  undefined1 local_2400 [16];
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280 [16];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  float local_21c0 [16];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  float local_2100 [16];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  float local_2040 [16];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  float local_1f80 [16];
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  float local_1f00 [48];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00 [16];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40 [16];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float local_1bc0 [16];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  float local_1b40 [16];
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  ushort local_1a82;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  float local_1a40 [16];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  float local_1980 [16];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  float local_18c0 [16];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined4 local_1744;
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [8];
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  ushort local_1582;
  undefined1 local_1580 [16];
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined2 local_1502;
  float local_1500 [16];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340 [16];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  float local_12c0 [16];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200 [16];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140 [16];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080 [16];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0 [16];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_f00 [16];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40 [16];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80 [16];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00 [32];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  float local_bc0 [16];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_980 [16];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  ushort local_842;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  float local_800 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740 [16];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [64];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [64];
  undefined4 local_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  int local_500 [16];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [64];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float local_400 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  ushort local_202;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined2 local_12a;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined1 (*local_110) [64];
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  long local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined1 (*local_a0) [64];
  undefined4 local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_7004 = *(int *)((long)in_RDI + 0x2c);
  local_7008 = (int)in_RDI[7];
  local_700c = *(int *)((long)in_RSI + 0x2c);
  local_7010 = (int)in_RSI[6];
  local_7014 = (int)in_RSI[7];
  local_7018 = in_R8D * in_R9D;
  local_7000 = in_R9D;
  local_6ffc = in_R8D;
  local_6ff8 = in_RCX;
  local_6ff0 = in_RDX;
  local_6fe8 = in_RSI;
  local_6fe0 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x399e5d);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffff8228,in_stack_ffffffffffff8220,in_stack_ffffffffffff8218);
  std::allocator<int>::~allocator((allocator<int> *)0x399e89);
  local_7050 = std::vector<int,_std::allocator<int>_>::operator[](&local_7030,0);
  local_7054 = 0;
  local_7058 = 0;
  local_705c = local_7004 * dilation_w - local_6ffc * in_stack_00000008;
  for (local_7060 = 0; local_7060 < local_7000; local_7060 = local_7060 + 1) {
    for (local_7064 = 0; local_7064 < local_6ffc; local_7064 = local_7064 + 1) {
      local_7050[local_7054] = local_7058;
      local_7054 = local_7054 + 1;
      local_7058 = in_stack_00000008 + local_7058;
    }
    local_7058 = local_705c + local_7058;
  }
  local_6f08 = local_6ff8;
  local_7070 = *local_6ff8;
  for (local_7074 = 0; local_7074 < local_7014; local_7074 = local_7074 + 1) {
    local_6f38 = &local_70c8;
    local_8c = *(int *)((long)local_6fe8 + 0x2c);
    local_90 = (int)local_6fe8[6];
    local_94 = *(undefined4 *)((long)local_6fe8 + 0x34);
    local_a0 = (undefined1 (*) [64])(*local_6fe8 + local_6fe8[8] * (long)local_7074 * local_6fe8[2])
    ;
    local_a8 = local_6fe8[2];
    local_ac = (undefined4)local_6fe8[3];
    local_b8 = local_6fe8[4];
    local_88 = &local_70c8;
    local_78 = (long)local_8c * (long)local_90 * local_a8;
    local_6f18 = &local_70c8;
    local_6fd8 = &local_70c8;
    local_7c = 0x10;
    local_6f44 = local_7074;
    local_6f45 = 1;
    local_70c8 = 0;
    local_70b8 = 0;
    local_70b0 = 0;
    local_70a0 = 0;
    local_709c = 0;
    local_7098 = 0;
    local_7094 = 0;
    local_7090 = 0;
    local_7088 = 0;
    local_70c0 = 0;
    local_7080 = local_a0;
    for (local_70cc = 0; local_70cc < local_7010; local_70cc = local_70cc + 1) {
      for (local_70d0 = 0; local_70d0 < local_700c; local_70d0 = local_70d0 + 1) {
        local_7140 = ZEXT1664(ZEXT816(0));
        if (local_7070 != 0) {
          local_6e48 = (undefined1 (*) [64])(local_7070 + (long)(local_7074 << 4) * 4);
          local_7140 = *local_6e48;
        }
        local_6eb0 = &local_7190;
        local_fc = *(int *)((long)local_6ff0 + 0x2c);
        local_100 = (int)local_6ff0[6];
        local_104 = *(undefined4 *)((long)local_6ff0 + 0x34);
        local_110 = (undefined1 (*) [64])
                    (*local_6ff0 + local_6ff0[8] * (long)local_7074 * local_6ff0[2]);
        local_118 = local_6ff0[2];
        local_11c = (undefined4)local_6ff0[3];
        local_128 = local_6ff0[4];
        local_f8 = &local_7190;
        local_58 = (long)local_fc * (long)local_100 * local_118;
        local_6f10 = &local_7190;
        local_6fc8 = &local_7190;
        local_5c = 0x10;
        uStack_5908 = 0;
        uStack_5910 = 0;
        uStack_5918 = 0;
        uStack_5920 = 0;
        uStack_5928 = 0;
        uStack_5930 = 0;
        uStack_5938 = 0;
        local_5940 = 0;
        local_6ebc = local_7074;
        local_6ebd = 1;
        local_7190 = 0;
        local_7180 = 0;
        local_7178 = 0;
        local_7168 = 0;
        local_7164 = 0;
        local_7160 = 0;
        local_715c = 0;
        local_7158 = 0;
        local_7150 = 0;
        local_7188 = 0;
        local_7148 = local_110;
        for (local_7194 = 0; local_7194 < local_7008; local_7194 = local_7194 + 1) {
          local_6ee0 = &local_71e0;
          local_c4 = *(int *)((long)local_6fe0 + 0x2c);
          local_c8 = (int)local_6fe0[6];
          local_cc = *(undefined4 *)((long)local_6fe0 + 0x34);
          local_d8 = *local_6fe0 + local_6fe0[8] * (long)local_7194 * local_6fe0[2];
          local_e0 = local_6fe0[2];
          local_e4 = (undefined4)local_6fe0[3];
          local_f0 = local_6fe0[4];
          local_c0 = &local_71e0;
          local_68 = (long)local_c4 * (long)local_c8 * local_e0;
          local_6efc = local_70cc * stride_w;
          local_6ef8 = &local_71e0;
          for (local_71ec = 0; local_71ec < local_7018; local_71ec = local_71ec + 1) {
            puVar1 = (uint *)(local_d8 + (long)local_c4 * (long)local_6efc * local_e0 +
                              (long)(local_70d0 * dilation_h * 0x10) * 4 +
                             (long)(local_7050[local_71ec] << 4) * 4);
            local_6644 = *puVar1;
            local_66c0 = vbroadcastss_avx512f(ZEXT416(local_6644));
            local_66c4 = puVar1[1];
            local_6740 = vbroadcastss_avx512f(ZEXT416(local_66c4));
            local_6744 = puVar1[2];
            local_67c0 = vbroadcastss_avx512f(ZEXT416(local_6744));
            local_67c4 = puVar1[3];
            local_6840 = vbroadcastss_avx512f(ZEXT416(local_67c4));
            local_6844 = puVar1[4];
            local_68c0 = vbroadcastss_avx512f(ZEXT416(local_6844));
            local_68c4 = puVar1[5];
            local_6940 = vbroadcastss_avx512f(ZEXT416(local_68c4));
            local_6944 = puVar1[6];
            local_69c0 = vbroadcastss_avx512f(ZEXT416(local_6944));
            local_69c4 = puVar1[7];
            local_6a40 = vbroadcastss_avx512f(ZEXT416(local_69c4));
            local_6a44 = puVar1[8];
            local_6ac0 = vbroadcastss_avx512f(ZEXT416(local_6a44));
            local_6ac4 = puVar1[9];
            local_6b40 = vbroadcastss_avx512f(ZEXT416(local_6ac4));
            local_6b44 = puVar1[10];
            local_6bc0 = vbroadcastss_avx512f(ZEXT416(local_6b44));
            local_6bc4 = puVar1[0xb];
            local_6c40 = vbroadcastss_avx512f(ZEXT416(local_6bc4));
            local_6c44 = puVar1[0xc];
            local_6cc0 = vbroadcastss_avx512f(ZEXT416(local_6c44));
            local_6cc4 = puVar1[0xd];
            local_6d40 = vbroadcastss_avx512f(ZEXT416(local_6cc4));
            local_6d44 = puVar1[0xe];
            local_6dc0 = vbroadcastss_avx512f(ZEXT416(local_6d44));
            local_6dc4 = puVar1[0xf];
            local_6e40 = vbroadcastss_avx512f(ZEXT416(local_6dc4));
            local_59c8 = local_7148;
            local_5ac0 = *(undefined8 *)*local_7148;
            uStack_5ab8 = *(undefined8 *)(*local_7148 + 8);
            uStack_5ab0 = *(undefined8 *)(*local_7148 + 0x10);
            uStack_5aa8 = *(undefined8 *)(*local_7148 + 0x18);
            uStack_5aa0 = *(undefined8 *)(*local_7148 + 0x20);
            uStack_5a98 = *(undefined8 *)(*local_7148 + 0x28);
            uStack_5a90 = *(undefined8 *)(*local_7148 + 0x30);
            uStack_5a88 = *(undefined8 *)(*local_7148 + 0x38);
            local_59d0 = local_7148 + 1;
            local_5b80 = *(undefined8 *)*local_59d0;
            uStack_5b78 = *(undefined8 *)(local_7148[1] + 8);
            uStack_5b70 = *(undefined8 *)(local_7148[1] + 0x10);
            uStack_5b68 = *(undefined8 *)(local_7148[1] + 0x18);
            uStack_5b60 = *(undefined8 *)(local_7148[1] + 0x20);
            uStack_5b58 = *(undefined8 *)(local_7148[1] + 0x28);
            uStack_5b50 = *(undefined8 *)(local_7148[1] + 0x30);
            uStack_5b48 = *(undefined8 *)(local_7148[1] + 0x38);
            local_59d8 = local_7148 + 2;
            local_5c40 = *(undefined8 *)*local_59d8;
            uStack_5c38 = *(undefined8 *)(local_7148[2] + 8);
            uStack_5c30 = *(undefined8 *)(local_7148[2] + 0x10);
            uStack_5c28 = *(undefined8 *)(local_7148[2] + 0x18);
            uStack_5c20 = *(undefined8 *)(local_7148[2] + 0x20);
            uStack_5c18 = *(undefined8 *)(local_7148[2] + 0x28);
            uStack_5c10 = *(undefined8 *)(local_7148[2] + 0x30);
            uStack_5c08 = *(undefined8 *)(local_7148[2] + 0x38);
            local_59e0 = local_7148 + 3;
            local_5d00 = *(undefined8 *)*local_59e0;
            uStack_5cf8 = *(undefined8 *)(local_7148[3] + 8);
            uStack_5cf0 = *(undefined8 *)(local_7148[3] + 0x10);
            uStack_5ce8 = *(undefined8 *)(local_7148[3] + 0x18);
            uStack_5ce0 = *(undefined8 *)(local_7148[3] + 0x20);
            uStack_5cd8 = *(undefined8 *)(local_7148[3] + 0x28);
            uStack_5cd0 = *(undefined8 *)(local_7148[3] + 0x30);
            uStack_5cc8 = *(undefined8 *)(local_7148[3] + 0x38);
            local_59e8 = local_7148 + 4;
            local_5dc0 = *(undefined8 *)*local_59e8;
            uStack_5db8 = *(undefined8 *)(local_7148[4] + 8);
            uStack_5db0 = *(undefined8 *)(local_7148[4] + 0x10);
            uStack_5da8 = *(undefined8 *)(local_7148[4] + 0x18);
            uStack_5da0 = *(undefined8 *)(local_7148[4] + 0x20);
            uStack_5d98 = *(undefined8 *)(local_7148[4] + 0x28);
            uStack_5d90 = *(undefined8 *)(local_7148[4] + 0x30);
            uStack_5d88 = *(undefined8 *)(local_7148[4] + 0x38);
            local_59f0 = local_7148 + 5;
            local_5e80 = *(undefined8 *)*local_59f0;
            uStack_5e78 = *(undefined8 *)(local_7148[5] + 8);
            uStack_5e70 = *(undefined8 *)(local_7148[5] + 0x10);
            uStack_5e68 = *(undefined8 *)(local_7148[5] + 0x18);
            uStack_5e60 = *(undefined8 *)(local_7148[5] + 0x20);
            uStack_5e58 = *(undefined8 *)(local_7148[5] + 0x28);
            uStack_5e50 = *(undefined8 *)(local_7148[5] + 0x30);
            uStack_5e48 = *(undefined8 *)(local_7148[5] + 0x38);
            local_59f8 = local_7148 + 6;
            local_5f40 = *(undefined8 *)*local_59f8;
            uStack_5f38 = *(undefined8 *)(local_7148[6] + 8);
            uStack_5f30 = *(undefined8 *)(local_7148[6] + 0x10);
            uStack_5f28 = *(undefined8 *)(local_7148[6] + 0x18);
            uStack_5f20 = *(undefined8 *)(local_7148[6] + 0x20);
            uStack_5f18 = *(undefined8 *)(local_7148[6] + 0x28);
            uStack_5f10 = *(undefined8 *)(local_7148[6] + 0x30);
            uStack_5f08 = *(undefined8 *)(local_7148[6] + 0x38);
            local_5a00 = local_7148 + 7;
            local_6000 = *(undefined8 *)*local_5a00;
            uStack_5ff8 = *(undefined8 *)(local_7148[7] + 8);
            uStack_5ff0 = *(undefined8 *)(local_7148[7] + 0x10);
            uStack_5fe8 = *(undefined8 *)(local_7148[7] + 0x18);
            uStack_5fe0 = *(undefined8 *)(local_7148[7] + 0x20);
            uStack_5fd8 = *(undefined8 *)(local_7148[7] + 0x28);
            uStack_5fd0 = *(undefined8 *)(local_7148[7] + 0x30);
            uStack_5fc8 = *(undefined8 *)(local_7148[7] + 0x38);
            local_5a08 = local_7148 + 8;
            local_60c0 = *(undefined8 *)*local_5a08;
            uStack_60b8 = *(undefined8 *)(local_7148[8] + 8);
            uStack_60b0 = *(undefined8 *)(local_7148[8] + 0x10);
            uStack_60a8 = *(undefined8 *)(local_7148[8] + 0x18);
            uStack_60a0 = *(undefined8 *)(local_7148[8] + 0x20);
            uStack_6098 = *(undefined8 *)(local_7148[8] + 0x28);
            uStack_6090 = *(undefined8 *)(local_7148[8] + 0x30);
            uStack_6088 = *(undefined8 *)(local_7148[8] + 0x38);
            local_5a10 = local_7148 + 9;
            local_6180 = *(undefined8 *)*local_5a10;
            uStack_6178 = *(undefined8 *)(local_7148[9] + 8);
            uStack_6170 = *(undefined8 *)(local_7148[9] + 0x10);
            uStack_6168 = *(undefined8 *)(local_7148[9] + 0x18);
            uStack_6160 = *(undefined8 *)(local_7148[9] + 0x20);
            uStack_6158 = *(undefined8 *)(local_7148[9] + 0x28);
            uStack_6150 = *(undefined8 *)(local_7148[9] + 0x30);
            uStack_6148 = *(undefined8 *)(local_7148[9] + 0x38);
            local_5a18 = local_7148 + 10;
            local_6240 = *(undefined8 *)*local_5a18;
            uStack_6238 = *(undefined8 *)(local_7148[10] + 8);
            uStack_6230 = *(undefined8 *)(local_7148[10] + 0x10);
            uStack_6228 = *(undefined8 *)(local_7148[10] + 0x18);
            uStack_6220 = *(undefined8 *)(local_7148[10] + 0x20);
            uStack_6218 = *(undefined8 *)(local_7148[10] + 0x28);
            uStack_6210 = *(undefined8 *)(local_7148[10] + 0x30);
            uStack_6208 = *(undefined8 *)(local_7148[10] + 0x38);
            local_5a20 = local_7148 + 0xb;
            local_6300 = *(undefined8 *)*local_5a20;
            uStack_62f8 = *(undefined8 *)(local_7148[0xb] + 8);
            uStack_62f0 = *(undefined8 *)(local_7148[0xb] + 0x10);
            uStack_62e8 = *(undefined8 *)(local_7148[0xb] + 0x18);
            uStack_62e0 = *(undefined8 *)(local_7148[0xb] + 0x20);
            uStack_62d8 = *(undefined8 *)(local_7148[0xb] + 0x28);
            uStack_62d0 = *(undefined8 *)(local_7148[0xb] + 0x30);
            uStack_62c8 = *(undefined8 *)(local_7148[0xb] + 0x38);
            local_5a28 = local_7148 + 0xc;
            local_63c0 = *(undefined8 *)*local_5a28;
            uStack_63b8 = *(undefined8 *)(local_7148[0xc] + 8);
            uStack_63b0 = *(undefined8 *)(local_7148[0xc] + 0x10);
            uStack_63a8 = *(undefined8 *)(local_7148[0xc] + 0x18);
            uStack_63a0 = *(undefined8 *)(local_7148[0xc] + 0x20);
            uStack_6398 = *(undefined8 *)(local_7148[0xc] + 0x28);
            uStack_6390 = *(undefined8 *)(local_7148[0xc] + 0x30);
            uStack_6388 = *(undefined8 *)(local_7148[0xc] + 0x38);
            local_5a30 = local_7148 + 0xd;
            local_6480 = *(undefined8 *)*local_5a30;
            uStack_6478 = *(undefined8 *)(local_7148[0xd] + 8);
            uStack_6470 = *(undefined8 *)(local_7148[0xd] + 0x10);
            uStack_6468 = *(undefined8 *)(local_7148[0xd] + 0x18);
            uStack_6460 = *(undefined8 *)(local_7148[0xd] + 0x20);
            uStack_6458 = *(undefined8 *)(local_7148[0xd] + 0x28);
            uStack_6450 = *(undefined8 *)(local_7148[0xd] + 0x30);
            uStack_6448 = *(undefined8 *)(local_7148[0xd] + 0x38);
            local_5a38 = local_7148 + 0xe;
            local_6540 = *(undefined8 *)*local_5a38;
            uStack_6538 = *(undefined8 *)(local_7148[0xe] + 8);
            uStack_6530 = *(undefined8 *)(local_7148[0xe] + 0x10);
            uStack_6528 = *(undefined8 *)(local_7148[0xe] + 0x18);
            uStack_6520 = *(undefined8 *)(local_7148[0xe] + 0x20);
            uStack_6518 = *(undefined8 *)(local_7148[0xe] + 0x28);
            uStack_6510 = *(undefined8 *)(local_7148[0xe] + 0x30);
            uStack_6508 = *(undefined8 *)(local_7148[0xe] + 0x38);
            local_5a40 = local_7148 + 0xf;
            local_6600 = *(undefined8 *)*local_5a40;
            uStack_65f8 = *(undefined8 *)(local_7148[0xf] + 8);
            uStack_65f0 = *(undefined8 *)(local_7148[0xf] + 0x10);
            uStack_65e8 = *(undefined8 *)(local_7148[0xf] + 0x18);
            uStack_65e0 = *(undefined8 *)(local_7148[0xf] + 0x20);
            uStack_65d8 = *(undefined8 *)(local_7148[0xf] + 0x28);
            uStack_65d0 = *(undefined8 *)(local_7148[0xf] + 0x30);
            uStack_65c8 = *(undefined8 *)(local_7148[0xf] + 0x38);
            local_5a80 = local_66c0._0_8_;
            uStack_5a78 = local_66c0._8_8_;
            uStack_5a70 = local_66c0._16_8_;
            uStack_5a68 = local_66c0._24_8_;
            uStack_5a60 = local_66c0._32_8_;
            uStack_5a58 = local_66c0._40_8_;
            uStack_5a50 = local_66c0._48_8_;
            uStack_5a48 = local_66c0._56_8_;
            local_5b00 = local_7140._0_8_;
            uStack_5af8 = local_7140._8_8_;
            uStack_5af0 = local_7140._16_8_;
            uStack_5ae8 = local_7140._24_8_;
            uStack_5ae0 = local_7140._32_8_;
            uStack_5ad8 = local_7140._40_8_;
            uStack_5ad0 = local_7140._48_8_;
            uStack_5ac8 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_7148,local_66c0,local_7140);
            local_5b40 = local_6740._0_8_;
            uStack_5b38 = local_6740._8_8_;
            uStack_5b30 = local_6740._16_8_;
            uStack_5b28 = local_6740._24_8_;
            uStack_5b20 = local_6740._32_8_;
            uStack_5b18 = local_6740._40_8_;
            uStack_5b10 = local_6740._48_8_;
            uStack_5b08 = local_6740._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_5bc0 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_5bb8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_5bb0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_5ba8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_5ba0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_5b98 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_5b90 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_5b88 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_59d0,local_6740,auVar139);
            local_5c00 = local_67c0._0_8_;
            uStack_5bf8 = local_67c0._8_8_;
            uStack_5bf0 = local_67c0._16_8_;
            uStack_5be8 = local_67c0._24_8_;
            uStack_5be0 = local_67c0._32_8_;
            uStack_5bd8 = local_67c0._40_8_;
            uStack_5bd0 = local_67c0._48_8_;
            uStack_5bc8 = local_67c0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_5c80 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_5c78 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_5c70 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_5c68 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_5c60 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_5c58 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_5c50 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_5c48 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_59d8,local_67c0,auVar139);
            local_5cc0 = local_6840._0_8_;
            uStack_5cb8 = local_6840._8_8_;
            uStack_5cb0 = local_6840._16_8_;
            uStack_5ca8 = local_6840._24_8_;
            uStack_5ca0 = local_6840._32_8_;
            uStack_5c98 = local_6840._40_8_;
            uStack_5c90 = local_6840._48_8_;
            uStack_5c88 = local_6840._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_5d40 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_5d38 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_5d30 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_5d28 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_5d20 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_5d18 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_5d10 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_5d08 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_59e0,local_6840,auVar139);
            local_5d80 = local_68c0._0_8_;
            uStack_5d78 = local_68c0._8_8_;
            uStack_5d70 = local_68c0._16_8_;
            uStack_5d68 = local_68c0._24_8_;
            uStack_5d60 = local_68c0._32_8_;
            uStack_5d58 = local_68c0._40_8_;
            uStack_5d50 = local_68c0._48_8_;
            uStack_5d48 = local_68c0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_5e00 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_5df8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_5df0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_5de8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_5de0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_5dd8 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_5dd0 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_5dc8 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_59e8,local_68c0,auVar139);
            local_5e40 = local_6940._0_8_;
            uStack_5e38 = local_6940._8_8_;
            uStack_5e30 = local_6940._16_8_;
            uStack_5e28 = local_6940._24_8_;
            uStack_5e20 = local_6940._32_8_;
            uStack_5e18 = local_6940._40_8_;
            uStack_5e10 = local_6940._48_8_;
            uStack_5e08 = local_6940._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_5ec0 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_5eb8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_5eb0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_5ea8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_5ea0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_5e98 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_5e90 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_5e88 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_59f0,local_6940,auVar139);
            local_5f00 = local_69c0._0_8_;
            uStack_5ef8 = local_69c0._8_8_;
            uStack_5ef0 = local_69c0._16_8_;
            uStack_5ee8 = local_69c0._24_8_;
            uStack_5ee0 = local_69c0._32_8_;
            uStack_5ed8 = local_69c0._40_8_;
            uStack_5ed0 = local_69c0._48_8_;
            uStack_5ec8 = local_69c0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_5f80 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_5f78 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_5f70 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_5f68 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_5f60 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_5f58 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_5f50 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_5f48 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_59f8,local_69c0,auVar139);
            local_5fc0 = local_6a40._0_8_;
            uStack_5fb8 = local_6a40._8_8_;
            uStack_5fb0 = local_6a40._16_8_;
            uStack_5fa8 = local_6a40._24_8_;
            uStack_5fa0 = local_6a40._32_8_;
            uStack_5f98 = local_6a40._40_8_;
            uStack_5f90 = local_6a40._48_8_;
            uStack_5f88 = local_6a40._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6040 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_6038 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_6030 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_6028 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_6020 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6018 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6010 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6008 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a00,local_6a40,auVar139);
            local_6080 = local_6ac0._0_8_;
            uStack_6078 = local_6ac0._8_8_;
            uStack_6070 = local_6ac0._16_8_;
            uStack_6068 = local_6ac0._24_8_;
            uStack_6060 = local_6ac0._32_8_;
            uStack_6058 = local_6ac0._40_8_;
            uStack_6050 = local_6ac0._48_8_;
            uStack_6048 = local_6ac0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6100 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_60f8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_60f0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_60e8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_60e0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_60d8 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_60d0 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_60c8 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a08,local_6ac0,auVar139);
            local_6140 = local_6b40._0_8_;
            uStack_6138 = local_6b40._8_8_;
            uStack_6130 = local_6b40._16_8_;
            uStack_6128 = local_6b40._24_8_;
            uStack_6120 = local_6b40._32_8_;
            uStack_6118 = local_6b40._40_8_;
            uStack_6110 = local_6b40._48_8_;
            uStack_6108 = local_6b40._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_61c0 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_61b8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_61b0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_61a8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_61a0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6198 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6190 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6188 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a10,local_6b40,auVar139);
            local_6200 = local_6bc0._0_8_;
            uStack_61f8 = local_6bc0._8_8_;
            uStack_61f0 = local_6bc0._16_8_;
            uStack_61e8 = local_6bc0._24_8_;
            uStack_61e0 = local_6bc0._32_8_;
            uStack_61d8 = local_6bc0._40_8_;
            uStack_61d0 = local_6bc0._48_8_;
            uStack_61c8 = local_6bc0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6280 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_6278 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_6270 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_6268 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_6260 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6258 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6250 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6248 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a18,local_6bc0,auVar139);
            local_62c0 = local_6c40._0_8_;
            uStack_62b8 = local_6c40._8_8_;
            uStack_62b0 = local_6c40._16_8_;
            uStack_62a8 = local_6c40._24_8_;
            uStack_62a0 = local_6c40._32_8_;
            uStack_6298 = local_6c40._40_8_;
            uStack_6290 = local_6c40._48_8_;
            uStack_6288 = local_6c40._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6340 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_6338 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_6330 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_6328 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_6320 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6318 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6310 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6308 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a20,local_6c40,auVar139);
            local_6380 = local_6cc0._0_8_;
            uStack_6378 = local_6cc0._8_8_;
            uStack_6370 = local_6cc0._16_8_;
            uStack_6368 = local_6cc0._24_8_;
            uStack_6360 = local_6cc0._32_8_;
            uStack_6358 = local_6cc0._40_8_;
            uStack_6350 = local_6cc0._48_8_;
            uStack_6348 = local_6cc0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6400 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_63f8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_63f0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_63e8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_63e0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_63d8 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_63d0 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_63c8 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a28,local_6cc0,auVar139);
            local_6440 = local_6d40._0_8_;
            uStack_6438 = local_6d40._8_8_;
            uStack_6430 = local_6d40._16_8_;
            uStack_6428 = local_6d40._24_8_;
            uStack_6420 = local_6d40._32_8_;
            uStack_6418 = local_6d40._40_8_;
            uStack_6410 = local_6d40._48_8_;
            uStack_6408 = local_6d40._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_64c0 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_64b8 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_64b0 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_64a8 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_64a0 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6498 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6490 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6488 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a30,local_6d40,auVar139);
            local_6500 = local_6dc0._0_8_;
            uStack_64f8 = local_6dc0._8_8_;
            uStack_64f0 = local_6dc0._16_8_;
            uStack_64e8 = local_6dc0._24_8_;
            uStack_64e0 = local_6dc0._32_8_;
            uStack_64d8 = local_6dc0._40_8_;
            uStack_64d0 = local_6dc0._48_8_;
            uStack_64c8 = local_6dc0._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6580 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_6578 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_6570 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_6568 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_6560 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6558 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6550 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6548 = local_7140._56_8_;
            auVar139 = vfmadd213ps_avx512f(*local_5a38,local_6dc0,auVar139);
            local_65c0 = local_6e40._0_8_;
            uStack_65b8 = local_6e40._8_8_;
            uStack_65b0 = local_6e40._16_8_;
            uStack_65a8 = local_6e40._24_8_;
            uStack_65a0 = local_6e40._32_8_;
            uStack_6598 = local_6e40._40_8_;
            uStack_6590 = local_6e40._48_8_;
            uStack_6588 = local_6e40._56_8_;
            local_7140._0_8_ = auVar139._0_8_;
            local_6640 = local_7140._0_8_;
            local_7140._8_8_ = auVar139._8_8_;
            uStack_6638 = local_7140._8_8_;
            local_7140._16_8_ = auVar139._16_8_;
            uStack_6630 = local_7140._16_8_;
            local_7140._24_8_ = auVar139._24_8_;
            uStack_6628 = local_7140._24_8_;
            local_7140._32_8_ = auVar139._32_8_;
            uStack_6620 = local_7140._32_8_;
            local_7140._40_8_ = auVar139._40_8_;
            uStack_6618 = local_7140._40_8_;
            local_7140._48_8_ = auVar139._48_8_;
            uStack_6610 = local_7140._48_8_;
            local_7140._56_8_ = auVar139._56_8_;
            uStack_6608 = local_7140._56_8_;
            local_7140 = vfmadd213ps_avx512f(*local_5a40,local_6e40,auVar139);
            local_7148 = local_7148 + 0x10;
          }
          local_6fb8 = &local_71e0;
          local_6c = 0x10;
          local_6eec = local_7194;
          local_6eed = 1;
          local_71e0 = 0;
          local_71d0 = 0;
          local_71c8 = 0;
          local_71b8 = 0;
          local_71b4 = 0;
          local_71b0 = 0;
          local_71ac = 0;
          local_71a8 = 0;
          local_71a0 = 0;
          local_71d8 = 0;
          local_6f90 = local_6fb8;
          local_71c0 = local_f0;
        }
        local_57c0 = local_7140._0_8_;
        uStack_57b8 = local_7140._8_8_;
        uStack_57b0 = local_7140._16_8_;
        uStack_57a8 = local_7140._24_8_;
        uStack_57a0 = local_7140._32_8_;
        uStack_5798 = local_7140._40_8_;
        uStack_5790 = local_7140._48_8_;
        uStack_5788 = local_7140._56_8_;
        local_57c4 = stride_h;
        local_57d0 = (long *)CONCAT44(in_stack_00000034,activation_type);
        switch(stride_h) {
        case 1:
          local_54c0 = 0;
          uStack_54b8 = 0;
          uStack_54b0 = 0;
          uStack_54a8 = 0;
          uStack_54a0 = 0;
          uStack_5498 = 0;
          uStack_5490 = 0;
          uStack_5488 = 0;
          local_5440 = local_7140._0_8_;
          uStack_5438 = local_7140._8_8_;
          uStack_5430 = local_7140._16_8_;
          uStack_5428 = local_7140._24_8_;
          uStack_5420 = local_7140._32_8_;
          uStack_5418 = local_7140._40_8_;
          uStack_5410 = local_7140._48_8_;
          uStack_5408 = local_7140._56_8_;
          local_5480 = 0;
          uStack_5478 = 0;
          uStack_5470 = 0;
          uStack_5468 = 0;
          uStack_5460 = 0;
          uStack_5458 = 0;
          uStack_5450 = 0;
          uStack_5448 = 0;
          _local_5780 = vmaxps_avx512f(local_7140,ZEXT1664(ZEXT816(0)));
          break;
        case 2:
          local_56d0 = 0;
          local_5344 = *(uint *)*local_57d0;
          local_5340 = local_7140._0_8_;
          uStack_5338 = local_7140._8_8_;
          uStack_5330 = local_7140._16_8_;
          uStack_5328 = local_7140._24_8_;
          uStack_5320 = local_7140._32_8_;
          uStack_5318 = local_7140._40_8_;
          uStack_5310 = local_7140._48_8_;
          uStack_5308 = local_7140._56_8_;
          local_5280 = 0;
          uStack_5278 = 0;
          uStack_5270 = 0;
          uStack_5268 = 0;
          uStack_5260 = 0;
          uStack_5258 = 0;
          uStack_5250 = 0;
          uStack_5248 = 0;
          uVar17 = vcmpps_avx512f(local_7140,ZEXT1664(ZEXT816(0)),1);
          local_5346 = (ushort)uVar17;
          local_5300 = vbroadcastss_avx512f(ZEXT416(local_5344));
          local_4900 = local_7140._0_8_;
          uVar97 = local_4900;
          uStack_48f8 = local_7140._8_8_;
          uVar98 = uStack_48f8;
          uStack_48f0 = local_7140._16_8_;
          uVar99 = uStack_48f0;
          uStack_48e8 = local_7140._24_8_;
          uVar100 = uStack_48e8;
          uStack_48e0 = local_7140._32_8_;
          uVar101 = uStack_48e0;
          uStack_48d8 = local_7140._40_8_;
          uVar102 = uStack_48d8;
          uStack_48d0 = local_7140._48_8_;
          uVar103 = uStack_48d0;
          uStack_48c8 = local_7140._56_8_;
          uVar104 = uStack_48c8;
          local_4980 = local_7140._0_8_;
          uStack_4978 = local_7140._8_8_;
          uStack_4970 = local_7140._16_8_;
          uStack_4968 = local_7140._24_8_;
          uStack_4960 = local_7140._32_8_;
          uStack_4958 = local_7140._40_8_;
          uStack_4950 = local_7140._48_8_;
          uStack_4948 = local_7140._56_8_;
          local_49c0 = local_5300._0_8_;
          uStack_49b8 = local_5300._8_8_;
          uStack_49b0 = local_5300._16_8_;
          uStack_49a8 = local_5300._24_8_;
          uStack_49a0 = local_5300._32_8_;
          uStack_4998 = local_5300._40_8_;
          uStack_4990 = local_5300._48_8_;
          uStack_4988 = local_5300._56_8_;
          local_4880 = local_7140._0_8_;
          uStack_4878 = local_7140._8_8_;
          uStack_4870 = local_7140._16_8_;
          uStack_4868 = local_7140._24_8_;
          uStack_4860 = local_7140._32_8_;
          uStack_4858 = local_7140._40_8_;
          uStack_4850 = local_7140._48_8_;
          uStack_4848 = local_7140._56_8_;
          local_48c0 = local_5300._0_8_;
          uStack_48b8 = local_5300._8_8_;
          uStack_48b0 = local_5300._16_8_;
          uStack_48a8 = local_5300._24_8_;
          uStack_48a0 = local_5300._32_8_;
          uStack_4898 = local_5300._40_8_;
          uStack_4890 = local_5300._48_8_;
          uStack_4888 = local_5300._56_8_;
          local_4900._0_4_ = local_7140._0_4_;
          local_4900._4_4_ = local_7140._4_4_;
          uStack_48f8._0_4_ = local_7140._8_4_;
          uStack_48f8._4_4_ = local_7140._12_4_;
          uStack_48f0._0_4_ = local_7140._16_4_;
          uStack_48f0._4_4_ = local_7140._20_4_;
          uStack_48e8._0_4_ = local_7140._24_4_;
          uStack_48e8._4_4_ = local_7140._28_4_;
          uStack_48e0._0_4_ = local_7140._32_4_;
          uStack_48e0._4_4_ = local_7140._36_4_;
          uStack_48d8._0_4_ = local_7140._40_4_;
          uStack_48d8._4_4_ = local_7140._44_4_;
          uStack_48d0._0_4_ = local_7140._48_4_;
          uStack_48d0._4_4_ = local_7140._52_4_;
          uStack_48c8._0_4_ = local_7140._56_4_;
          uStack_48c8._4_4_ = local_7140._60_4_;
          auVar139 = vmulps_avx512f(local_7140,local_5300);
          bVar2 = (bool)((byte)uVar17 & 1);
          bVar3 = (bool)((byte)(local_5346 >> 1) & 1);
          bVar4 = (bool)((byte)(local_5346 >> 2) & 1);
          bVar5 = (bool)((byte)(local_5346 >> 3) & 1);
          bVar6 = (bool)((byte)(local_5346 >> 4) & 1);
          bVar7 = (bool)((byte)(local_5346 >> 5) & 1);
          bVar8 = (bool)((byte)(local_5346 >> 6) & 1);
          bVar9 = (bool)((byte)(local_5346 >> 7) & 1);
          bVar10 = (byte)((ulong)uVar17 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          local_5780._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * local_4900._4_4_;
          local_5780._0_4_ = (uint)bVar2 * auVar139._0_4_ | (uint)!bVar2 * (int)local_4900;
          local_5780._12_4_ = (uint)bVar5 * auVar139._12_4_ | (uint)!bVar5 * uStack_48f8._4_4_;
          local_5780._8_4_ = (uint)bVar4 * auVar139._8_4_ | (uint)!bVar4 * (int)uStack_48f8;
          local_5780._20_4_ = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * uStack_48f0._4_4_;
          local_5780._16_4_ = (uint)bVar6 * auVar139._16_4_ | (uint)!bVar6 * (int)uStack_48f0;
          local_5780._28_4_ = (uint)bVar9 * auVar139._28_4_ | (uint)!bVar9 * uStack_48e8._4_4_;
          local_5780._24_4_ = (uint)bVar8 * auVar139._24_4_ | (uint)!bVar8 * (int)uStack_48e8;
          uStack_5760._4_4_ = (uint)bVar11 * auVar139._36_4_ | (uint)!bVar11 * uStack_48e0._4_4_;
          uStack_5760._0_4_ =
               (uint)(bVar10 & 1) * auVar139._32_4_ | (uint)!(bool)(bVar10 & 1) * (int)uStack_48e0;
          uStack_5758._4_4_ = (uint)bVar13 * auVar139._44_4_ | (uint)!bVar13 * uStack_48d8._4_4_;
          uStack_5758._0_4_ = (uint)bVar12 * auVar139._40_4_ | (uint)!bVar12 * (int)uStack_48d8;
          uStack_5750._4_4_ = (uint)bVar15 * auVar139._52_4_ | (uint)!bVar15 * uStack_48d0._4_4_;
          uStack_5750._0_4_ = (uint)bVar14 * auVar139._48_4_ | (uint)!bVar14 * (int)uStack_48d0;
          uStack_5748._4_4_ =
               (uint)(bVar10 >> 7) * auVar139._60_4_ |
               (uint)!(bool)(bVar10 >> 7) * uStack_48c8._4_4_;
          uStack_5748._0_4_ = (uint)bVar16 * auVar139._56_4_ | (uint)!bVar16 * (int)uStack_48c8;
          local_56c8 = local_57d0;
          local_5284 = local_5344;
          local_4902 = local_5346;
          local_4900 = uVar97;
          uStack_48f8 = uVar98;
          uStack_48f0 = uVar99;
          uStack_48e8 = uVar100;
          uStack_48e0 = uVar101;
          uStack_48d8 = uVar102;
          uStack_48d0 = uVar103;
          uStack_48c8 = uVar104;
          break;
        case 3:
          local_56e0 = 0;
          local_54c4 = *(uint *)*local_57d0;
          local_5540 = vbroadcastss_avx512f(ZEXT416(local_54c4));
          local_5840 = local_5540._0_8_;
          uStack_5838 = local_5540._8_8_;
          uStack_5830 = local_5540._16_8_;
          uStack_5828 = local_5540._24_8_;
          uStack_5820 = local_5540._32_8_;
          uStack_5818 = local_5540._40_8_;
          uStack_5810 = local_5540._48_8_;
          uStack_5808 = local_5540._56_8_;
          local_56f0 = 1;
          local_5544 = *(uint *)(*local_57d0 + 4);
          local_55c0 = vbroadcastss_avx512f(ZEXT416(local_5544));
          local_5880 = local_55c0._0_8_;
          uStack_5878 = local_55c0._8_8_;
          uStack_5870 = local_55c0._16_8_;
          uStack_5868 = local_55c0._24_8_;
          uStack_5860 = local_55c0._32_8_;
          uStack_5858 = local_55c0._40_8_;
          uStack_5850 = local_55c0._48_8_;
          uStack_5848 = local_55c0._56_8_;
          local_53c0 = local_7140._0_8_;
          uStack_53b8 = local_7140._8_8_;
          uStack_53b0 = local_7140._16_8_;
          uStack_53a8 = local_7140._24_8_;
          uStack_53a0 = local_7140._32_8_;
          uStack_5398 = local_7140._40_8_;
          uStack_5390 = local_7140._48_8_;
          uStack_5388 = local_7140._56_8_;
          local_5400 = local_5540._0_8_;
          uStack_53f8 = local_5540._8_8_;
          uStack_53f0 = local_5540._16_8_;
          uStack_53e8 = local_5540._24_8_;
          uStack_53e0 = local_5540._32_8_;
          uStack_53d8 = local_5540._40_8_;
          uStack_53d0 = local_5540._48_8_;
          uStack_53c8 = local_5540._56_8_;
          local_5200 = vmaxps_avx512f(local_7140,local_5540);
          local_5240 = local_55c0._0_8_;
          uStack_5238 = local_55c0._8_8_;
          uStack_5230 = local_55c0._16_8_;
          uStack_5228 = local_55c0._24_8_;
          uStack_5220 = local_55c0._32_8_;
          uStack_5218 = local_55c0._40_8_;
          uStack_5210 = local_55c0._48_8_;
          uStack_5208 = local_55c0._56_8_;
          _local_5780 = vminps_avx512f(local_5200,local_55c0);
          local_56e8 = local_57d0;
          local_56d8 = local_57d0;
          break;
        case 4:
          local_5180 = local_7140._0_8_;
          uStack_5178 = local_7140._8_8_;
          uStack_5170 = local_7140._16_8_;
          uStack_5168 = local_7140._24_8_;
          uStack_5160 = local_7140._32_8_;
          uStack_5158 = local_7140._40_8_;
          uStack_5150 = local_7140._48_8_;
          uStack_5148 = local_7140._56_8_;
          local_50c4 = 0x3f800000;
          local_5140 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          local_51c0 = local_5140._0_8_;
          uStack_51b8 = local_5140._8_8_;
          uStack_51b0 = local_5140._16_8_;
          uStack_51a8 = local_5140._24_8_;
          uStack_51a0 = local_5140._32_8_;
          uStack_5198 = local_5140._40_8_;
          uStack_5190 = local_5140._48_8_;
          uStack_5188 = local_5140._56_8_;
          local_4fc0 = 0;
          uStack_4fb8 = 0;
          uStack_4fb0 = 0;
          uStack_4fa8 = 0;
          uStack_4fa0 = 0;
          uStack_4f98 = 0;
          uStack_4f90 = 0;
          uStack_4f88 = 0;
          local_5080 = 0;
          uStack_5078 = 0;
          uStack_5070 = 0;
          uStack_5068 = 0;
          uStack_5060 = 0;
          uStack_5058 = 0;
          uStack_5050 = 0;
          uStack_5048 = 0;
          local_50c0 = local_7140._0_8_;
          uStack_50b8 = local_7140._8_8_;
          uStack_50b0 = local_7140._16_8_;
          uStack_50a8 = local_7140._24_8_;
          uStack_50a0 = local_7140._32_8_;
          uStack_5098 = local_7140._40_8_;
          uStack_5090 = local_7140._48_8_;
          uStack_5088 = local_7140._56_8_;
          auVar139 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_7140);
          local_3500 = 0;
          uStack_34f8 = 0;
          uStack_34f0 = 0;
          uStack_34e8 = 0;
          uStack_34e0 = 0;
          uStack_34d8 = 0;
          uStack_34d0 = 0;
          uStack_34c8 = 0;
          local_3d00[0] = 1.0;
          local_3d00[1] = 1.0;
          local_3d00[2] = 1.0;
          local_3d00[3] = 1.0;
          local_3d00[4] = 1.0;
          local_3d00[5] = 1.0;
          local_3d00[6] = 1.0;
          local_3d00[7] = 1.0;
          local_3d00[8] = 1.0;
          local_3d00[9] = 1.0;
          local_3d00[10] = 1.0;
          local_3d00[0xb] = 1.0;
          local_3d00[0xc] = 1.0;
          local_3d00[0xd] = 1.0;
          local_3d00[0xe] = 1.0;
          local_3d00[0xf] = 1.0;
          local_3c00._0_8_ = auVar139._0_8_;
          local_3c00._8_8_ = auVar139._8_8_;
          local_3c00._16_8_ = auVar139._16_8_;
          local_3c00._24_8_ = auVar139._24_8_;
          local_3c00._32_8_ = auVar139._32_8_;
          local_3c00._40_8_ = auVar139._40_8_;
          local_3c00._48_8_ = auVar139._48_8_;
          local_3c00._56_8_ = auVar139._56_8_;
          local_3400 = local_3c00._0_8_;
          uStack_33f8 = local_3c00._8_8_;
          uStack_33f0 = local_3c00._16_8_;
          uStack_33e8 = local_3c00._24_8_;
          uStack_33e0 = local_3c00._32_8_;
          uStack_33d8 = local_3c00._40_8_;
          uStack_33d0 = local_3c00._48_8_;
          uStack_33c8 = local_3c00._56_8_;
          local_3440[0] = 88.37626;
          local_3440[1] = 88.37626;
          local_3440[2] = 88.37626;
          local_3440[3] = 88.37626;
          local_3440[4] = 88.37626;
          local_3440[5] = 88.37626;
          local_3440[6] = 88.37626;
          local_3440[7] = 88.37626;
          local_3440[8] = 88.37626;
          local_3440[9] = 88.37626;
          local_3440[10] = 88.37626;
          local_3440[0xb] = 88.37626;
          local_3440[0xc] = 88.37626;
          local_3440[0xd] = 88.37626;
          local_3440[0xe] = 88.37626;
          local_3440[0xf] = 88.37626;
          auVar35._8_4_ = 88.37626;
          auVar35._12_4_ = 88.37626;
          auVar35._0_4_ = 88.37626;
          auVar35._4_4_ = 88.37626;
          auVar35._16_4_ = 88.37626;
          auVar35._20_4_ = 88.37626;
          auVar35._24_4_ = 88.37626;
          auVar35._28_4_ = 88.37626;
          auVar35._32_4_ = 88.37626;
          auVar35._36_4_ = 88.37626;
          auVar35._40_4_ = 88.37626;
          auVar35._44_4_ = 88.37626;
          auVar35._48_4_ = 88.37626;
          auVar35._52_4_ = 88.37626;
          auVar35._56_4_ = 88.37626;
          auVar35._60_4_ = 88.37626;
          auVar139 = vminps_avx512f(auVar139,auVar35);
          local_3c00._0_8_ = auVar139._0_8_;
          local_3c00._8_8_ = auVar139._8_8_;
          local_3c00._16_8_ = auVar139._16_8_;
          local_3c00._24_8_ = auVar139._24_8_;
          local_3c00._32_8_ = auVar139._32_8_;
          local_3c00._40_8_ = auVar139._40_8_;
          local_3c00._48_8_ = auVar139._48_8_;
          local_3c00._56_8_ = auVar139._56_8_;
          local_3480 = local_3c00._0_8_;
          uStack_3478 = local_3c00._8_8_;
          uStack_3470 = local_3c00._16_8_;
          uStack_3468 = local_3c00._24_8_;
          uStack_3460 = local_3c00._32_8_;
          uStack_3458 = local_3c00._40_8_;
          uStack_3450 = local_3c00._48_8_;
          uStack_3448 = local_3c00._56_8_;
          local_34c0[0] = -88.37626;
          local_34c0[1] = -88.37626;
          local_34c0[2] = -88.37626;
          local_34c0[3] = -88.37626;
          local_34c0[4] = -88.37626;
          local_34c0[5] = -88.37626;
          local_34c0[6] = -88.37626;
          local_34c0[7] = -88.37626;
          local_34c0[8] = -88.37626;
          local_34c0[9] = -88.37626;
          local_34c0[10] = -88.37626;
          local_34c0[0xb] = -88.37626;
          local_34c0[0xc] = -88.37626;
          local_34c0[0xd] = -88.37626;
          local_34c0[0xe] = -88.37626;
          local_34c0[0xf] = -88.37626;
          auVar34._8_4_ = -88.37626;
          auVar34._12_4_ = -88.37626;
          auVar34._0_4_ = -88.37626;
          auVar34._4_4_ = -88.37626;
          auVar34._16_4_ = -88.37626;
          auVar34._20_4_ = -88.37626;
          auVar34._24_4_ = -88.37626;
          auVar34._28_4_ = -88.37626;
          auVar34._32_4_ = -88.37626;
          auVar34._36_4_ = -88.37626;
          auVar34._40_4_ = -88.37626;
          auVar34._44_4_ = -88.37626;
          auVar34._48_4_ = -88.37626;
          auVar34._52_4_ = -88.37626;
          auVar34._56_4_ = -88.37626;
          auVar34._60_4_ = -88.37626;
          auVar139 = vmaxps_avx512f(auVar139,auVar34);
          local_3c00._0_8_ = auVar139._0_8_;
          local_3c00._8_8_ = auVar139._8_8_;
          local_3c00._16_8_ = auVar139._16_8_;
          local_3c00._24_8_ = auVar139._24_8_;
          local_3c00._32_8_ = auVar139._32_8_;
          local_3c00._40_8_ = auVar139._40_8_;
          local_3c00._48_8_ = auVar139._48_8_;
          local_3c00._56_8_ = auVar139._56_8_;
          local_36c0 = local_3c00._0_8_;
          uStack_36b8 = local_3c00._8_8_;
          uStack_36b0 = local_3c00._16_8_;
          uStack_36a8 = local_3c00._24_8_;
          uStack_36a0 = local_3c00._32_8_;
          uStack_3698 = local_3c00._40_8_;
          uStack_3690 = local_3c00._48_8_;
          uStack_3688 = local_3c00._56_8_;
          local_3780[0x20] = 1.442695;
          local_3780[0x21] = 1.442695;
          local_3780[0x22] = 1.442695;
          local_3780[0x23] = 1.442695;
          local_3780[0x24] = 1.442695;
          local_3780[0x25] = 1.442695;
          local_3780[0x26] = 1.442695;
          local_3780[0x27] = 1.442695;
          local_3780[0x28] = 1.442695;
          local_3780[0x29] = 1.442695;
          local_3780[0x2a] = 1.442695;
          local_3780[0x2b] = 1.442695;
          local_3780[0x2c] = 1.442695;
          local_3780[0x2d] = 1.442695;
          local_3780[0x2e] = 1.442695;
          local_3780[0x2f] = 1.442695;
          local_3780[0x10] = 0.5;
          local_3780[0x11] = 0.5;
          local_3780[0x12] = 0.5;
          local_3780[0x13] = 0.5;
          local_3780[0x14] = 0.5;
          local_3780[0x15] = 0.5;
          local_3780[0x16] = 0.5;
          local_3780[0x17] = 0.5;
          local_3780[0x18] = 0.5;
          local_3780[0x19] = 0.5;
          local_3780[0x1a] = 0.5;
          local_3780[0x1b] = 0.5;
          local_3780[0x1c] = 0.5;
          local_3780[0x1d] = 0.5;
          local_3780[0x1e] = 0.5;
          local_3780[0x1f] = 0.5;
          auVar32._8_4_ = 1.442695;
          auVar32._12_4_ = 1.442695;
          auVar32._0_4_ = 1.442695;
          auVar32._4_4_ = 1.442695;
          auVar32._16_4_ = 1.442695;
          auVar32._20_4_ = 1.442695;
          auVar32._24_4_ = 1.442695;
          auVar32._28_4_ = 1.442695;
          auVar32._32_4_ = 1.442695;
          auVar32._36_4_ = 1.442695;
          auVar32._40_4_ = 1.442695;
          auVar32._44_4_ = 1.442695;
          auVar32._48_4_ = 1.442695;
          auVar32._52_4_ = 1.442695;
          auVar32._56_4_ = 1.442695;
          auVar32._60_4_ = 1.442695;
          auVar31._8_4_ = 0.5;
          auVar31._12_4_ = 0.5;
          auVar31._0_4_ = 0.5;
          auVar31._4_4_ = 0.5;
          auVar31._16_4_ = 0.5;
          auVar31._20_4_ = 0.5;
          auVar31._24_4_ = 0.5;
          auVar31._28_4_ = 0.5;
          auVar31._32_4_ = 0.5;
          auVar31._36_4_ = 0.5;
          auVar31._40_4_ = 0.5;
          auVar31._44_4_ = 0.5;
          auVar31._48_4_ = 0.5;
          auVar31._52_4_ = 0.5;
          auVar31._56_4_ = 0.5;
          auVar31._60_4_ = 0.5;
          auVar140 = vfmadd213ps_avx512f(auVar32,auVar139,auVar31);
          auVar141 = vrndscaleps_avx512f(auVar140,1);
          uVar17 = vcmpps_avx512f(auVar140,auVar141,1);
          local_3d02 = (ushort)uVar17;
          local_3c40._0_8_ = auVar141._0_8_;
          local_3c40._8_8_ = auVar141._8_8_;
          local_3c40._16_8_ = auVar141._16_8_;
          local_3c40._24_8_ = auVar141._24_8_;
          local_3c40._32_8_ = auVar141._32_8_;
          local_3c40._40_8_ = auVar141._40_8_;
          local_3c40._48_8_ = auVar141._48_8_;
          local_3c40._56_8_ = auVar141._56_8_;
          local_3300 = local_3c40._0_8_;
          uVar97 = local_3300;
          uStack_32f8 = local_3c40._8_8_;
          uVar98 = uStack_32f8;
          uStack_32f0 = local_3c40._16_8_;
          uVar99 = uStack_32f0;
          uStack_32e8 = local_3c40._24_8_;
          uVar100 = uStack_32e8;
          uStack_32e0 = local_3c40._32_8_;
          uVar101 = uStack_32e0;
          uStack_32d8 = local_3c40._40_8_;
          uVar102 = uStack_32d8;
          uStack_32d0 = local_3c40._48_8_;
          uVar103 = uStack_32d0;
          uStack_32c8 = local_3c40._56_8_;
          uVar104 = uStack_32c8;
          local_3380 = local_3c40._0_8_;
          uStack_3378 = local_3c40._8_8_;
          uStack_3370 = local_3c40._16_8_;
          uStack_3368 = local_3c40._24_8_;
          uStack_3360 = local_3c40._32_8_;
          uStack_3358 = local_3c40._40_8_;
          uStack_3350 = local_3c40._48_8_;
          uStack_3348 = local_3c40._56_8_;
          local_33c0[0] = 1.0;
          local_33c0[1] = 1.0;
          local_33c0[2] = 1.0;
          local_33c0[3] = 1.0;
          local_33c0[4] = 1.0;
          local_33c0[5] = 1.0;
          local_33c0[6] = 1.0;
          local_33c0[7] = 1.0;
          local_33c0[8] = 1.0;
          local_33c0[9] = 1.0;
          local_33c0[10] = 1.0;
          local_33c0[0xb] = 1.0;
          local_33c0[0xc] = 1.0;
          local_33c0[0xd] = 1.0;
          local_33c0[0xe] = 1.0;
          local_33c0[0xf] = 1.0;
          local_3280 = local_3c40._0_8_;
          uStack_3278 = local_3c40._8_8_;
          uStack_3270 = local_3c40._16_8_;
          uStack_3268 = local_3c40._24_8_;
          uStack_3260 = local_3c40._32_8_;
          uStack_3258 = local_3c40._40_8_;
          uStack_3250 = local_3c40._48_8_;
          uStack_3248 = local_3c40._56_8_;
          local_32c0[0] = 1.0;
          local_32c0[1] = 1.0;
          local_32c0[2] = 1.0;
          local_32c0[3] = 1.0;
          local_32c0[4] = 1.0;
          local_32c0[5] = 1.0;
          local_32c0[6] = 1.0;
          local_32c0[7] = 1.0;
          local_32c0[8] = 1.0;
          local_32c0[9] = 1.0;
          local_32c0[10] = 1.0;
          local_32c0[0xb] = 1.0;
          local_32c0[0xc] = 1.0;
          local_32c0[0xd] = 1.0;
          local_32c0[0xe] = 1.0;
          local_32c0[0xf] = 1.0;
          auVar36._8_4_ = 1.0;
          auVar36._12_4_ = 1.0;
          auVar36._0_4_ = 1.0;
          auVar36._4_4_ = 1.0;
          auVar36._16_4_ = 1.0;
          auVar36._20_4_ = 1.0;
          auVar36._24_4_ = 1.0;
          auVar36._28_4_ = 1.0;
          auVar36._32_4_ = 1.0;
          auVar36._36_4_ = 1.0;
          auVar36._40_4_ = 1.0;
          auVar36._44_4_ = 1.0;
          auVar36._48_4_ = 1.0;
          auVar36._52_4_ = 1.0;
          auVar36._56_4_ = 1.0;
          auVar36._60_4_ = 1.0;
          local_3300._0_4_ = auVar141._0_4_;
          local_3300._4_4_ = auVar141._4_4_;
          uStack_32f8._0_4_ = auVar141._8_4_;
          uStack_32f8._4_4_ = auVar141._12_4_;
          uStack_32f0._0_4_ = auVar141._16_4_;
          uStack_32f0._4_4_ = auVar141._20_4_;
          uStack_32e8._0_4_ = auVar141._24_4_;
          uStack_32e8._4_4_ = auVar141._28_4_;
          uStack_32e0._0_4_ = auVar141._32_4_;
          uStack_32e0._4_4_ = auVar141._36_4_;
          uStack_32d8._0_4_ = auVar141._40_4_;
          uStack_32d8._4_4_ = auVar141._44_4_;
          uStack_32d0._0_4_ = auVar141._48_4_;
          uStack_32d0._4_4_ = auVar141._52_4_;
          uStack_32c8._0_4_ = auVar141._56_4_;
          uStack_32c8._4_4_ = auVar141._60_4_;
          auVar140 = vsubps_avx512f(auVar141,auVar36);
          bVar2 = (bool)((byte)uVar17 & 1);
          bVar3 = (bool)((byte)(local_3d02 >> 1) & 1);
          bVar4 = (bool)((byte)(local_3d02 >> 2) & 1);
          bVar5 = (bool)((byte)(local_3d02 >> 3) & 1);
          bVar6 = (bool)((byte)(local_3d02 >> 4) & 1);
          bVar7 = (bool)((byte)(local_3d02 >> 5) & 1);
          bVar8 = (bool)((byte)(local_3d02 >> 6) & 1);
          bVar9 = (bool)((byte)(local_3d02 >> 7) & 1);
          bVar10 = (byte)((ulong)uVar17 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          local_3c80._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * local_3300._4_4_;
          local_3c80._0_4_ = (uint)bVar2 * auVar140._0_4_ | (uint)!bVar2 * (int)local_3300;
          local_3c80._8_4_ = (uint)bVar4 * auVar140._8_4_ | (uint)!bVar4 * (int)uStack_32f8;
          local_3c80._12_4_ = (uint)bVar5 * auVar140._12_4_ | (uint)!bVar5 * uStack_32f8._4_4_;
          uStack_3c70._0_4_ = (uint)bVar6 * auVar140._16_4_ | (uint)!bVar6 * (int)uStack_32f0;
          uStack_3c70._4_4_ = (uint)bVar7 * auVar140._20_4_ | (uint)!bVar7 * uStack_32f0._4_4_;
          auVar105 = _local_3c80;
          uStack_3c68._0_4_ = (uint)bVar8 * auVar140._24_4_ | (uint)!bVar8 * (int)uStack_32e8;
          uStack_3c68._4_4_ = (uint)bVar9 * auVar140._28_4_ | (uint)!bVar9 * uStack_32e8._4_4_;
          auVar106 = _local_3c80;
          uStack_3c60._0_4_ =
               (uint)(bVar10 & 1) * auVar140._32_4_ | (uint)!(bool)(bVar10 & 1) * (int)uStack_32e0;
          uStack_3c60._4_4_ = (uint)bVar11 * auVar140._36_4_ | (uint)!bVar11 * uStack_32e0._4_4_;
          auVar107 = _local_3c80;
          uStack_3c58._0_4_ = (uint)bVar12 * auVar140._40_4_ | (uint)!bVar12 * (int)uStack_32d8;
          uStack_3c58._4_4_ = (uint)bVar13 * auVar140._44_4_ | (uint)!bVar13 * uStack_32d8._4_4_;
          auVar108 = _local_3c80;
          uStack_3c50._0_4_ = (uint)bVar14 * auVar140._48_4_ | (uint)!bVar14 * (int)uStack_32d0;
          uStack_3c50._4_4_ = (uint)bVar15 * auVar140._52_4_ | (uint)!bVar15 * uStack_32d0._4_4_;
          auVar109 = _local_3c80;
          uStack_3c48._0_4_ = (uint)bVar16 * auVar140._56_4_ | (uint)!bVar16 * (int)uStack_32c8;
          uStack_3c48._4_4_ =
               (uint)(bVar10 >> 7) * auVar140._60_4_ |
               (uint)!(bool)(bVar10 >> 7) * uStack_32c8._4_4_;
          auVar140 = _local_3c80;
          uStack_3c70 = auVar105._16_8_;
          uStack_3c68 = auVar106._24_8_;
          uStack_3c60 = auVar107._32_8_;
          uStack_3c58 = auVar108._40_8_;
          uStack_3c50 = auVar109._48_8_;
          uStack_3c48 = auVar140._56_8_;
          local_2f80 = local_3c80._0_8_;
          uStack_2f78 = local_3c80._8_8_;
          uStack_2f70 = uStack_3c70;
          uStack_2f68 = uStack_3c68;
          uStack_2f60 = uStack_3c60;
          uStack_2f58 = uStack_3c58;
          uStack_2f50 = uStack_3c50;
          uStack_2f48 = uStack_3c48;
          local_2fc0[0] = 0.6933594;
          local_2fc0[1] = 0.6933594;
          local_2fc0[2] = 0.6933594;
          local_2fc0[3] = 0.6933594;
          local_2fc0[4] = 0.6933594;
          local_2fc0[5] = 0.6933594;
          local_2fc0[6] = 0.6933594;
          local_2fc0[7] = 0.6933594;
          local_2fc0[8] = 0.6933594;
          local_2fc0[9] = 0.6933594;
          local_2fc0[10] = 0.6933594;
          local_2fc0[0xb] = 0.6933594;
          local_2fc0[0xc] = 0.6933594;
          local_2fc0[0xd] = 0.6933594;
          local_2fc0[0xe] = 0.6933594;
          local_2fc0[0xf] = 0.6933594;
          local_3000 = local_3c00._0_8_;
          uStack_2ff8 = local_3c00._8_8_;
          uStack_2ff0 = local_3c00._16_8_;
          uStack_2fe8 = local_3c00._24_8_;
          uStack_2fe0 = local_3c00._32_8_;
          uStack_2fd8 = local_3c00._40_8_;
          uStack_2fd0 = local_3c00._48_8_;
          uStack_2fc8 = local_3c00._56_8_;
          auVar41._16_8_ = uStack_3c70;
          auVar41._0_16_ = local_3c80;
          auVar41._24_8_ = uStack_3c68;
          auVar41._32_8_ = uStack_3c60;
          auVar41._40_8_ = uStack_3c58;
          auVar41._48_8_ = uStack_3c50;
          auVar41._56_8_ = uStack_3c48;
          auVar40._8_4_ = 0.6933594;
          auVar40._12_4_ = 0.6933594;
          auVar40._0_4_ = 0.6933594;
          auVar40._4_4_ = 0.6933594;
          auVar40._16_4_ = 0.6933594;
          auVar40._20_4_ = 0.6933594;
          auVar40._24_4_ = 0.6933594;
          auVar40._28_4_ = 0.6933594;
          auVar40._32_4_ = 0.6933594;
          auVar40._36_4_ = 0.6933594;
          auVar40._40_4_ = 0.6933594;
          auVar40._44_4_ = 0.6933594;
          auVar40._48_4_ = 0.6933594;
          auVar40._52_4_ = 0.6933594;
          auVar40._56_4_ = 0.6933594;
          auVar40._60_4_ = 0.6933594;
          auVar139 = vfnmadd213ps_avx512f(auVar40,auVar41,auVar139);
          local_3c00._0_8_ = auVar139._0_8_;
          local_3c00._8_8_ = auVar139._8_8_;
          local_3c00._16_8_ = auVar139._16_8_;
          local_3c00._24_8_ = auVar139._24_8_;
          local_3c00._32_8_ = auVar139._32_8_;
          local_3c00._40_8_ = auVar139._40_8_;
          local_3c00._48_8_ = auVar139._48_8_;
          local_3c00._56_8_ = auVar139._56_8_;
          local_3040 = local_3c80._0_8_;
          uStack_3038 = local_3c80._8_8_;
          uStack_3030 = uStack_3c70;
          uStack_3028 = uStack_3c68;
          uStack_3020 = uStack_3c60;
          uStack_3018 = uStack_3c58;
          uStack_3010 = uStack_3c50;
          uStack_3008 = uStack_3c48;
          local_3080[0] = -0.00021219444;
          local_3080[1] = -0.00021219444;
          local_3080[2] = -0.00021219444;
          local_3080[3] = -0.00021219444;
          local_3080[4] = -0.00021219444;
          local_3080[5] = -0.00021219444;
          local_3080[6] = -0.00021219444;
          local_3080[7] = -0.00021219444;
          local_3080[8] = -0.00021219444;
          local_3080[9] = -0.00021219444;
          local_3080[10] = -0.00021219444;
          local_3080[0xb] = -0.00021219444;
          local_3080[0xc] = -0.00021219444;
          local_3080[0xd] = -0.00021219444;
          local_3080[0xe] = -0.00021219444;
          local_3080[0xf] = -0.00021219444;
          local_30c0 = local_3c00._0_8_;
          uStack_30b8 = local_3c00._8_8_;
          uStack_30b0 = local_3c00._16_8_;
          uStack_30a8 = local_3c00._24_8_;
          uStack_30a0 = local_3c00._32_8_;
          uStack_3098 = local_3c00._40_8_;
          uStack_3090 = local_3c00._48_8_;
          uStack_3088 = local_3c00._56_8_;
          auVar39._16_8_ = uStack_3c70;
          auVar39._0_16_ = local_3c80;
          auVar39._24_8_ = uStack_3c68;
          auVar39._32_8_ = uStack_3c60;
          auVar39._40_8_ = uStack_3c58;
          auVar39._48_8_ = uStack_3c50;
          auVar39._56_8_ = uStack_3c48;
          auVar38._8_4_ = -0.00021219444;
          auVar38._12_4_ = -0.00021219444;
          auVar38._0_4_ = -0.00021219444;
          auVar38._4_4_ = -0.00021219444;
          auVar38._16_4_ = -0.00021219444;
          auVar38._20_4_ = -0.00021219444;
          auVar38._24_4_ = -0.00021219444;
          auVar38._28_4_ = -0.00021219444;
          auVar38._32_4_ = -0.00021219444;
          auVar38._36_4_ = -0.00021219444;
          auVar38._40_4_ = -0.00021219444;
          auVar38._44_4_ = -0.00021219444;
          auVar38._48_4_ = -0.00021219444;
          auVar38._52_4_ = -0.00021219444;
          auVar38._56_4_ = -0.00021219444;
          auVar38._60_4_ = -0.00021219444;
          local_3c00 = vfnmadd213ps_avx512f(auVar38,auVar39,auVar139);
          local_3540 = local_3c00._0_8_;
          uStack_3538 = local_3c00._8_8_;
          uStack_3530 = local_3c00._16_8_;
          uStack_3528 = local_3c00._24_8_;
          uStack_3520 = local_3c00._32_8_;
          uStack_3518 = local_3c00._40_8_;
          uStack_3510 = local_3c00._48_8_;
          uStack_3508 = local_3c00._56_8_;
          local_3580 = local_3c00._0_8_;
          uStack_3578 = local_3c00._8_8_;
          uStack_3570 = local_3c00._16_8_;
          uStack_3568 = local_3c00._24_8_;
          uStack_3560 = local_3c00._32_8_;
          uStack_3558 = local_3c00._40_8_;
          uStack_3550 = local_3c00._48_8_;
          uStack_3548 = local_3c00._56_8_;
          local_3c40 = vmulps_avx512f(local_3c00,local_3c00);
          uStack_3d78._0_4_ = 0.00019875691;
          uStack_3d78._4_4_ = 0.00019875691;
          local_3d80._0_4_ = 0.00019875691;
          local_3d80._4_4_ = 0.00019875691;
          local_3780[0] = 0.00019875691;
          local_3780[1] = 0.00019875691;
          local_3780[2] = 0.00019875691;
          local_3780[3] = 0.00019875691;
          local_3780[4] = 0.00019875691;
          local_3780[5] = 0.00019875691;
          local_3780[6] = 0.00019875691;
          local_3780[7] = 0.00019875691;
          local_3780[8] = 0.00019875691;
          local_3780[9] = 0.00019875691;
          local_3780[10] = 0.00019875691;
          local_3780[0xb] = 0.00019875691;
          local_3780[0xc] = 0.00019875691;
          local_3780[0xd] = 0.00019875691;
          local_3780[0xe] = 0.00019875691;
          local_3780[0xf] = 0.00019875691;
          local_37c0 = local_3c00._0_8_;
          uStack_37b8 = local_3c00._8_8_;
          uStack_37b0 = local_3c00._16_8_;
          uStack_37a8 = local_3c00._24_8_;
          uStack_37a0 = local_3c00._32_8_;
          uStack_3798 = local_3c00._40_8_;
          uStack_3790 = local_3c00._48_8_;
          uStack_3788 = local_3c00._56_8_;
          local_3800[0] = 0.0013981999;
          local_3800[1] = 0.0013981999;
          local_3800[2] = 0.0013981999;
          local_3800[3] = 0.0013981999;
          local_3800[4] = 0.0013981999;
          local_3800[5] = 0.0013981999;
          local_3800[6] = 0.0013981999;
          local_3800[7] = 0.0013981999;
          local_3800[8] = 0.0013981999;
          local_3800[9] = 0.0013981999;
          local_3800[10] = 0.0013981999;
          local_3800[0xb] = 0.0013981999;
          local_3800[0xc] = 0.0013981999;
          local_3800[0xd] = 0.0013981999;
          local_3800[0xe] = 0.0013981999;
          local_3800[0xf] = 0.0013981999;
          auVar30._16_4_ = 0.00019875691;
          auVar30._20_4_ = 0.00019875691;
          auVar30._0_16_ = _local_3d80;
          auVar30._24_4_ = 0.00019875691;
          auVar30._28_4_ = 0.00019875691;
          auVar30._32_4_ = 0.00019875691;
          auVar30._36_4_ = 0.00019875691;
          auVar30._40_4_ = 0.00019875691;
          auVar30._44_4_ = 0.00019875691;
          auVar30._48_4_ = 0.00019875691;
          auVar30._52_4_ = 0.00019875691;
          auVar30._56_4_ = 0.00019875691;
          auVar30._60_4_ = 0.00019875691;
          auVar29._8_4_ = 0.0013981999;
          auVar29._12_4_ = 0.0013981999;
          auVar29._0_4_ = 0.0013981999;
          auVar29._4_4_ = 0.0013981999;
          auVar29._16_4_ = 0.0013981999;
          auVar29._20_4_ = 0.0013981999;
          auVar29._24_4_ = 0.0013981999;
          auVar29._28_4_ = 0.0013981999;
          auVar29._32_4_ = 0.0013981999;
          auVar29._36_4_ = 0.0013981999;
          auVar29._40_4_ = 0.0013981999;
          auVar29._44_4_ = 0.0013981999;
          auVar29._48_4_ = 0.0013981999;
          auVar29._52_4_ = 0.0013981999;
          auVar29._56_4_ = 0.0013981999;
          auVar29._60_4_ = 0.0013981999;
          auVar139 = vfmadd213ps_avx512f(local_3c00,auVar30,auVar29);
          local_3d80 = auVar139._0_8_;
          uStack_3d78 = auVar139._8_8_;
          uStack_3d70 = auVar139._16_8_;
          uStack_3d68 = auVar139._24_8_;
          uStack_3d60 = auVar139._32_8_;
          uStack_3d58 = auVar139._40_8_;
          uStack_3d50 = auVar139._48_8_;
          uStack_3d48 = auVar139._56_8_;
          local_3840 = local_3d80;
          uStack_3838 = uStack_3d78;
          uStack_3830 = uStack_3d70;
          uStack_3828 = uStack_3d68;
          uStack_3820 = uStack_3d60;
          uStack_3818 = uStack_3d58;
          uStack_3810 = uStack_3d50;
          uStack_3808 = uStack_3d48;
          local_3880 = local_3c00._0_8_;
          uStack_3878 = local_3c00._8_8_;
          uStack_3870 = local_3c00._16_8_;
          uStack_3868 = local_3c00._24_8_;
          uStack_3860 = local_3c00._32_8_;
          uStack_3858 = local_3c00._40_8_;
          uStack_3850 = local_3c00._48_8_;
          uStack_3848 = local_3c00._56_8_;
          local_38c0[0] = 0.008333452;
          local_38c0[1] = 0.008333452;
          local_38c0[2] = 0.008333452;
          local_38c0[3] = 0.008333452;
          local_38c0[4] = 0.008333452;
          local_38c0[5] = 0.008333452;
          local_38c0[6] = 0.008333452;
          local_38c0[7] = 0.008333452;
          local_38c0[8] = 0.008333452;
          local_38c0[9] = 0.008333452;
          local_38c0[10] = 0.008333452;
          local_38c0[0xb] = 0.008333452;
          local_38c0[0xc] = 0.008333452;
          local_38c0[0xd] = 0.008333452;
          local_38c0[0xe] = 0.008333452;
          local_38c0[0xf] = 0.008333452;
          auVar28._8_4_ = 0.008333452;
          auVar28._12_4_ = 0.008333452;
          auVar28._0_4_ = 0.008333452;
          auVar28._4_4_ = 0.008333452;
          auVar28._16_4_ = 0.008333452;
          auVar28._20_4_ = 0.008333452;
          auVar28._24_4_ = 0.008333452;
          auVar28._28_4_ = 0.008333452;
          auVar28._32_4_ = 0.008333452;
          auVar28._36_4_ = 0.008333452;
          auVar28._40_4_ = 0.008333452;
          auVar28._44_4_ = 0.008333452;
          auVar28._48_4_ = 0.008333452;
          auVar28._52_4_ = 0.008333452;
          auVar28._56_4_ = 0.008333452;
          auVar28._60_4_ = 0.008333452;
          auVar139 = vfmadd213ps_avx512f(local_3c00,auVar139,auVar28);
          local_3d80 = auVar139._0_8_;
          uStack_3d78 = auVar139._8_8_;
          uStack_3d70 = auVar139._16_8_;
          uStack_3d68 = auVar139._24_8_;
          uStack_3d60 = auVar139._32_8_;
          uStack_3d58 = auVar139._40_8_;
          uStack_3d50 = auVar139._48_8_;
          uStack_3d48 = auVar139._56_8_;
          local_3900 = local_3d80;
          uStack_38f8 = uStack_3d78;
          uStack_38f0 = uStack_3d70;
          uStack_38e8 = uStack_3d68;
          uStack_38e0 = uStack_3d60;
          uStack_38d8 = uStack_3d58;
          uStack_38d0 = uStack_3d50;
          uStack_38c8 = uStack_3d48;
          local_3940 = local_3c00._0_8_;
          uStack_3938 = local_3c00._8_8_;
          uStack_3930 = local_3c00._16_8_;
          uStack_3928 = local_3c00._24_8_;
          uStack_3920 = local_3c00._32_8_;
          uStack_3918 = local_3c00._40_8_;
          uStack_3910 = local_3c00._48_8_;
          uStack_3908 = local_3c00._56_8_;
          local_3980[0] = 0.041665796;
          local_3980[1] = 0.041665796;
          local_3980[2] = 0.041665796;
          local_3980[3] = 0.041665796;
          local_3980[4] = 0.041665796;
          local_3980[5] = 0.041665796;
          local_3980[6] = 0.041665796;
          local_3980[7] = 0.041665796;
          local_3980[8] = 0.041665796;
          local_3980[9] = 0.041665796;
          local_3980[10] = 0.041665796;
          local_3980[0xb] = 0.041665796;
          local_3980[0xc] = 0.041665796;
          local_3980[0xd] = 0.041665796;
          local_3980[0xe] = 0.041665796;
          local_3980[0xf] = 0.041665796;
          auVar27._8_4_ = 0.041665796;
          auVar27._12_4_ = 0.041665796;
          auVar27._0_4_ = 0.041665796;
          auVar27._4_4_ = 0.041665796;
          auVar27._16_4_ = 0.041665796;
          auVar27._20_4_ = 0.041665796;
          auVar27._24_4_ = 0.041665796;
          auVar27._28_4_ = 0.041665796;
          auVar27._32_4_ = 0.041665796;
          auVar27._36_4_ = 0.041665796;
          auVar27._40_4_ = 0.041665796;
          auVar27._44_4_ = 0.041665796;
          auVar27._48_4_ = 0.041665796;
          auVar27._52_4_ = 0.041665796;
          auVar27._56_4_ = 0.041665796;
          auVar27._60_4_ = 0.041665796;
          auVar139 = vfmadd213ps_avx512f(local_3c00,auVar139,auVar27);
          local_3d80 = auVar139._0_8_;
          uStack_3d78 = auVar139._8_8_;
          uStack_3d70 = auVar139._16_8_;
          uStack_3d68 = auVar139._24_8_;
          uStack_3d60 = auVar139._32_8_;
          uStack_3d58 = auVar139._40_8_;
          uStack_3d50 = auVar139._48_8_;
          uStack_3d48 = auVar139._56_8_;
          local_39c0 = local_3d80;
          uStack_39b8 = uStack_3d78;
          uStack_39b0 = uStack_3d70;
          uStack_39a8 = uStack_3d68;
          uStack_39a0 = uStack_3d60;
          uStack_3998 = uStack_3d58;
          uStack_3990 = uStack_3d50;
          uStack_3988 = uStack_3d48;
          local_3a00 = local_3c00._0_8_;
          uStack_39f8 = local_3c00._8_8_;
          uStack_39f0 = local_3c00._16_8_;
          uStack_39e8 = local_3c00._24_8_;
          uStack_39e0 = local_3c00._32_8_;
          uStack_39d8 = local_3c00._40_8_;
          uStack_39d0 = local_3c00._48_8_;
          uStack_39c8 = local_3c00._56_8_;
          local_3a40[0] = 0.16666666;
          local_3a40[1] = 0.16666666;
          local_3a40[2] = 0.16666666;
          local_3a40[3] = 0.16666666;
          local_3a40[4] = 0.16666666;
          local_3a40[5] = 0.16666666;
          local_3a40[6] = 0.16666666;
          local_3a40[7] = 0.16666666;
          local_3a40[8] = 0.16666666;
          local_3a40[9] = 0.16666666;
          local_3a40[10] = 0.16666666;
          local_3a40[0xb] = 0.16666666;
          local_3a40[0xc] = 0.16666666;
          local_3a40[0xd] = 0.16666666;
          local_3a40[0xe] = 0.16666666;
          local_3a40[0xf] = 0.16666666;
          auVar26._8_4_ = 0.16666666;
          auVar26._12_4_ = 0.16666666;
          auVar26._0_4_ = 0.16666666;
          auVar26._4_4_ = 0.16666666;
          auVar26._16_4_ = 0.16666666;
          auVar26._20_4_ = 0.16666666;
          auVar26._24_4_ = 0.16666666;
          auVar26._28_4_ = 0.16666666;
          auVar26._32_4_ = 0.16666666;
          auVar26._36_4_ = 0.16666666;
          auVar26._40_4_ = 0.16666666;
          auVar26._44_4_ = 0.16666666;
          auVar26._48_4_ = 0.16666666;
          auVar26._52_4_ = 0.16666666;
          auVar26._56_4_ = 0.16666666;
          auVar26._60_4_ = 0.16666666;
          auVar139 = vfmadd213ps_avx512f(local_3c00,auVar139,auVar26);
          local_3d80 = auVar139._0_8_;
          uStack_3d78 = auVar139._8_8_;
          uStack_3d70 = auVar139._16_8_;
          uStack_3d68 = auVar139._24_8_;
          uStack_3d60 = auVar139._32_8_;
          uStack_3d58 = auVar139._40_8_;
          uStack_3d50 = auVar139._48_8_;
          uStack_3d48 = auVar139._56_8_;
          local_3a80 = local_3d80;
          uStack_3a78 = uStack_3d78;
          uStack_3a70 = uStack_3d70;
          uStack_3a68 = uStack_3d68;
          uStack_3a60 = uStack_3d60;
          uStack_3a58 = uStack_3d58;
          uStack_3a50 = uStack_3d50;
          uStack_3a48 = uStack_3d48;
          local_3ac0 = local_3c00._0_8_;
          uStack_3ab8 = local_3c00._8_8_;
          uStack_3ab0 = local_3c00._16_8_;
          uStack_3aa8 = local_3c00._24_8_;
          uStack_3aa0 = local_3c00._32_8_;
          uStack_3a98 = local_3c00._40_8_;
          uStack_3a90 = local_3c00._48_8_;
          uStack_3a88 = local_3c00._56_8_;
          local_3b00[0] = 0.5;
          local_3b00[1] = 0.5;
          local_3b00[2] = 0.5;
          local_3b00[3] = 0.5;
          local_3b00[4] = 0.5;
          local_3b00[5] = 0.5;
          local_3b00[6] = 0.5;
          local_3b00[7] = 0.5;
          local_3b00[8] = 0.5;
          local_3b00[9] = 0.5;
          local_3b00[10] = 0.5;
          local_3b00[0xb] = 0.5;
          local_3b00[0xc] = 0.5;
          local_3b00[0xd] = 0.5;
          local_3b00[0xe] = 0.5;
          local_3b00[0xf] = 0.5;
          auVar25._8_4_ = 0.5;
          auVar25._12_4_ = 0.5;
          auVar25._0_4_ = 0.5;
          auVar25._4_4_ = 0.5;
          auVar25._16_4_ = 0.5;
          auVar25._20_4_ = 0.5;
          auVar25._24_4_ = 0.5;
          auVar25._28_4_ = 0.5;
          auVar25._32_4_ = 0.5;
          auVar25._36_4_ = 0.5;
          auVar25._40_4_ = 0.5;
          auVar25._44_4_ = 0.5;
          auVar25._48_4_ = 0.5;
          auVar25._52_4_ = 0.5;
          auVar25._56_4_ = 0.5;
          auVar25._60_4_ = 0.5;
          auVar139 = vfmadd213ps_avx512f(local_3c00,auVar139,auVar25);
          local_3d80 = auVar139._0_8_;
          uStack_3d78 = auVar139._8_8_;
          uStack_3d70 = auVar139._16_8_;
          uStack_3d68 = auVar139._24_8_;
          uStack_3d60 = auVar139._32_8_;
          uStack_3d58 = auVar139._40_8_;
          uStack_3d50 = auVar139._48_8_;
          uStack_3d48 = auVar139._56_8_;
          local_3b40 = local_3d80;
          uStack_3b38 = uStack_3d78;
          uStack_3b30 = uStack_3d70;
          uStack_3b28 = uStack_3d68;
          uStack_3b20 = uStack_3d60;
          uStack_3b18 = uStack_3d58;
          uStack_3b10 = uStack_3d50;
          uStack_3b08 = uStack_3d48;
          local_3b80 = local_3c40._0_8_;
          uStack_3b78 = local_3c40._8_8_;
          uStack_3b70 = local_3c40._16_8_;
          uStack_3b68 = local_3c40._24_8_;
          uStack_3b60 = local_3c40._32_8_;
          uStack_3b58 = local_3c40._40_8_;
          uStack_3b50 = local_3c40._48_8_;
          uStack_3b48 = local_3c40._56_8_;
          local_3bc0 = local_3c00._0_8_;
          uStack_3bb8 = local_3c00._8_8_;
          uStack_3bb0 = local_3c00._16_8_;
          uStack_3ba8 = local_3c00._24_8_;
          uStack_3ba0 = local_3c00._32_8_;
          uStack_3b98 = local_3c00._40_8_;
          uStack_3b90 = local_3c00._48_8_;
          uStack_3b88 = local_3c00._56_8_;
          auVar139 = vfmadd213ps_avx512f(local_3c40,auVar139,local_3c00);
          local_3d80 = auVar139._0_8_;
          uStack_3d78 = auVar139._8_8_;
          uStack_3d70 = auVar139._16_8_;
          uStack_3d68 = auVar139._24_8_;
          uStack_3d60 = auVar139._32_8_;
          uStack_3d58 = auVar139._40_8_;
          uStack_3d50 = auVar139._48_8_;
          uStack_3d48 = auVar139._56_8_;
          local_3640 = local_3d80;
          uStack_3638 = uStack_3d78;
          uStack_3630 = uStack_3d70;
          uStack_3628 = uStack_3d68;
          uStack_3620 = uStack_3d60;
          uStack_3618 = uStack_3d58;
          uStack_3610 = uStack_3d50;
          uStack_3608 = uStack_3d48;
          local_3680[0] = 1.0;
          local_3680[1] = 1.0;
          local_3680[2] = 1.0;
          local_3680[3] = 1.0;
          local_3680[4] = 1.0;
          local_3680[5] = 1.0;
          local_3680[6] = 1.0;
          local_3680[7] = 1.0;
          local_3680[8] = 1.0;
          local_3680[9] = 1.0;
          local_3680[10] = 1.0;
          local_3680[0xb] = 1.0;
          local_3680[0xc] = 1.0;
          local_3680[0xd] = 1.0;
          local_3680[0xe] = 1.0;
          local_3680[0xf] = 1.0;
          auVar33._8_4_ = 1.0;
          auVar33._12_4_ = 1.0;
          auVar33._0_4_ = 1.0;
          auVar33._4_4_ = 1.0;
          auVar33._16_4_ = 1.0;
          auVar33._20_4_ = 1.0;
          auVar33._24_4_ = 1.0;
          auVar33._28_4_ = 1.0;
          auVar33._32_4_ = 1.0;
          auVar33._36_4_ = 1.0;
          auVar33._40_4_ = 1.0;
          auVar33._44_4_ = 1.0;
          auVar33._48_4_ = 1.0;
          auVar33._52_4_ = 1.0;
          auVar33._56_4_ = 1.0;
          auVar33._60_4_ = 1.0;
          auVar141 = vaddps_avx512f(auVar139,auVar33);
          local_2dc0 = local_3c80._0_8_;
          uStack_2db8 = local_3c80._8_8_;
          uStack_2db0 = uStack_3c70;
          uStack_2da8 = uStack_3c68;
          uStack_2da0 = uStack_3c60;
          uStack_2d98 = uStack_3c58;
          uStack_2d90 = uStack_3c50;
          uStack_2d88 = uStack_3c48;
          auVar46._16_8_ = uStack_3c70;
          auVar46._0_16_ = local_3c80;
          auVar46._24_8_ = uStack_3c68;
          auVar46._32_8_ = uStack_3c60;
          auVar46._40_8_ = uStack_3c58;
          auVar46._48_8_ = uStack_3c50;
          auVar46._56_8_ = uStack_3c48;
          local_2a80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          vmovdqa64_avx512f(local_2a80);
          auVar139 = vcvttps2dq_avx512f(auVar46);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar142 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          local_2d00 = vmovdqa64_avx512f(auVar139);
          local_2d40 = vmovdqa64_avx512f(auVar142);
          auVar139 = vmovdqa64_avx512f(local_2d00);
          auVar142 = vmovdqa64_avx512f(local_2d40);
          auVar139 = vpaddd_avx512f(auVar139,auVar142);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(auVar139);
          local_2c00 = vmovdqa64_avx512f(auVar139);
          local_2c04 = 0x17;
          auVar139 = vmovdqa64_avx512f(local_2c00);
          auVar139 = vpslld_avx512f(auVar139,ZEXT416(0x17));
          local_3cc0 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(local_3cc0);
          local_2b40 = vmovdqa64_avx512f(auVar139);
          local_3dc0 = vmovdqa64_avx512f(local_2b40);
          local_3d80 = auVar141._0_8_;
          uStack_3d78 = auVar141._8_8_;
          uStack_3d70 = auVar141._16_8_;
          uStack_3d68 = auVar141._24_8_;
          uStack_3d60 = auVar141._32_8_;
          uStack_3d58 = auVar141._40_8_;
          uStack_3d50 = auVar141._48_8_;
          uStack_3d48 = auVar141._56_8_;
          local_35c0 = local_3d80;
          uStack_35b8 = uStack_3d78;
          uStack_35b0 = uStack_3d70;
          uStack_35a8 = uStack_3d68;
          uStack_35a0 = uStack_3d60;
          uStack_3598 = uStack_3d58;
          uStack_3590 = uStack_3d50;
          uStack_3588 = uStack_3d48;
          local_3600 = local_3dc0._0_8_;
          uStack_35f8 = local_3dc0._8_8_;
          uStack_35f0 = local_3dc0._16_8_;
          uStack_35e8 = local_3dc0._24_8_;
          uStack_35e0 = local_3dc0._32_8_;
          uStack_35d8 = local_3dc0._40_8_;
          uStack_35d0 = local_3dc0._48_8_;
          uStack_35c8 = local_3dc0._56_8_;
          _local_3d80 = vmulps_avx512f(auVar141,local_3dc0);
          local_5000 = local_5140._0_8_;
          uStack_4ff8 = local_5140._8_8_;
          uStack_4ff0 = local_5140._16_8_;
          uStack_4fe8 = local_5140._24_8_;
          uStack_4fe0 = local_5140._32_8_;
          uStack_4fd8 = local_5140._40_8_;
          uStack_4fd0 = local_5140._48_8_;
          uStack_4fc8 = local_5140._56_8_;
          local_5040 = local_3d80;
          uStack_5038 = uStack_3d78;
          uStack_5030 = uStack_3d70;
          uStack_5028 = uStack_3d68;
          uStack_5020 = uStack_3d60;
          uStack_5018 = uStack_3d58;
          uStack_5010 = uStack_3d50;
          uStack_5008 = uStack_3d48;
          local_4840 = vaddps_avx512f(local_5140,_local_3d80);
          local_4800 = local_5140._0_8_;
          uStack_47f8 = local_5140._8_8_;
          uStack_47f0 = local_5140._16_8_;
          uStack_47e8 = local_5140._24_8_;
          uStack_47e0 = local_5140._32_8_;
          uStack_47d8 = local_5140._40_8_;
          uStack_47d0 = local_5140._48_8_;
          uStack_47c8 = local_5140._56_8_;
          _local_5780 = vdivps_avx512f(local_5140,local_4840);
          _local_3c80 = auVar140;
          local_3302 = local_3d02;
          local_3300 = uVar97;
          uStack_32f8 = uVar98;
          uStack_32f0 = uVar99;
          uStack_32e8 = uVar100;
          uStack_32e0 = uVar101;
          uStack_32d8 = uVar102;
          uStack_32d0 = uVar103;
          uStack_32c8 = uVar104;
          break;
        case 5:
          local_4f80 = local_7140._0_8_;
          uStack_4f78 = local_7140._8_8_;
          uStack_4f70 = local_7140._16_8_;
          uStack_4f68 = local_7140._24_8_;
          uStack_4f60 = local_7140._32_8_;
          uStack_4f58 = local_7140._40_8_;
          uStack_4f50 = local_7140._48_8_;
          uStack_4f48 = local_7140._56_8_;
          local_3f00 = 0;
          uStack_3ef8 = 0;
          uStack_3ef0 = 0;
          uStack_3ee8 = 0;
          uStack_3ee0 = 0;
          uStack_3ed8 = 0;
          uStack_3ed0 = 0;
          uStack_3ec8 = 0;
          local_4700[0] = 1.0;
          local_4700[1] = 1.0;
          local_4700[2] = 1.0;
          local_4700[3] = 1.0;
          local_4700[4] = 1.0;
          local_4700[5] = 1.0;
          local_4700[6] = 1.0;
          local_4700[7] = 1.0;
          local_4700[8] = 1.0;
          local_4700[9] = 1.0;
          local_4700[10] = 1.0;
          local_4700[0xb] = 1.0;
          local_4700[0xc] = 1.0;
          local_4700[0xd] = 1.0;
          local_4700[0xe] = 1.0;
          local_4700[0xf] = 1.0;
          local_3e00 = local_7140._0_8_;
          uStack_3df8 = local_7140._8_8_;
          uStack_3df0 = local_7140._16_8_;
          uStack_3de8 = local_7140._24_8_;
          uStack_3de0 = local_7140._32_8_;
          uStack_3dd8 = local_7140._40_8_;
          uStack_3dd0 = local_7140._48_8_;
          uStack_3dc8 = local_7140._56_8_;
          local_3e40[0] = 88.37626;
          local_3e40[1] = 88.37626;
          local_3e40[2] = 88.37626;
          local_3e40[3] = 88.37626;
          local_3e40[4] = 88.37626;
          local_3e40[5] = 88.37626;
          local_3e40[6] = 88.37626;
          local_3e40[7] = 88.37626;
          local_3e40[8] = 88.37626;
          local_3e40[9] = 88.37626;
          local_3e40[10] = 88.37626;
          local_3e40[0xb] = 88.37626;
          local_3e40[0xc] = 88.37626;
          local_3e40[0xd] = 88.37626;
          local_3e40[0xe] = 88.37626;
          local_3e40[0xf] = 88.37626;
          auVar24._8_4_ = 88.37626;
          auVar24._12_4_ = 88.37626;
          auVar24._0_4_ = 88.37626;
          auVar24._4_4_ = 88.37626;
          auVar24._16_4_ = 88.37626;
          auVar24._20_4_ = 88.37626;
          auVar24._24_4_ = 88.37626;
          auVar24._28_4_ = 88.37626;
          auVar24._32_4_ = 88.37626;
          auVar24._36_4_ = 88.37626;
          auVar24._40_4_ = 88.37626;
          auVar24._44_4_ = 88.37626;
          auVar24._48_4_ = 88.37626;
          auVar24._52_4_ = 88.37626;
          auVar24._56_4_ = 88.37626;
          auVar24._60_4_ = 88.37626;
          auVar139 = vminps_avx512f(local_7140,auVar24);
          local_4600._0_8_ = auVar139._0_8_;
          local_4600._8_8_ = auVar139._8_8_;
          local_4600._16_8_ = auVar139._16_8_;
          local_4600._24_8_ = auVar139._24_8_;
          local_4600._32_8_ = auVar139._32_8_;
          local_4600._40_8_ = auVar139._40_8_;
          local_4600._48_8_ = auVar139._48_8_;
          local_4600._56_8_ = auVar139._56_8_;
          local_3e80 = local_4600._0_8_;
          uStack_3e78 = local_4600._8_8_;
          uStack_3e70 = local_4600._16_8_;
          uStack_3e68 = local_4600._24_8_;
          uStack_3e60 = local_4600._32_8_;
          uStack_3e58 = local_4600._40_8_;
          uStack_3e50 = local_4600._48_8_;
          uStack_3e48 = local_4600._56_8_;
          local_3ec0[0] = -88.37626;
          local_3ec0[1] = -88.37626;
          local_3ec0[2] = -88.37626;
          local_3ec0[3] = -88.37626;
          local_3ec0[4] = -88.37626;
          local_3ec0[5] = -88.37626;
          local_3ec0[6] = -88.37626;
          local_3ec0[7] = -88.37626;
          local_3ec0[8] = -88.37626;
          local_3ec0[9] = -88.37626;
          local_3ec0[10] = -88.37626;
          local_3ec0[0xb] = -88.37626;
          local_3ec0[0xc] = -88.37626;
          local_3ec0[0xd] = -88.37626;
          local_3ec0[0xe] = -88.37626;
          local_3ec0[0xf] = -88.37626;
          auVar23._8_4_ = -88.37626;
          auVar23._12_4_ = -88.37626;
          auVar23._0_4_ = -88.37626;
          auVar23._4_4_ = -88.37626;
          auVar23._16_4_ = -88.37626;
          auVar23._20_4_ = -88.37626;
          auVar23._24_4_ = -88.37626;
          auVar23._28_4_ = -88.37626;
          auVar23._32_4_ = -88.37626;
          auVar23._36_4_ = -88.37626;
          auVar23._40_4_ = -88.37626;
          auVar23._44_4_ = -88.37626;
          auVar23._48_4_ = -88.37626;
          auVar23._52_4_ = -88.37626;
          auVar23._56_4_ = -88.37626;
          auVar23._60_4_ = -88.37626;
          auVar139 = vmaxps_avx512f(auVar139,auVar23);
          local_4600._0_8_ = auVar139._0_8_;
          local_4600._8_8_ = auVar139._8_8_;
          local_4600._16_8_ = auVar139._16_8_;
          local_4600._24_8_ = auVar139._24_8_;
          local_4600._32_8_ = auVar139._32_8_;
          local_4600._40_8_ = auVar139._40_8_;
          local_4600._48_8_ = auVar139._48_8_;
          local_4600._56_8_ = auVar139._56_8_;
          local_40c0 = local_4600._0_8_;
          uStack_40b8 = local_4600._8_8_;
          uStack_40b0 = local_4600._16_8_;
          uStack_40a8 = local_4600._24_8_;
          uStack_40a0 = local_4600._32_8_;
          uStack_4098 = local_4600._40_8_;
          uStack_4090 = local_4600._48_8_;
          uStack_4088 = local_4600._56_8_;
          local_4180[0x20] = 1.442695;
          local_4180[0x21] = 1.442695;
          local_4180[0x22] = 1.442695;
          local_4180[0x23] = 1.442695;
          local_4180[0x24] = 1.442695;
          local_4180[0x25] = 1.442695;
          local_4180[0x26] = 1.442695;
          local_4180[0x27] = 1.442695;
          local_4180[0x28] = 1.442695;
          local_4180[0x29] = 1.442695;
          local_4180[0x2a] = 1.442695;
          local_4180[0x2b] = 1.442695;
          local_4180[0x2c] = 1.442695;
          local_4180[0x2d] = 1.442695;
          local_4180[0x2e] = 1.442695;
          local_4180[0x2f] = 1.442695;
          local_4180[0x10] = 0.5;
          local_4180[0x11] = 0.5;
          local_4180[0x12] = 0.5;
          local_4180[0x13] = 0.5;
          local_4180[0x14] = 0.5;
          local_4180[0x15] = 0.5;
          local_4180[0x16] = 0.5;
          local_4180[0x17] = 0.5;
          local_4180[0x18] = 0.5;
          local_4180[0x19] = 0.5;
          local_4180[0x1a] = 0.5;
          local_4180[0x1b] = 0.5;
          local_4180[0x1c] = 0.5;
          local_4180[0x1d] = 0.5;
          local_4180[0x1e] = 0.5;
          local_4180[0x1f] = 0.5;
          auVar21._8_4_ = 1.442695;
          auVar21._12_4_ = 1.442695;
          auVar21._0_4_ = 1.442695;
          auVar21._4_4_ = 1.442695;
          auVar21._16_4_ = 1.442695;
          auVar21._20_4_ = 1.442695;
          auVar21._24_4_ = 1.442695;
          auVar21._28_4_ = 1.442695;
          auVar21._32_4_ = 1.442695;
          auVar21._36_4_ = 1.442695;
          auVar21._40_4_ = 1.442695;
          auVar21._44_4_ = 1.442695;
          auVar21._48_4_ = 1.442695;
          auVar21._52_4_ = 1.442695;
          auVar21._56_4_ = 1.442695;
          auVar21._60_4_ = 1.442695;
          auVar20._8_4_ = 0.5;
          auVar20._12_4_ = 0.5;
          auVar20._0_4_ = 0.5;
          auVar20._4_4_ = 0.5;
          auVar20._16_4_ = 0.5;
          auVar20._20_4_ = 0.5;
          auVar20._24_4_ = 0.5;
          auVar20._28_4_ = 0.5;
          auVar20._32_4_ = 0.5;
          auVar20._36_4_ = 0.5;
          auVar20._40_4_ = 0.5;
          auVar20._44_4_ = 0.5;
          auVar20._48_4_ = 0.5;
          auVar20._52_4_ = 0.5;
          auVar20._56_4_ = 0.5;
          auVar20._60_4_ = 0.5;
          auVar140 = vfmadd213ps_avx512f(auVar21,auVar139,auVar20);
          auVar141 = vrndscaleps_avx512f(auVar140,1);
          uVar17 = vcmpps_avx512f(auVar140,auVar141,1);
          local_4702 = (ushort)uVar17;
          local_4640._0_8_ = auVar141._0_8_;
          local_4640._8_8_ = auVar141._8_8_;
          local_4640._16_8_ = auVar141._16_8_;
          local_4640._24_8_ = auVar141._24_8_;
          local_4640._32_8_ = auVar141._32_8_;
          local_4640._40_8_ = auVar141._40_8_;
          local_4640._48_8_ = auVar141._48_8_;
          local_4640._56_8_ = auVar141._56_8_;
          local_3180 = local_4640._0_8_;
          uVar97 = local_3180;
          uStack_3178 = local_4640._8_8_;
          uVar98 = uStack_3178;
          uStack_3170 = local_4640._16_8_;
          uVar99 = uStack_3170;
          uStack_3168 = local_4640._24_8_;
          uVar100 = uStack_3168;
          uStack_3160 = local_4640._32_8_;
          uVar101 = uStack_3160;
          uStack_3158 = local_4640._40_8_;
          uVar102 = uStack_3158;
          uStack_3150 = local_4640._48_8_;
          uVar103 = uStack_3150;
          uStack_3148 = local_4640._56_8_;
          uVar104 = uStack_3148;
          local_3200 = local_4640._0_8_;
          uStack_31f8 = local_4640._8_8_;
          uStack_31f0 = local_4640._16_8_;
          uStack_31e8 = local_4640._24_8_;
          uStack_31e0 = local_4640._32_8_;
          uStack_31d8 = local_4640._40_8_;
          uStack_31d0 = local_4640._48_8_;
          uStack_31c8 = local_4640._56_8_;
          local_3240[0] = 1.0;
          local_3240[1] = 1.0;
          local_3240[2] = 1.0;
          local_3240[3] = 1.0;
          local_3240[4] = 1.0;
          local_3240[5] = 1.0;
          local_3240[6] = 1.0;
          local_3240[7] = 1.0;
          local_3240[8] = 1.0;
          local_3240[9] = 1.0;
          local_3240[10] = 1.0;
          local_3240[0xb] = 1.0;
          local_3240[0xc] = 1.0;
          local_3240[0xd] = 1.0;
          local_3240[0xe] = 1.0;
          local_3240[0xf] = 1.0;
          local_3100 = local_4640._0_8_;
          uStack_30f8 = local_4640._8_8_;
          uStack_30f0 = local_4640._16_8_;
          uStack_30e8 = local_4640._24_8_;
          uStack_30e0 = local_4640._32_8_;
          uStack_30d8 = local_4640._40_8_;
          uStack_30d0 = local_4640._48_8_;
          uStack_30c8 = local_4640._56_8_;
          local_3140[0] = 1.0;
          local_3140[1] = 1.0;
          local_3140[2] = 1.0;
          local_3140[3] = 1.0;
          local_3140[4] = 1.0;
          local_3140[5] = 1.0;
          local_3140[6] = 1.0;
          local_3140[7] = 1.0;
          local_3140[8] = 1.0;
          local_3140[9] = 1.0;
          local_3140[10] = 1.0;
          local_3140[0xb] = 1.0;
          local_3140[0xc] = 1.0;
          local_3140[0xd] = 1.0;
          local_3140[0xe] = 1.0;
          local_3140[0xf] = 1.0;
          auVar37._8_4_ = 1.0;
          auVar37._12_4_ = 1.0;
          auVar37._0_4_ = 1.0;
          auVar37._4_4_ = 1.0;
          auVar37._16_4_ = 1.0;
          auVar37._20_4_ = 1.0;
          auVar37._24_4_ = 1.0;
          auVar37._28_4_ = 1.0;
          auVar37._32_4_ = 1.0;
          auVar37._36_4_ = 1.0;
          auVar37._40_4_ = 1.0;
          auVar37._44_4_ = 1.0;
          auVar37._48_4_ = 1.0;
          auVar37._52_4_ = 1.0;
          auVar37._56_4_ = 1.0;
          auVar37._60_4_ = 1.0;
          local_3180._0_4_ = auVar141._0_4_;
          local_3180._4_4_ = auVar141._4_4_;
          uStack_3178._0_4_ = auVar141._8_4_;
          uStack_3178._4_4_ = auVar141._12_4_;
          uStack_3170._0_4_ = auVar141._16_4_;
          uStack_3170._4_4_ = auVar141._20_4_;
          uStack_3168._0_4_ = auVar141._24_4_;
          uStack_3168._4_4_ = auVar141._28_4_;
          uStack_3160._0_4_ = auVar141._32_4_;
          uStack_3160._4_4_ = auVar141._36_4_;
          uStack_3158._0_4_ = auVar141._40_4_;
          uStack_3158._4_4_ = auVar141._44_4_;
          uStack_3150._0_4_ = auVar141._48_4_;
          uStack_3150._4_4_ = auVar141._52_4_;
          uStack_3148._0_4_ = auVar141._56_4_;
          uStack_3148._4_4_ = auVar141._60_4_;
          auVar140 = vsubps_avx512f(auVar141,auVar37);
          bVar2 = (bool)((byte)uVar17 & 1);
          bVar3 = (bool)((byte)(local_4702 >> 1) & 1);
          bVar4 = (bool)((byte)(local_4702 >> 2) & 1);
          bVar5 = (bool)((byte)(local_4702 >> 3) & 1);
          bVar6 = (bool)((byte)(local_4702 >> 4) & 1);
          bVar7 = (bool)((byte)(local_4702 >> 5) & 1);
          bVar8 = (bool)((byte)(local_4702 >> 6) & 1);
          bVar9 = (bool)((byte)(local_4702 >> 7) & 1);
          bVar10 = (byte)((ulong)uVar17 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          local_4680._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * local_3180._4_4_;
          local_4680._0_4_ = (uint)bVar2 * auVar140._0_4_ | (uint)!bVar2 * (int)local_3180;
          local_4680._8_4_ = (uint)bVar4 * auVar140._8_4_ | (uint)!bVar4 * (int)uStack_3178;
          local_4680._12_4_ = (uint)bVar5 * auVar140._12_4_ | (uint)!bVar5 * uStack_3178._4_4_;
          uStack_4670._0_4_ = (uint)bVar6 * auVar140._16_4_ | (uint)!bVar6 * (int)uStack_3170;
          uStack_4670._4_4_ = (uint)bVar7 * auVar140._20_4_ | (uint)!bVar7 * uStack_3170._4_4_;
          auVar105 = _local_4680;
          uStack_4668._0_4_ = (uint)bVar8 * auVar140._24_4_ | (uint)!bVar8 * (int)uStack_3168;
          uStack_4668._4_4_ = (uint)bVar9 * auVar140._28_4_ | (uint)!bVar9 * uStack_3168._4_4_;
          auVar106 = _local_4680;
          uStack_4660._0_4_ =
               (uint)(bVar10 & 1) * auVar140._32_4_ | (uint)!(bool)(bVar10 & 1) * (int)uStack_3160;
          uStack_4660._4_4_ = (uint)bVar11 * auVar140._36_4_ | (uint)!bVar11 * uStack_3160._4_4_;
          auVar107 = _local_4680;
          uStack_4658._0_4_ = (uint)bVar12 * auVar140._40_4_ | (uint)!bVar12 * (int)uStack_3158;
          uStack_4658._4_4_ = (uint)bVar13 * auVar140._44_4_ | (uint)!bVar13 * uStack_3158._4_4_;
          auVar108 = _local_4680;
          uStack_4650._0_4_ = (uint)bVar14 * auVar140._48_4_ | (uint)!bVar14 * (int)uStack_3150;
          uStack_4650._4_4_ = (uint)bVar15 * auVar140._52_4_ | (uint)!bVar15 * uStack_3150._4_4_;
          auVar109 = _local_4680;
          uStack_4648._0_4_ = (uint)bVar16 * auVar140._56_4_ | (uint)!bVar16 * (int)uStack_3148;
          uStack_4648._4_4_ =
               (uint)(bVar10 >> 7) * auVar140._60_4_ |
               (uint)!(bool)(bVar10 >> 7) * uStack_3148._4_4_;
          auVar20 = _local_4680;
          uStack_4670 = auVar105._16_8_;
          uStack_4668 = auVar106._24_8_;
          uStack_4660 = auVar107._32_8_;
          uStack_4658 = auVar108._40_8_;
          uStack_4650 = auVar109._48_8_;
          uStack_4648 = auVar20._56_8_;
          local_2e00 = local_4680._0_8_;
          uStack_2df8 = local_4680._8_8_;
          uStack_2df0 = uStack_4670;
          uStack_2de8 = uStack_4668;
          uStack_2de0 = uStack_4660;
          uStack_2dd8 = uStack_4658;
          uStack_2dd0 = uStack_4650;
          uStack_2dc8 = uStack_4648;
          local_2e40[0] = 0.6933594;
          local_2e40[1] = 0.6933594;
          local_2e40[2] = 0.6933594;
          local_2e40[3] = 0.6933594;
          local_2e40[4] = 0.6933594;
          local_2e40[5] = 0.6933594;
          local_2e40[6] = 0.6933594;
          local_2e40[7] = 0.6933594;
          local_2e40[8] = 0.6933594;
          local_2e40[9] = 0.6933594;
          local_2e40[10] = 0.6933594;
          local_2e40[0xb] = 0.6933594;
          local_2e40[0xc] = 0.6933594;
          local_2e40[0xd] = 0.6933594;
          local_2e40[0xe] = 0.6933594;
          local_2e40[0xf] = 0.6933594;
          local_2e80 = local_4600._0_8_;
          uStack_2e78 = local_4600._8_8_;
          uStack_2e70 = local_4600._16_8_;
          uStack_2e68 = local_4600._24_8_;
          uStack_2e60 = local_4600._32_8_;
          uStack_2e58 = local_4600._40_8_;
          uStack_2e50 = local_4600._48_8_;
          uStack_2e48 = local_4600._56_8_;
          auVar45._16_8_ = uStack_4670;
          auVar45._0_16_ = local_4680;
          auVar45._24_8_ = uStack_4668;
          auVar45._32_8_ = uStack_4660;
          auVar45._40_8_ = uStack_4658;
          auVar45._48_8_ = uStack_4650;
          auVar45._56_8_ = uStack_4648;
          auVar44._8_4_ = 0.6933594;
          auVar44._12_4_ = 0.6933594;
          auVar44._0_4_ = 0.6933594;
          auVar44._4_4_ = 0.6933594;
          auVar44._16_4_ = 0.6933594;
          auVar44._20_4_ = 0.6933594;
          auVar44._24_4_ = 0.6933594;
          auVar44._28_4_ = 0.6933594;
          auVar44._32_4_ = 0.6933594;
          auVar44._36_4_ = 0.6933594;
          auVar44._40_4_ = 0.6933594;
          auVar44._44_4_ = 0.6933594;
          auVar44._48_4_ = 0.6933594;
          auVar44._52_4_ = 0.6933594;
          auVar44._56_4_ = 0.6933594;
          auVar44._60_4_ = 0.6933594;
          auVar139 = vfnmadd213ps_avx512f(auVar44,auVar45,auVar139);
          local_4600._0_8_ = auVar139._0_8_;
          local_4600._8_8_ = auVar139._8_8_;
          local_4600._16_8_ = auVar139._16_8_;
          local_4600._24_8_ = auVar139._24_8_;
          local_4600._32_8_ = auVar139._32_8_;
          local_4600._40_8_ = auVar139._40_8_;
          local_4600._48_8_ = auVar139._48_8_;
          local_4600._56_8_ = auVar139._56_8_;
          local_2ec0 = local_4680._0_8_;
          uStack_2eb8 = local_4680._8_8_;
          uStack_2eb0 = uStack_4670;
          uStack_2ea8 = uStack_4668;
          uStack_2ea0 = uStack_4660;
          uStack_2e98 = uStack_4658;
          uStack_2e90 = uStack_4650;
          uStack_2e88 = uStack_4648;
          local_2f00[0] = -0.00021219444;
          local_2f00[1] = -0.00021219444;
          local_2f00[2] = -0.00021219444;
          local_2f00[3] = -0.00021219444;
          local_2f00[4] = -0.00021219444;
          local_2f00[5] = -0.00021219444;
          local_2f00[6] = -0.00021219444;
          local_2f00[7] = -0.00021219444;
          local_2f00[8] = -0.00021219444;
          local_2f00[9] = -0.00021219444;
          local_2f00[10] = -0.00021219444;
          local_2f00[0xb] = -0.00021219444;
          local_2f00[0xc] = -0.00021219444;
          local_2f00[0xd] = -0.00021219444;
          local_2f00[0xe] = -0.00021219444;
          local_2f00[0xf] = -0.00021219444;
          local_2f40 = local_4600._0_8_;
          uStack_2f38 = local_4600._8_8_;
          uStack_2f30 = local_4600._16_8_;
          uStack_2f28 = local_4600._24_8_;
          uStack_2f20 = local_4600._32_8_;
          uStack_2f18 = local_4600._40_8_;
          uStack_2f10 = local_4600._48_8_;
          uStack_2f08 = local_4600._56_8_;
          auVar43._16_8_ = uStack_4670;
          auVar43._0_16_ = local_4680;
          auVar43._24_8_ = uStack_4668;
          auVar43._32_8_ = uStack_4660;
          auVar43._40_8_ = uStack_4658;
          auVar43._48_8_ = uStack_4650;
          auVar43._56_8_ = uStack_4648;
          auVar42._8_4_ = -0.00021219444;
          auVar42._12_4_ = -0.00021219444;
          auVar42._0_4_ = -0.00021219444;
          auVar42._4_4_ = -0.00021219444;
          auVar42._16_4_ = -0.00021219444;
          auVar42._20_4_ = -0.00021219444;
          auVar42._24_4_ = -0.00021219444;
          auVar42._28_4_ = -0.00021219444;
          auVar42._32_4_ = -0.00021219444;
          auVar42._36_4_ = -0.00021219444;
          auVar42._40_4_ = -0.00021219444;
          auVar42._44_4_ = -0.00021219444;
          auVar42._48_4_ = -0.00021219444;
          auVar42._52_4_ = -0.00021219444;
          auVar42._56_4_ = -0.00021219444;
          auVar42._60_4_ = -0.00021219444;
          local_4600 = vfnmadd213ps_avx512f(auVar42,auVar43,auVar139);
          local_3f40 = local_4600._0_8_;
          uStack_3f38 = local_4600._8_8_;
          uStack_3f30 = local_4600._16_8_;
          uStack_3f28 = local_4600._24_8_;
          uStack_3f20 = local_4600._32_8_;
          uStack_3f18 = local_4600._40_8_;
          uStack_3f10 = local_4600._48_8_;
          uStack_3f08 = local_4600._56_8_;
          local_3f80 = local_4600._0_8_;
          uStack_3f78 = local_4600._8_8_;
          uStack_3f70 = local_4600._16_8_;
          uStack_3f68 = local_4600._24_8_;
          uStack_3f60 = local_4600._32_8_;
          uStack_3f58 = local_4600._40_8_;
          uStack_3f50 = local_4600._48_8_;
          uStack_3f48 = local_4600._56_8_;
          local_4640 = vmulps_avx512f(local_4600,local_4600);
          uStack_4778._0_4_ = 0.00019875691;
          uStack_4778._4_4_ = 0.00019875691;
          local_4780._0_4_ = 0.00019875691;
          local_4780._4_4_ = 0.00019875691;
          local_4180[0] = 0.00019875691;
          local_4180[1] = 0.00019875691;
          local_4180[2] = 0.00019875691;
          local_4180[3] = 0.00019875691;
          local_4180[4] = 0.00019875691;
          local_4180[5] = 0.00019875691;
          local_4180[6] = 0.00019875691;
          local_4180[7] = 0.00019875691;
          local_4180[8] = 0.00019875691;
          local_4180[9] = 0.00019875691;
          local_4180[10] = 0.00019875691;
          local_4180[0xb] = 0.00019875691;
          local_4180[0xc] = 0.00019875691;
          local_4180[0xd] = 0.00019875691;
          local_4180[0xe] = 0.00019875691;
          local_4180[0xf] = 0.00019875691;
          local_41c0 = local_4600._0_8_;
          uStack_41b8 = local_4600._8_8_;
          uStack_41b0 = local_4600._16_8_;
          uStack_41a8 = local_4600._24_8_;
          uStack_41a0 = local_4600._32_8_;
          uStack_4198 = local_4600._40_8_;
          uStack_4190 = local_4600._48_8_;
          uStack_4188 = local_4600._56_8_;
          local_4200[0] = 0.0013981999;
          local_4200[1] = 0.0013981999;
          local_4200[2] = 0.0013981999;
          local_4200[3] = 0.0013981999;
          local_4200[4] = 0.0013981999;
          local_4200[5] = 0.0013981999;
          local_4200[6] = 0.0013981999;
          local_4200[7] = 0.0013981999;
          local_4200[8] = 0.0013981999;
          local_4200[9] = 0.0013981999;
          local_4200[10] = 0.0013981999;
          local_4200[0xb] = 0.0013981999;
          local_4200[0xc] = 0.0013981999;
          local_4200[0xd] = 0.0013981999;
          local_4200[0xe] = 0.0013981999;
          local_4200[0xf] = 0.0013981999;
          auVar19._16_4_ = 0.00019875691;
          auVar19._20_4_ = 0.00019875691;
          auVar19._0_16_ = _local_4780;
          auVar19._24_4_ = 0.00019875691;
          auVar19._28_4_ = 0.00019875691;
          auVar19._32_4_ = 0.00019875691;
          auVar19._36_4_ = 0.00019875691;
          auVar19._40_4_ = 0.00019875691;
          auVar19._44_4_ = 0.00019875691;
          auVar19._48_4_ = 0.00019875691;
          auVar19._52_4_ = 0.00019875691;
          auVar19._56_4_ = 0.00019875691;
          auVar19._60_4_ = 0.00019875691;
          auVar143._8_4_ = 0.0013981999;
          auVar143._12_4_ = 0.0013981999;
          auVar143._0_4_ = 0.0013981999;
          auVar143._4_4_ = 0.0013981999;
          auVar143._16_4_ = 0.0013981999;
          auVar143._20_4_ = 0.0013981999;
          auVar143._24_4_ = 0.0013981999;
          auVar143._28_4_ = 0.0013981999;
          auVar143._32_4_ = 0.0013981999;
          auVar143._36_4_ = 0.0013981999;
          auVar143._40_4_ = 0.0013981999;
          auVar143._44_4_ = 0.0013981999;
          auVar143._48_4_ = 0.0013981999;
          auVar143._52_4_ = 0.0013981999;
          auVar143._56_4_ = 0.0013981999;
          auVar143._60_4_ = 0.0013981999;
          auVar139 = vfmadd213ps_avx512f(local_4600,auVar19,auVar143);
          local_4780 = auVar139._0_8_;
          uStack_4778 = auVar139._8_8_;
          uStack_4770 = auVar139._16_8_;
          uStack_4768 = auVar139._24_8_;
          uStack_4760 = auVar139._32_8_;
          uStack_4758 = auVar139._40_8_;
          uStack_4750 = auVar139._48_8_;
          uStack_4748 = auVar139._56_8_;
          local_4240 = local_4780;
          uStack_4238 = uStack_4778;
          uStack_4230 = uStack_4770;
          uStack_4228 = uStack_4768;
          uStack_4220 = uStack_4760;
          uStack_4218 = uStack_4758;
          uStack_4210 = uStack_4750;
          uStack_4208 = uStack_4748;
          local_4280 = local_4600._0_8_;
          uStack_4278 = local_4600._8_8_;
          uStack_4270 = local_4600._16_8_;
          uStack_4268 = local_4600._24_8_;
          uStack_4260 = local_4600._32_8_;
          uStack_4258 = local_4600._40_8_;
          uStack_4250 = local_4600._48_8_;
          uStack_4248 = local_4600._56_8_;
          local_42c0[0] = 0.008333452;
          local_42c0[1] = 0.008333452;
          local_42c0[2] = 0.008333452;
          local_42c0[3] = 0.008333452;
          local_42c0[4] = 0.008333452;
          local_42c0[5] = 0.008333452;
          local_42c0[6] = 0.008333452;
          local_42c0[7] = 0.008333452;
          local_42c0[8] = 0.008333452;
          local_42c0[9] = 0.008333452;
          local_42c0[10] = 0.008333452;
          local_42c0[0xb] = 0.008333452;
          local_42c0[0xc] = 0.008333452;
          local_42c0[0xd] = 0.008333452;
          local_42c0[0xe] = 0.008333452;
          local_42c0[0xf] = 0.008333452;
          auVar142._8_4_ = 0.008333452;
          auVar142._12_4_ = 0.008333452;
          auVar142._0_4_ = 0.008333452;
          auVar142._4_4_ = 0.008333452;
          auVar142._16_4_ = 0.008333452;
          auVar142._20_4_ = 0.008333452;
          auVar142._24_4_ = 0.008333452;
          auVar142._28_4_ = 0.008333452;
          auVar142._32_4_ = 0.008333452;
          auVar142._36_4_ = 0.008333452;
          auVar142._40_4_ = 0.008333452;
          auVar142._44_4_ = 0.008333452;
          auVar142._48_4_ = 0.008333452;
          auVar142._52_4_ = 0.008333452;
          auVar142._56_4_ = 0.008333452;
          auVar142._60_4_ = 0.008333452;
          auVar139 = vfmadd213ps_avx512f(local_4600,auVar139,auVar142);
          local_4780 = auVar139._0_8_;
          uStack_4778 = auVar139._8_8_;
          uStack_4770 = auVar139._16_8_;
          uStack_4768 = auVar139._24_8_;
          uStack_4760 = auVar139._32_8_;
          uStack_4758 = auVar139._40_8_;
          uStack_4750 = auVar139._48_8_;
          uStack_4748 = auVar139._56_8_;
          local_4300 = local_4780;
          uStack_42f8 = uStack_4778;
          uStack_42f0 = uStack_4770;
          uStack_42e8 = uStack_4768;
          uStack_42e0 = uStack_4760;
          uStack_42d8 = uStack_4758;
          uStack_42d0 = uStack_4750;
          uStack_42c8 = uStack_4748;
          local_4340 = local_4600._0_8_;
          uStack_4338 = local_4600._8_8_;
          uStack_4330 = local_4600._16_8_;
          uStack_4328 = local_4600._24_8_;
          uStack_4320 = local_4600._32_8_;
          uStack_4318 = local_4600._40_8_;
          uStack_4310 = local_4600._48_8_;
          uStack_4308 = local_4600._56_8_;
          local_4380[0] = 0.041665796;
          local_4380[1] = 0.041665796;
          local_4380[2] = 0.041665796;
          local_4380[3] = 0.041665796;
          local_4380[4] = 0.041665796;
          local_4380[5] = 0.041665796;
          local_4380[6] = 0.041665796;
          local_4380[7] = 0.041665796;
          local_4380[8] = 0.041665796;
          local_4380[9] = 0.041665796;
          local_4380[10] = 0.041665796;
          local_4380[0xb] = 0.041665796;
          local_4380[0xc] = 0.041665796;
          local_4380[0xd] = 0.041665796;
          local_4380[0xe] = 0.041665796;
          local_4380[0xf] = 0.041665796;
          auVar141._8_4_ = 0.041665796;
          auVar141._12_4_ = 0.041665796;
          auVar141._0_4_ = 0.041665796;
          auVar141._4_4_ = 0.041665796;
          auVar141._16_4_ = 0.041665796;
          auVar141._20_4_ = 0.041665796;
          auVar141._24_4_ = 0.041665796;
          auVar141._28_4_ = 0.041665796;
          auVar141._32_4_ = 0.041665796;
          auVar141._36_4_ = 0.041665796;
          auVar141._40_4_ = 0.041665796;
          auVar141._44_4_ = 0.041665796;
          auVar141._48_4_ = 0.041665796;
          auVar141._52_4_ = 0.041665796;
          auVar141._56_4_ = 0.041665796;
          auVar141._60_4_ = 0.041665796;
          auVar139 = vfmadd213ps_avx512f(local_4600,auVar139,auVar141);
          local_4780 = auVar139._0_8_;
          uStack_4778 = auVar139._8_8_;
          uStack_4770 = auVar139._16_8_;
          uStack_4768 = auVar139._24_8_;
          uStack_4760 = auVar139._32_8_;
          uStack_4758 = auVar139._40_8_;
          uStack_4750 = auVar139._48_8_;
          uStack_4748 = auVar139._56_8_;
          local_43c0 = local_4780;
          uStack_43b8 = uStack_4778;
          uStack_43b0 = uStack_4770;
          uStack_43a8 = uStack_4768;
          uStack_43a0 = uStack_4760;
          uStack_4398 = uStack_4758;
          uStack_4390 = uStack_4750;
          uStack_4388 = uStack_4748;
          local_4400 = local_4600._0_8_;
          uStack_43f8 = local_4600._8_8_;
          uStack_43f0 = local_4600._16_8_;
          uStack_43e8 = local_4600._24_8_;
          uStack_43e0 = local_4600._32_8_;
          uStack_43d8 = local_4600._40_8_;
          uStack_43d0 = local_4600._48_8_;
          uStack_43c8 = local_4600._56_8_;
          local_4440[0] = 0.16666666;
          local_4440[1] = 0.16666666;
          local_4440[2] = 0.16666666;
          local_4440[3] = 0.16666666;
          local_4440[4] = 0.16666666;
          local_4440[5] = 0.16666666;
          local_4440[6] = 0.16666666;
          local_4440[7] = 0.16666666;
          local_4440[8] = 0.16666666;
          local_4440[9] = 0.16666666;
          local_4440[10] = 0.16666666;
          local_4440[0xb] = 0.16666666;
          local_4440[0xc] = 0.16666666;
          local_4440[0xd] = 0.16666666;
          local_4440[0xe] = 0.16666666;
          local_4440[0xf] = 0.16666666;
          auVar140._8_4_ = 0.16666666;
          auVar140._12_4_ = 0.16666666;
          auVar140._0_4_ = 0.16666666;
          auVar140._4_4_ = 0.16666666;
          auVar140._16_4_ = 0.16666666;
          auVar140._20_4_ = 0.16666666;
          auVar140._24_4_ = 0.16666666;
          auVar140._28_4_ = 0.16666666;
          auVar140._32_4_ = 0.16666666;
          auVar140._36_4_ = 0.16666666;
          auVar140._40_4_ = 0.16666666;
          auVar140._44_4_ = 0.16666666;
          auVar140._48_4_ = 0.16666666;
          auVar140._52_4_ = 0.16666666;
          auVar140._56_4_ = 0.16666666;
          auVar140._60_4_ = 0.16666666;
          auVar140 = vfmadd213ps_avx512f(local_4600,auVar139,auVar140);
          local_4780 = auVar140._0_8_;
          uStack_4778 = auVar140._8_8_;
          uStack_4770 = auVar140._16_8_;
          uStack_4768 = auVar140._24_8_;
          uStack_4760 = auVar140._32_8_;
          uStack_4758 = auVar140._40_8_;
          uStack_4750 = auVar140._48_8_;
          uStack_4748 = auVar140._56_8_;
          local_4480 = local_4780;
          uStack_4478 = uStack_4778;
          uStack_4470 = uStack_4770;
          uStack_4468 = uStack_4768;
          uStack_4460 = uStack_4760;
          uStack_4458 = uStack_4758;
          uStack_4450 = uStack_4750;
          uStack_4448 = uStack_4748;
          local_44c0 = local_4600._0_8_;
          uStack_44b8 = local_4600._8_8_;
          uStack_44b0 = local_4600._16_8_;
          uStack_44a8 = local_4600._24_8_;
          uStack_44a0 = local_4600._32_8_;
          uStack_4498 = local_4600._40_8_;
          uStack_4490 = local_4600._48_8_;
          uStack_4488 = local_4600._56_8_;
          local_4500[0] = 0.5;
          local_4500[1] = 0.5;
          local_4500[2] = 0.5;
          local_4500[3] = 0.5;
          local_4500[4] = 0.5;
          local_4500[5] = 0.5;
          local_4500[6] = 0.5;
          local_4500[7] = 0.5;
          local_4500[8] = 0.5;
          local_4500[9] = 0.5;
          local_4500[10] = 0.5;
          local_4500[0xb] = 0.5;
          local_4500[0xc] = 0.5;
          local_4500[0xd] = 0.5;
          local_4500[0xe] = 0.5;
          local_4500[0xf] = 0.5;
          auVar139._8_4_ = 0.5;
          auVar139._12_4_ = 0.5;
          auVar139._0_4_ = 0.5;
          auVar139._4_4_ = 0.5;
          auVar139._16_4_ = 0.5;
          auVar139._20_4_ = 0.5;
          auVar139._24_4_ = 0.5;
          auVar139._28_4_ = 0.5;
          auVar139._32_4_ = 0.5;
          auVar139._36_4_ = 0.5;
          auVar139._40_4_ = 0.5;
          auVar139._44_4_ = 0.5;
          auVar139._48_4_ = 0.5;
          auVar139._52_4_ = 0.5;
          auVar139._56_4_ = 0.5;
          auVar139._60_4_ = 0.5;
          auVar139 = vfmadd213ps_avx512f(local_4600,auVar140,auVar139);
          local_4780 = auVar139._0_8_;
          uStack_4778 = auVar139._8_8_;
          uStack_4770 = auVar139._16_8_;
          uStack_4768 = auVar139._24_8_;
          uStack_4760 = auVar139._32_8_;
          uStack_4758 = auVar139._40_8_;
          uStack_4750 = auVar139._48_8_;
          uStack_4748 = auVar139._56_8_;
          local_4540 = local_4780;
          uStack_4538 = uStack_4778;
          uStack_4530 = uStack_4770;
          uStack_4528 = uStack_4768;
          uStack_4520 = uStack_4760;
          uStack_4518 = uStack_4758;
          uStack_4510 = uStack_4750;
          uStack_4508 = uStack_4748;
          local_4580 = local_4640._0_8_;
          uStack_4578 = local_4640._8_8_;
          uStack_4570 = local_4640._16_8_;
          uStack_4568 = local_4640._24_8_;
          uStack_4560 = local_4640._32_8_;
          uStack_4558 = local_4640._40_8_;
          uStack_4550 = local_4640._48_8_;
          uStack_4548 = local_4640._56_8_;
          local_45c0 = local_4600._0_8_;
          uStack_45b8 = local_4600._8_8_;
          uStack_45b0 = local_4600._16_8_;
          uStack_45a8 = local_4600._24_8_;
          uStack_45a0 = local_4600._32_8_;
          uStack_4598 = local_4600._40_8_;
          uStack_4590 = local_4600._48_8_;
          uStack_4588 = local_4600._56_8_;
          auVar139 = vfmadd213ps_avx512f(local_4640,auVar139,local_4600);
          local_4780 = auVar139._0_8_;
          uStack_4778 = auVar139._8_8_;
          uStack_4770 = auVar139._16_8_;
          uStack_4768 = auVar139._24_8_;
          uStack_4760 = auVar139._32_8_;
          uStack_4758 = auVar139._40_8_;
          uStack_4750 = auVar139._48_8_;
          uStack_4748 = auVar139._56_8_;
          local_4040 = local_4780;
          uStack_4038 = uStack_4778;
          uStack_4030 = uStack_4770;
          uStack_4028 = uStack_4768;
          uStack_4020 = uStack_4760;
          uStack_4018 = uStack_4758;
          uStack_4010 = uStack_4750;
          uStack_4008 = uStack_4748;
          local_4080[0] = 1.0;
          local_4080[1] = 1.0;
          local_4080[2] = 1.0;
          local_4080[3] = 1.0;
          local_4080[4] = 1.0;
          local_4080[5] = 1.0;
          local_4080[6] = 1.0;
          local_4080[7] = 1.0;
          local_4080[8] = 1.0;
          local_4080[9] = 1.0;
          local_4080[10] = 1.0;
          local_4080[0xb] = 1.0;
          local_4080[0xc] = 1.0;
          local_4080[0xd] = 1.0;
          local_4080[0xe] = 1.0;
          local_4080[0xf] = 1.0;
          auVar22._8_4_ = 1.0;
          auVar22._12_4_ = 1.0;
          auVar22._0_4_ = 1.0;
          auVar22._4_4_ = 1.0;
          auVar22._16_4_ = 1.0;
          auVar22._20_4_ = 1.0;
          auVar22._24_4_ = 1.0;
          auVar22._28_4_ = 1.0;
          auVar22._32_4_ = 1.0;
          auVar22._36_4_ = 1.0;
          auVar22._40_4_ = 1.0;
          auVar22._44_4_ = 1.0;
          auVar22._48_4_ = 1.0;
          auVar22._52_4_ = 1.0;
          auVar22._56_4_ = 1.0;
          auVar22._60_4_ = 1.0;
          auVar140 = vaddps_avx512f(auVar139,auVar22);
          local_2d80 = local_4680._0_8_;
          uStack_2d78 = local_4680._8_8_;
          uStack_2d70 = uStack_4670;
          uStack_2d68 = uStack_4668;
          uStack_2d60 = uStack_4660;
          uStack_2d58 = uStack_4658;
          uStack_2d50 = uStack_4650;
          uStack_2d48 = uStack_4648;
          auVar47._16_8_ = uStack_4670;
          auVar47._0_16_ = local_4680;
          auVar47._24_8_ = uStack_4668;
          auVar47._32_8_ = uStack_4660;
          auVar47._40_8_ = uStack_4658;
          auVar47._48_8_ = uStack_4650;
          auVar47._56_8_ = uStack_4648;
          local_2ac0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          vmovdqa64_avx512f(local_2ac0);
          auVar139 = vcvttps2dq_avx512f(auVar47);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar141 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          local_2c80 = vmovdqa64_avx512f(auVar139);
          local_2cc0 = vmovdqa64_avx512f(auVar141);
          auVar139 = vmovdqa64_avx512f(local_2c80);
          auVar141 = vmovdqa64_avx512f(local_2cc0);
          auVar139 = vpaddd_avx512f(auVar139,auVar141);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(auVar139);
          local_2b80 = vmovdqa64_avx512f(auVar139);
          local_2b84 = 0x17;
          auVar139 = vmovdqa64_avx512f(local_2b80);
          auVar139 = vpslld_avx512f(auVar139,ZEXT416(0x17));
          local_46c0 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(local_46c0);
          local_2b00 = vmovdqa64_avx512f(auVar139);
          local_47c0 = vmovdqa64_avx512f(local_2b00);
          local_4780 = auVar140._0_8_;
          uStack_4778 = auVar140._8_8_;
          uStack_4770 = auVar140._16_8_;
          uStack_4768 = auVar140._24_8_;
          uStack_4760 = auVar140._32_8_;
          uStack_4758 = auVar140._40_8_;
          uStack_4750 = auVar140._48_8_;
          uStack_4748 = auVar140._56_8_;
          local_3fc0 = local_4780;
          uStack_3fb8 = uStack_4778;
          uStack_3fb0 = uStack_4770;
          uStack_3fa8 = uStack_4768;
          uStack_3fa0 = uStack_4760;
          uStack_3f98 = uStack_4758;
          uStack_3f90 = uStack_4750;
          uStack_3f88 = uStack_4748;
          local_4000 = local_47c0._0_8_;
          uStack_3ff8 = local_47c0._8_8_;
          uStack_3ff0 = local_47c0._16_8_;
          uStack_3fe8 = local_47c0._24_8_;
          uStack_3fe0 = local_47c0._32_8_;
          uStack_3fd8 = local_47c0._40_8_;
          uStack_3fd0 = local_47c0._48_8_;
          uStack_3fc8 = local_47c0._56_8_;
          _local_4780 = vmulps_avx512f(auVar140,local_47c0);
          local_4ec4 = 0x3f800000;
          local_4f40 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          local_4e80 = local_4780;
          uStack_4e78 = uStack_4778;
          uStack_4e70 = uStack_4770;
          uStack_4e68 = uStack_4768;
          uStack_4e60 = uStack_4760;
          uStack_4e58 = uStack_4758;
          uStack_4e50 = uStack_4750;
          uStack_4e48 = uStack_4748;
          local_4ec0 = local_4f40._0_8_;
          uStack_4eb8 = local_4f40._8_8_;
          uStack_4eb0 = local_4f40._16_8_;
          uStack_4ea8 = local_4f40._24_8_;
          uStack_4ea0 = local_4f40._32_8_;
          uStack_4e98 = local_4f40._40_8_;
          uStack_4e90 = local_4f40._48_8_;
          uStack_4e88 = local_4f40._56_8_;
          auVar139 = vaddps_avx512f(_local_4780,local_4f40);
          local_1500[0] = 1.0;
          local_1500[1] = 1.0;
          local_1500[2] = 1.0;
          local_1500[3] = 1.0;
          local_1500[4] = 1.0;
          local_1500[5] = 1.0;
          local_1500[6] = 1.0;
          local_1500[7] = 1.0;
          local_1500[8] = 1.0;
          local_1500[9] = 1.0;
          local_1500[10] = 1.0;
          local_1500[0xb] = 1.0;
          local_1500[0xc] = 1.0;
          local_1500[0xd] = 1.0;
          local_1500[0xe] = 1.0;
          local_1500[0xf] = 1.0;
          local_9c0 = 0;
          uStack_9b8 = 0;
          uStack_9b0 = 0;
          uStack_9a8 = 0;
          uStack_9a0 = 0;
          uStack_998 = 0;
          uStack_990 = 0;
          uStack_988 = 0;
          uVar18 = vcmpps_avx512f(auVar139,ZEXT1664(ZEXT816(0)),2);
          local_1502 = (undefined2)uVar18;
          local_1480._0_8_ = auVar139._0_8_;
          local_1480._8_8_ = auVar139._8_8_;
          local_1480._16_8_ = auVar139._16_8_;
          local_1480._24_8_ = auVar139._24_8_;
          local_1480._32_8_ = auVar139._32_8_;
          local_1480._40_8_ = auVar139._40_8_;
          local_1480._48_8_ = auVar139._48_8_;
          local_1480._56_8_ = auVar139._56_8_;
          local_940 = local_1480._0_8_;
          uStack_938 = local_1480._8_8_;
          uStack_930 = local_1480._16_8_;
          uStack_928 = local_1480._24_8_;
          uStack_920 = local_1480._32_8_;
          uStack_918 = local_1480._40_8_;
          uStack_910 = local_1480._48_8_;
          uStack_908 = local_1480._56_8_;
          local_980[0] = 0x800000;
          local_980[1] = 0x800000;
          local_980[2] = 0x800000;
          local_980[3] = 0x800000;
          local_980[4] = 0x800000;
          local_980[5] = 0x800000;
          local_980[6] = 0x800000;
          local_980[7] = 0x800000;
          local_980[8] = 0x800000;
          local_980[9] = 0x800000;
          local_980[10] = 0x800000;
          local_980[0xb] = 0x800000;
          local_980[0xc] = 0x800000;
          local_980[0xd] = 0x800000;
          local_980[0xe] = 0x800000;
          local_980[0xf] = 0x800000;
          auVar92._8_4_ = 0x800000;
          auVar92._12_4_ = 0x800000;
          auVar92._0_4_ = 0x800000;
          auVar92._4_4_ = 0x800000;
          auVar92._16_4_ = 0x800000;
          auVar92._20_4_ = 0x800000;
          auVar92._24_4_ = 0x800000;
          auVar92._28_4_ = 0x800000;
          auVar92._32_4_ = 0x800000;
          auVar92._36_4_ = 0x800000;
          auVar92._40_4_ = 0x800000;
          auVar92._44_4_ = 0x800000;
          auVar92._48_4_ = 0x800000;
          auVar92._52_4_ = 0x800000;
          auVar92._56_4_ = 0x800000;
          auVar92._60_4_ = 0x800000;
          auVar140 = vmaxps_avx512f(auVar139,auVar92);
          local_1480._0_8_ = auVar140._0_8_;
          local_1480._8_8_ = auVar140._8_8_;
          local_1480._16_8_ = auVar140._16_8_;
          local_1480._24_8_ = auVar140._24_8_;
          local_1480._32_8_ = auVar140._32_8_;
          local_1480._40_8_ = auVar140._40_8_;
          local_1480._48_8_ = auVar140._48_8_;
          local_1480._56_8_ = auVar140._56_8_;
          local_540 = local_1480._0_8_;
          uStack_538 = local_1480._8_8_;
          uStack_530 = local_1480._16_8_;
          uStack_528 = local_1480._24_8_;
          uStack_520 = local_1480._32_8_;
          uStack_518 = local_1480._40_8_;
          uStack_510 = local_1480._48_8_;
          uStack_508 = local_1480._56_8_;
          local_580 = local_1480._0_8_;
          uStack_578 = local_1480._8_8_;
          uStack_570 = local_1480._16_8_;
          uStack_568 = local_1480._24_8_;
          uStack_560 = local_1480._32_8_;
          uStack_558 = local_1480._40_8_;
          uStack_550 = local_1480._48_8_;
          uStack_548 = local_1480._56_8_;
          local_584 = 0x17;
          auVar139 = vmovdqa64_avx512f(auVar140);
          auVar139 = vpsrld_avx512f(auVar139,ZEXT416(0x17));
          auVar139 = vmovdqa64_avx512f(auVar139);
          local_4c0 = local_1480._0_8_;
          uStack_4b8 = local_1480._8_8_;
          uStack_4b0 = local_1480._16_8_;
          uStack_4a8 = local_1480._24_8_;
          uStack_4a0 = local_1480._32_8_;
          uStack_498 = local_1480._40_8_;
          uStack_490 = local_1480._48_8_;
          uStack_488 = local_1480._56_8_;
          local_500[0] = -0x7f800001;
          local_500[1] = -0x7f800001;
          local_500[2] = -0x7f800001;
          local_500[3] = -0x7f800001;
          local_500[4] = -0x7f800001;
          local_500[5] = -0x7f800001;
          local_500[6] = -0x7f800001;
          local_500[7] = -0x7f800001;
          local_500[8] = -0x7f800001;
          local_500[9] = -0x7f800001;
          local_500[10] = -0x7f800001;
          local_500[0xb] = -0x7f800001;
          local_500[0xc] = -0x7f800001;
          local_500[0xd] = -0x7f800001;
          local_500[0xe] = -0x7f800001;
          local_500[0xf] = -0x7f800001;
          auVar140 = vmovdqa64_avx512f(auVar140);
          auVar95._8_4_ = -0x7f800001;
          auVar95._12_4_ = -0x7f800001;
          auVar95._0_4_ = -0x7f800001;
          auVar95._4_4_ = -0x7f800001;
          auVar95._16_4_ = -0x7f800001;
          auVar95._20_4_ = -0x7f800001;
          auVar95._24_4_ = -0x7f800001;
          auVar95._28_4_ = -0x7f800001;
          auVar95._32_4_ = -0x7f800001;
          auVar95._36_4_ = -0x7f800001;
          auVar95._40_4_ = -0x7f800001;
          auVar95._44_4_ = -0x7f800001;
          auVar95._48_4_ = -0x7f800001;
          auVar95._52_4_ = -0x7f800001;
          auVar95._56_4_ = -0x7f800001;
          auVar95._60_4_ = -0x7f800001;
          auVar141 = vmovdqa64_avx512f(auVar95);
          auVar140 = vpandd_avx512f(auVar140,auVar141);
          auVar140 = vmovdqa64_avx512f(auVar140);
          local_1480._0_8_ = auVar140._0_8_;
          local_1480._8_8_ = auVar140._8_8_;
          local_1480._16_8_ = auVar140._16_8_;
          local_1480._24_8_ = auVar140._24_8_;
          local_1480._32_8_ = auVar140._32_8_;
          local_1480._40_8_ = auVar140._40_8_;
          local_1480._48_8_ = auVar140._48_8_;
          local_1480._56_8_ = auVar140._56_8_;
          local_3c0 = local_1480._0_8_;
          uStack_3b8 = local_1480._8_8_;
          uStack_3b0 = local_1480._16_8_;
          uStack_3a8 = local_1480._24_8_;
          uStack_3a0 = local_1480._32_8_;
          uStack_398 = local_1480._40_8_;
          uStack_390 = local_1480._48_8_;
          uStack_388 = local_1480._56_8_;
          local_400[0] = 0.5;
          local_400[1] = 0.5;
          local_400[2] = 0.5;
          local_400[3] = 0.5;
          local_400[4] = 0.5;
          local_400[5] = 0.5;
          local_400[6] = 0.5;
          local_400[7] = 0.5;
          local_400[8] = 0.5;
          local_400[9] = 0.5;
          local_400[10] = 0.5;
          local_400[0xb] = 0.5;
          local_400[0xc] = 0.5;
          local_400[0xd] = 0.5;
          local_400[0xe] = 0.5;
          local_400[0xf] = 0.5;
          auVar140 = vmovdqa64_avx512f(auVar140);
          auVar96._8_4_ = 0.5;
          auVar96._12_4_ = 0.5;
          auVar96._0_4_ = 0.5;
          auVar96._4_4_ = 0.5;
          auVar96._16_4_ = 0.5;
          auVar96._20_4_ = 0.5;
          auVar96._24_4_ = 0.5;
          auVar96._28_4_ = 0.5;
          auVar96._32_4_ = 0.5;
          auVar96._36_4_ = 0.5;
          auVar96._40_4_ = 0.5;
          auVar96._44_4_ = 0.5;
          auVar96._48_4_ = 0.5;
          auVar96._52_4_ = 0.5;
          auVar96._56_4_ = 0.5;
          auVar96._60_4_ = 0.5;
          auVar141 = vmovdqa64_avx512f(auVar96);
          auVar140 = vpord_avx512f(auVar140,auVar141);
          auVar140 = vmovdqa64_avx512f(auVar140);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar141 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          local_340 = vmovdqa64_avx512f(auVar139);
          local_380 = vmovdqa64_avx512f(auVar141);
          auVar139 = vmovdqa64_avx512f(local_340);
          auVar141 = vmovdqa64_avx512f(local_380);
          auVar139 = vpsubd_avx512f(auVar139,auVar141);
          local_14c0 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(local_14c0);
          local_300 = vmovdqa64_avx512f(auVar139);
          auVar139 = vcvtdq2ps_avx512f(local_300);
          local_1580._0_8_ = auVar139._0_8_;
          local_1580._8_8_ = auVar139._8_8_;
          uStack_1570 = auVar139._16_8_;
          uStack_1568 = auVar139._24_8_;
          uStack_1560 = auVar139._32_8_;
          uStack_1558 = auVar139._40_8_;
          uStack_1550 = auVar139._48_8_;
          uStack_1548 = auVar139._56_8_;
          local_b80 = local_1580._0_8_;
          uStack_b78 = local_1580._8_8_;
          uStack_b70 = uStack_1570;
          uStack_b68 = uStack_1568;
          uStack_b60 = uStack_1560;
          uStack_b58 = uStack_1558;
          uStack_b50 = uStack_1550;
          uStack_b48 = uStack_1548;
          local_bc0[0] = 1.0;
          local_bc0[1] = 1.0;
          local_bc0[2] = 1.0;
          local_bc0[3] = 1.0;
          local_bc0[4] = 1.0;
          local_bc0[5] = 1.0;
          local_bc0[6] = 1.0;
          local_bc0[7] = 1.0;
          local_bc0[8] = 1.0;
          local_bc0[9] = 1.0;
          local_bc0[10] = 1.0;
          local_bc0[0xb] = 1.0;
          local_bc0[0xc] = 1.0;
          local_bc0[0xd] = 1.0;
          local_bc0[0xe] = 1.0;
          local_bc0[0xf] = 1.0;
          auVar88._8_4_ = 1.0;
          auVar88._12_4_ = 1.0;
          auVar88._0_4_ = 1.0;
          auVar88._4_4_ = 1.0;
          auVar88._16_4_ = 1.0;
          auVar88._20_4_ = 1.0;
          auVar88._24_4_ = 1.0;
          auVar88._28_4_ = 1.0;
          auVar88._32_4_ = 1.0;
          auVar88._36_4_ = 1.0;
          auVar88._40_4_ = 1.0;
          auVar88._44_4_ = 1.0;
          auVar88._48_4_ = 1.0;
          auVar88._52_4_ = 1.0;
          auVar88._56_4_ = 1.0;
          auVar88._60_4_ = 1.0;
          auVar139 = vaddps_avx512f(auVar139,auVar88);
          uVar17 = vcmpps_avx512f(auVar140,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          local_1582 = (ushort)uVar17;
          local_1480._0_8_ = auVar140._0_8_;
          local_1480._8_8_ = auVar140._8_8_;
          local_1480._16_8_ = auVar140._16_8_;
          local_1480._24_8_ = auVar140._24_8_;
          local_1480._32_8_ = auVar140._32_8_;
          local_1480._40_8_ = auVar140._40_8_;
          local_1480._48_8_ = auVar140._48_8_;
          local_1480._56_8_ = auVar140._56_8_;
          local_c80 = local_1480._0_8_;
          uStack_c78 = local_1480._8_8_;
          uStack_c70 = local_1480._16_8_;
          uStack_c68 = local_1480._24_8_;
          uStack_c60 = local_1480._32_8_;
          uStack_c58 = local_1480._40_8_;
          uStack_c50 = local_1480._48_8_;
          uStack_c48 = local_1480._56_8_;
          local_d00[0x10] = 1.0;
          local_d00[0x11] = 1.0;
          local_d00[0x12] = 1.0;
          local_d00[0x13] = 1.0;
          local_d00[0x14] = 1.0;
          local_d00[0x15] = 1.0;
          local_d00[0x16] = 1.0;
          local_d00[0x17] = 1.0;
          local_d00[0x18] = 1.0;
          local_d00[0x19] = 1.0;
          local_d00[0x1a] = 1.0;
          local_d00[0x1b] = 1.0;
          local_d00[0x1c] = 1.0;
          local_d00[0x1d] = 1.0;
          local_d00[0x1e] = 1.0;
          local_d00[0x1f] = 1.0;
          auVar86._8_4_ = 1.0;
          auVar86._12_4_ = 1.0;
          auVar86._0_4_ = 1.0;
          auVar86._4_4_ = 1.0;
          auVar86._16_4_ = 1.0;
          auVar86._20_4_ = 1.0;
          auVar86._24_4_ = 1.0;
          auVar86._28_4_ = 1.0;
          auVar86._32_4_ = 1.0;
          auVar86._36_4_ = 1.0;
          auVar86._40_4_ = 1.0;
          auVar86._44_4_ = 1.0;
          auVar86._48_4_ = 1.0;
          auVar86._52_4_ = 1.0;
          auVar86._56_4_ = 1.0;
          auVar86._60_4_ = 1.0;
          local_1600 = vsubps_avx512f(auVar140,auVar86);
          local_1580._0_8_ = auVar139._0_8_;
          local_1580._8_8_ = auVar139._8_8_;
          uStack_1570 = auVar139._16_8_;
          uStack_1568 = auVar139._24_8_;
          uStack_1560 = auVar139._32_8_;
          uStack_1558 = auVar139._40_8_;
          uStack_1550 = auVar139._48_8_;
          uStack_1548 = auVar139._56_8_;
          local_840 = local_1580._0_8_;
          uVar123 = local_840;
          uStack_838 = local_1580._8_8_;
          uVar124 = uStack_838;
          uStack_830 = uStack_1570;
          uVar125 = uStack_830;
          uStack_828 = uStack_1568;
          uVar126 = uStack_828;
          uStack_820 = uStack_1560;
          uVar127 = uStack_820;
          uStack_818 = uStack_1558;
          uVar128 = uStack_818;
          uStack_810 = uStack_1550;
          uVar129 = uStack_810;
          uStack_808 = uStack_1548;
          uVar130 = uStack_808;
          local_8c0 = local_1580._0_8_;
          uStack_8b8 = local_1580._8_8_;
          uStack_8b0 = uStack_1570;
          uStack_8a8 = uStack_1568;
          uStack_8a0 = uStack_1560;
          uStack_898 = uStack_1558;
          uStack_890 = uStack_1550;
          uStack_888 = uStack_1548;
          local_900[0] = 1.0;
          local_900[1] = 1.0;
          local_900[2] = 1.0;
          local_900[3] = 1.0;
          local_900[4] = 1.0;
          local_900[5] = 1.0;
          local_900[6] = 1.0;
          local_900[7] = 1.0;
          local_900[8] = 1.0;
          local_900[9] = 1.0;
          local_900[10] = 1.0;
          local_900[0xb] = 1.0;
          local_900[0xc] = 1.0;
          local_900[0xd] = 1.0;
          local_900[0xe] = 1.0;
          local_900[0xf] = 1.0;
          local_7c0 = local_1580._0_8_;
          uStack_7b8 = local_1580._8_8_;
          uStack_7b0 = uStack_1570;
          uStack_7a8 = uStack_1568;
          uStack_7a0 = uStack_1560;
          uStack_798 = uStack_1558;
          uStack_790 = uStack_1550;
          uStack_788 = uStack_1548;
          local_800[0] = 1.0;
          local_800[1] = 1.0;
          local_800[2] = 1.0;
          local_800[3] = 1.0;
          local_800[4] = 1.0;
          local_800[5] = 1.0;
          local_800[6] = 1.0;
          local_800[7] = 1.0;
          local_800[8] = 1.0;
          local_800[9] = 1.0;
          local_800[10] = 1.0;
          local_800[0xb] = 1.0;
          local_800[0xc] = 1.0;
          local_800[0xd] = 1.0;
          local_800[0xe] = 1.0;
          local_800[0xf] = 1.0;
          auVar93._8_4_ = 1.0;
          auVar93._12_4_ = 1.0;
          auVar93._0_4_ = 1.0;
          auVar93._4_4_ = 1.0;
          auVar93._16_4_ = 1.0;
          auVar93._20_4_ = 1.0;
          auVar93._24_4_ = 1.0;
          auVar93._28_4_ = 1.0;
          auVar93._32_4_ = 1.0;
          auVar93._36_4_ = 1.0;
          auVar93._40_4_ = 1.0;
          auVar93._44_4_ = 1.0;
          auVar93._48_4_ = 1.0;
          auVar93._52_4_ = 1.0;
          auVar93._56_4_ = 1.0;
          auVar93._60_4_ = 1.0;
          local_840._0_4_ = auVar139._0_4_;
          local_840._4_4_ = auVar139._4_4_;
          uStack_838._0_4_ = auVar139._8_4_;
          uStack_838._4_4_ = auVar139._12_4_;
          uStack_830._0_4_ = auVar139._16_4_;
          uStack_830._4_4_ = auVar139._20_4_;
          uStack_828._0_4_ = auVar139._24_4_;
          uStack_828._4_4_ = auVar139._28_4_;
          uStack_820._0_4_ = auVar139._32_4_;
          uStack_820._4_4_ = auVar139._36_4_;
          uStack_818._0_4_ = auVar139._40_4_;
          uStack_818._4_4_ = auVar139._44_4_;
          uStack_810._0_4_ = auVar139._48_4_;
          uStack_810._4_4_ = auVar139._52_4_;
          uStack_808._0_4_ = auVar139._56_4_;
          uStack_808._4_4_ = auVar139._60_4_;
          auVar139 = vsubps_avx512f(auVar139,auVar93);
          bVar2 = (bool)((byte)uVar17 & 1);
          bVar3 = (bool)((byte)(local_1582 >> 1) & 1);
          bVar4 = (bool)((byte)(local_1582 >> 2) & 1);
          bVar5 = (bool)((byte)(local_1582 >> 3) & 1);
          bVar6 = (bool)((byte)(local_1582 >> 4) & 1);
          bVar7 = (bool)((byte)(local_1582 >> 5) & 1);
          bVar8 = (bool)((byte)(local_1582 >> 6) & 1);
          bVar9 = (bool)((byte)(local_1582 >> 7) & 1);
          bVar10 = (byte)((ulong)uVar17 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          local_1580._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * local_840._4_4_;
          local_1580._0_4_ = (uint)bVar2 * auVar139._0_4_ | (uint)!bVar2 * (int)local_840;
          local_1580._8_4_ = (uint)bVar4 * auVar139._8_4_ | (uint)!bVar4 * (int)uStack_838;
          local_1580._12_4_ = (uint)bVar5 * auVar139._12_4_ | (uint)!bVar5 * uStack_838._4_4_;
          uStack_1570._0_4_ = (uint)bVar6 * auVar139._16_4_ | (uint)!bVar6 * (int)uStack_830;
          uStack_1570._4_4_ = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * uStack_830._4_4_;
          auVar105 = _local_1580;
          uStack_1568._0_4_ = (uint)bVar8 * auVar139._24_4_ | (uint)!bVar8 * (int)uStack_828;
          uStack_1568._4_4_ = (uint)bVar9 * auVar139._28_4_ | (uint)!bVar9 * uStack_828._4_4_;
          auVar106 = _local_1580;
          uStack_1560._0_4_ =
               (uint)(bVar10 & 1) * auVar139._32_4_ | (uint)!(bool)(bVar10 & 1) * (int)uStack_820;
          uStack_1560._4_4_ = (uint)bVar11 * auVar139._36_4_ | (uint)!bVar11 * uStack_820._4_4_;
          auVar107 = _local_1580;
          uStack_1558._0_4_ = (uint)bVar12 * auVar139._40_4_ | (uint)!bVar12 * (int)uStack_818;
          uStack_1558._4_4_ = (uint)bVar13 * auVar139._44_4_ | (uint)!bVar13 * uStack_818._4_4_;
          auVar108 = _local_1580;
          uStack_1550._0_4_ = (uint)bVar14 * auVar139._48_4_ | (uint)!bVar14 * (int)uStack_810;
          uStack_1550._4_4_ = (uint)bVar15 * auVar139._52_4_ | (uint)!bVar15 * uStack_810._4_4_;
          auVar109 = _local_1580;
          uStack_1548._0_4_ = (uint)bVar16 * auVar139._56_4_ | (uint)!bVar16 * (int)uStack_808;
          uStack_1548._4_4_ =
               (uint)(bVar10 >> 7) * auVar139._60_4_ | (uint)!(bool)(bVar10 >> 7) * uStack_808._4_4_
          ;
          auVar141 = _local_1580;
          local_200 = local_1600._0_8_;
          uVar131 = local_200;
          uStack_1f8 = local_1600._8_8_;
          uVar132 = uStack_1f8;
          uStack_1f0 = local_1600._16_8_;
          uVar133 = uStack_1f0;
          uStack_1e8 = local_1600._24_8_;
          uVar134 = uStack_1e8;
          uStack_1e0 = local_1600._32_8_;
          uVar135 = uStack_1e0;
          uStack_1d8 = local_1600._40_8_;
          uVar136 = uStack_1d8;
          uStack_1d0 = local_1600._48_8_;
          uVar137 = uStack_1d0;
          uStack_1c8 = local_1600._56_8_;
          uVar138 = uStack_1c8;
          local_280 = local_1600._0_8_;
          uStack_278 = local_1600._8_8_;
          uStack_270 = local_1600._16_8_;
          uStack_268 = local_1600._24_8_;
          uStack_260 = local_1600._32_8_;
          uStack_258 = local_1600._40_8_;
          uStack_250 = local_1600._48_8_;
          uStack_248 = local_1600._56_8_;
          local_2c0 = local_1480._0_8_;
          uStack_2b8 = local_1480._8_8_;
          uStack_2b0 = local_1480._16_8_;
          uStack_2a8 = local_1480._24_8_;
          uStack_2a0 = local_1480._32_8_;
          uStack_298 = local_1480._40_8_;
          uStack_290 = local_1480._48_8_;
          uStack_288 = local_1480._56_8_;
          local_180 = local_1600._0_8_;
          uStack_178 = local_1600._8_8_;
          uStack_170 = local_1600._16_8_;
          uStack_168 = local_1600._24_8_;
          uStack_160 = local_1600._32_8_;
          uStack_158 = local_1600._40_8_;
          uStack_150 = local_1600._48_8_;
          uStack_148 = local_1600._56_8_;
          local_1c0 = local_1480._0_8_;
          uStack_1b8 = local_1480._8_8_;
          uStack_1b0 = local_1480._16_8_;
          uStack_1a8 = local_1480._24_8_;
          uStack_1a0 = local_1480._32_8_;
          uStack_198 = local_1480._40_8_;
          uStack_190 = local_1480._48_8_;
          uStack_188 = local_1480._56_8_;
          local_200._0_4_ = local_1600._0_4_;
          local_200._4_4_ = local_1600._4_4_;
          uStack_1f8._0_4_ = local_1600._8_4_;
          uStack_1f8._4_4_ = local_1600._12_4_;
          uStack_1f0._0_4_ = local_1600._16_4_;
          uStack_1f0._4_4_ = local_1600._20_4_;
          uStack_1e8._0_4_ = local_1600._24_4_;
          uStack_1e8._4_4_ = local_1600._28_4_;
          uStack_1e0._0_4_ = local_1600._32_4_;
          uStack_1e0._4_4_ = local_1600._36_4_;
          uStack_1d8._0_4_ = local_1600._40_4_;
          uStack_1d8._4_4_ = local_1600._44_4_;
          uStack_1d0._0_4_ = local_1600._48_4_;
          uStack_1d0._4_4_ = local_1600._52_4_;
          uStack_1c8._0_4_ = local_1600._56_4_;
          uStack_1c8._4_4_ = local_1600._60_4_;
          auVar139 = vaddps_avx512f(local_1600,auVar140);
          bVar2 = (bool)((byte)uVar17 & 1);
          bVar3 = (bool)((byte)(local_1582 >> 1) & 1);
          bVar4 = (bool)((byte)(local_1582 >> 2) & 1);
          bVar5 = (bool)((byte)(local_1582 >> 3) & 1);
          bVar6 = (bool)((byte)(local_1582 >> 4) & 1);
          bVar7 = (bool)((byte)(local_1582 >> 5) & 1);
          bVar8 = (bool)((byte)(local_1582 >> 6) & 1);
          bVar9 = (bool)((byte)(local_1582 >> 7) & 1);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          local_1480._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * local_200._4_4_;
          local_1480._0_4_ = (uint)bVar2 * auVar139._0_4_ | (uint)!bVar2 * (int)local_200;
          local_1480._8_4_ = (uint)bVar4 * auVar139._8_4_ | (uint)!bVar4 * (int)uStack_1f8;
          local_1480._12_4_ = (uint)bVar5 * auVar139._12_4_ | (uint)!bVar5 * uStack_1f8._4_4_;
          local_1480._16_4_ = (uint)bVar6 * auVar139._16_4_ | (uint)!bVar6 * (int)uStack_1f0;
          local_1480._20_4_ = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * uStack_1f0._4_4_;
          auVar118 = local_1480._0_24_;
          local_1480._24_4_ = (uint)bVar8 * auVar139._24_4_ | (uint)!bVar8 * (int)uStack_1e8;
          local_1480._28_4_ = (uint)bVar9 * auVar139._28_4_ | (uint)!bVar9 * uStack_1e8._4_4_;
          auVar119 = local_1480._0_32_;
          local_1480._32_4_ =
               (uint)(bVar10 & 1) * auVar139._32_4_ | (uint)!(bool)(bVar10 & 1) * (int)uStack_1e0;
          local_1480._36_4_ = (uint)bVar11 * auVar139._36_4_ | (uint)!bVar11 * uStack_1e0._4_4_;
          auVar120 = local_1480._0_40_;
          local_1480._40_4_ = (uint)bVar12 * auVar139._40_4_ | (uint)!bVar12 * (int)uStack_1d8;
          local_1480._44_4_ = (uint)bVar13 * auVar139._44_4_ | (uint)!bVar13 * uStack_1d8._4_4_;
          auVar121 = local_1480._0_48_;
          local_1480._48_4_ = (uint)bVar14 * auVar139._48_4_ | (uint)!bVar14 * (int)uStack_1d0;
          local_1480._52_4_ = (uint)bVar15 * auVar139._52_4_ | (uint)!bVar15 * uStack_1d0._4_4_;
          auVar122 = local_1480._0_56_;
          local_1480._56_4_ = (uint)bVar16 * auVar139._56_4_ | (uint)!bVar16 * (int)uStack_1c8;
          local_1480._60_4_ =
               (uint)(bVar10 >> 7) * auVar139._60_4_ | (uint)!(bool)(bVar10 >> 7) * uStack_1c8._4_4_
          ;
          auVar139 = local_1480;
          local_1480._16_8_ = auVar118._16_8_;
          local_1480._24_8_ = auVar119._24_8_;
          local_1480._32_8_ = auVar120._32_8_;
          local_1480._40_8_ = auVar121._40_8_;
          local_1480._48_8_ = auVar122._48_8_;
          local_1480._56_8_ = auVar139._56_8_;
          local_a00 = local_1480._0_8_;
          uStack_9f8 = local_1480._8_8_;
          uStack_9f0 = local_1480._16_8_;
          uStack_9e8 = local_1480._24_8_;
          uStack_9e0 = local_1480._32_8_;
          uStack_9d8 = local_1480._40_8_;
          uStack_9d0 = local_1480._48_8_;
          uStack_9c8 = local_1480._56_8_;
          local_a40 = local_1480._0_8_;
          uStack_a38 = local_1480._8_8_;
          uStack_a30 = local_1480._16_8_;
          uStack_a28 = local_1480._24_8_;
          uStack_a20 = local_1480._32_8_;
          uStack_a18 = local_1480._40_8_;
          uStack_a10 = local_1480._48_8_;
          uStack_a08 = local_1480._56_8_;
          auVar91._16_8_ = local_1480._16_8_;
          auVar91._0_16_ = local_1480._0_16_;
          auVar91._24_8_ = local_1480._24_8_;
          auVar91._32_8_ = local_1480._32_8_;
          auVar91._40_8_ = local_1480._40_8_;
          auVar91._48_8_ = local_1480._48_8_;
          auVar91._56_8_ = local_1480._56_8_;
          auVar90._16_8_ = local_1480._16_8_;
          auVar90._0_16_ = local_1480._0_16_;
          auVar90._24_8_ = local_1480._24_8_;
          auVar90._32_8_ = local_1480._32_8_;
          auVar90._40_8_ = local_1480._40_8_;
          auVar90._48_8_ = local_1480._48_8_;
          auVar90._56_8_ = local_1480._56_8_;
          local_1640 = vmulps_avx512f(auVar91,auVar90);
          uStack_1678._0_4_ = 0.070376836;
          uStack_1678._4_4_ = 0.070376836;
          local_1680._0_4_ = 0.070376836;
          local_1680._4_4_ = 0.070376836;
          local_d00[0] = 0.070376836;
          local_d00[1] = 0.070376836;
          local_d00[2] = 0.070376836;
          local_d00[3] = 0.070376836;
          local_d00[4] = 0.070376836;
          local_d00[5] = 0.070376836;
          local_d00[6] = 0.070376836;
          local_d00[7] = 0.070376836;
          local_d00[8] = 0.070376836;
          local_d00[9] = 0.070376836;
          local_d00[10] = 0.070376836;
          local_d00[0xb] = 0.070376836;
          local_d00[0xc] = 0.070376836;
          local_d00[0xd] = 0.070376836;
          local_d00[0xe] = 0.070376836;
          local_d00[0xf] = 0.070376836;
          local_d40 = local_1480._0_8_;
          uStack_d38 = local_1480._8_8_;
          uStack_d30 = local_1480._16_8_;
          uStack_d28 = local_1480._24_8_;
          uStack_d20 = local_1480._32_8_;
          uStack_d18 = local_1480._40_8_;
          uStack_d10 = local_1480._48_8_;
          uStack_d08 = local_1480._56_8_;
          local_d80[0] = -0.1151461;
          local_d80[1] = -0.1151461;
          local_d80[2] = -0.1151461;
          local_d80[3] = -0.1151461;
          local_d80[4] = -0.1151461;
          local_d80[5] = -0.1151461;
          local_d80[6] = -0.1151461;
          local_d80[7] = -0.1151461;
          local_d80[8] = -0.1151461;
          local_d80[9] = -0.1151461;
          local_d80[10] = -0.1151461;
          local_d80[0xb] = -0.1151461;
          local_d80[0xc] = -0.1151461;
          local_d80[0xd] = -0.1151461;
          local_d80[0xe] = -0.1151461;
          local_d80[0xf] = -0.1151461;
          auVar85._16_4_ = 0.070376836;
          auVar85._20_4_ = 0.070376836;
          auVar85._0_16_ = _local_1680;
          auVar85._24_4_ = 0.070376836;
          auVar85._28_4_ = 0.070376836;
          auVar85._32_4_ = 0.070376836;
          auVar85._36_4_ = 0.070376836;
          auVar85._40_4_ = 0.070376836;
          auVar85._44_4_ = 0.070376836;
          auVar85._48_4_ = 0.070376836;
          auVar85._52_4_ = 0.070376836;
          auVar85._56_4_ = 0.070376836;
          auVar85._60_4_ = 0.070376836;
          auVar84._16_8_ = local_1480._16_8_;
          auVar84._0_16_ = local_1480._0_16_;
          auVar84._24_8_ = local_1480._24_8_;
          auVar84._32_8_ = local_1480._32_8_;
          auVar84._40_8_ = local_1480._40_8_;
          auVar84._48_8_ = local_1480._48_8_;
          auVar84._56_8_ = local_1480._56_8_;
          auVar83._8_4_ = -0.1151461;
          auVar83._12_4_ = -0.1151461;
          auVar83._0_4_ = -0.1151461;
          auVar83._4_4_ = -0.1151461;
          auVar83._16_4_ = -0.1151461;
          auVar83._20_4_ = -0.1151461;
          auVar83._24_4_ = -0.1151461;
          auVar83._28_4_ = -0.1151461;
          auVar83._32_4_ = -0.1151461;
          auVar83._36_4_ = -0.1151461;
          auVar83._40_4_ = -0.1151461;
          auVar83._44_4_ = -0.1151461;
          auVar83._48_4_ = -0.1151461;
          auVar83._52_4_ = -0.1151461;
          auVar83._56_4_ = -0.1151461;
          auVar83._60_4_ = -0.1151461;
          auVar139 = vfmadd213ps_avx512f(auVar84,auVar85,auVar83);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_dc0 = local_1680;
          uStack_db8 = uStack_1678;
          uStack_db0 = uStack_1670;
          uStack_da8 = uStack_1668;
          uStack_da0 = uStack_1660;
          uStack_d98 = uStack_1658;
          uStack_d90 = uStack_1650;
          uStack_d88 = uStack_1648;
          local_e00 = local_1480._0_8_;
          uStack_df8 = local_1480._8_8_;
          uStack_df0 = local_1480._16_8_;
          uStack_de8 = local_1480._24_8_;
          uStack_de0 = local_1480._32_8_;
          uStack_dd8 = local_1480._40_8_;
          uStack_dd0 = local_1480._48_8_;
          uStack_dc8 = local_1480._56_8_;
          local_e40[0] = 0.116769984;
          local_e40[1] = 0.116769984;
          local_e40[2] = 0.116769984;
          local_e40[3] = 0.116769984;
          local_e40[4] = 0.116769984;
          local_e40[5] = 0.116769984;
          local_e40[6] = 0.116769984;
          local_e40[7] = 0.116769984;
          local_e40[8] = 0.116769984;
          local_e40[9] = 0.116769984;
          local_e40[10] = 0.116769984;
          local_e40[0xb] = 0.116769984;
          local_e40[0xc] = 0.116769984;
          local_e40[0xd] = 0.116769984;
          local_e40[0xe] = 0.116769984;
          local_e40[0xf] = 0.116769984;
          auVar82._16_8_ = local_1480._16_8_;
          auVar82._0_16_ = local_1480._0_16_;
          auVar82._24_8_ = local_1480._24_8_;
          auVar82._32_8_ = local_1480._32_8_;
          auVar82._40_8_ = local_1480._40_8_;
          auVar82._48_8_ = local_1480._48_8_;
          auVar82._56_8_ = local_1480._56_8_;
          auVar81._8_4_ = 0.116769984;
          auVar81._12_4_ = 0.116769984;
          auVar81._0_4_ = 0.116769984;
          auVar81._4_4_ = 0.116769984;
          auVar81._16_4_ = 0.116769984;
          auVar81._20_4_ = 0.116769984;
          auVar81._24_4_ = 0.116769984;
          auVar81._28_4_ = 0.116769984;
          auVar81._32_4_ = 0.116769984;
          auVar81._36_4_ = 0.116769984;
          auVar81._40_4_ = 0.116769984;
          auVar81._44_4_ = 0.116769984;
          auVar81._48_4_ = 0.116769984;
          auVar81._52_4_ = 0.116769984;
          auVar81._56_4_ = 0.116769984;
          auVar81._60_4_ = 0.116769984;
          auVar139 = vfmadd213ps_avx512f(auVar82,auVar139,auVar81);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_e80 = local_1680;
          uStack_e78 = uStack_1678;
          uStack_e70 = uStack_1670;
          uStack_e68 = uStack_1668;
          uStack_e60 = uStack_1660;
          uStack_e58 = uStack_1658;
          uStack_e50 = uStack_1650;
          uStack_e48 = uStack_1648;
          local_ec0 = local_1480._0_8_;
          uStack_eb8 = local_1480._8_8_;
          uStack_eb0 = local_1480._16_8_;
          uStack_ea8 = local_1480._24_8_;
          uStack_ea0 = local_1480._32_8_;
          uStack_e98 = local_1480._40_8_;
          uStack_e90 = local_1480._48_8_;
          uStack_e88 = local_1480._56_8_;
          local_f00[0] = -0.12420141;
          local_f00[1] = -0.12420141;
          local_f00[2] = -0.12420141;
          local_f00[3] = -0.12420141;
          local_f00[4] = -0.12420141;
          local_f00[5] = -0.12420141;
          local_f00[6] = -0.12420141;
          local_f00[7] = -0.12420141;
          local_f00[8] = -0.12420141;
          local_f00[9] = -0.12420141;
          local_f00[10] = -0.12420141;
          local_f00[0xb] = -0.12420141;
          local_f00[0xc] = -0.12420141;
          local_f00[0xd] = -0.12420141;
          local_f00[0xe] = -0.12420141;
          local_f00[0xf] = -0.12420141;
          auVar80._16_8_ = local_1480._16_8_;
          auVar80._0_16_ = local_1480._0_16_;
          auVar80._24_8_ = local_1480._24_8_;
          auVar80._32_8_ = local_1480._32_8_;
          auVar80._40_8_ = local_1480._40_8_;
          auVar80._48_8_ = local_1480._48_8_;
          auVar80._56_8_ = local_1480._56_8_;
          auVar79._8_4_ = -0.12420141;
          auVar79._12_4_ = -0.12420141;
          auVar79._0_4_ = -0.12420141;
          auVar79._4_4_ = -0.12420141;
          auVar79._16_4_ = -0.12420141;
          auVar79._20_4_ = -0.12420141;
          auVar79._24_4_ = -0.12420141;
          auVar79._28_4_ = -0.12420141;
          auVar79._32_4_ = -0.12420141;
          auVar79._36_4_ = -0.12420141;
          auVar79._40_4_ = -0.12420141;
          auVar79._44_4_ = -0.12420141;
          auVar79._48_4_ = -0.12420141;
          auVar79._52_4_ = -0.12420141;
          auVar79._56_4_ = -0.12420141;
          auVar79._60_4_ = -0.12420141;
          auVar139 = vfmadd213ps_avx512f(auVar80,auVar139,auVar79);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_f40 = local_1680;
          uStack_f38 = uStack_1678;
          uStack_f30 = uStack_1670;
          uStack_f28 = uStack_1668;
          uStack_f20 = uStack_1660;
          uStack_f18 = uStack_1658;
          uStack_f10 = uStack_1650;
          uStack_f08 = uStack_1648;
          local_f80 = local_1480._0_8_;
          uStack_f78 = local_1480._8_8_;
          uStack_f70 = local_1480._16_8_;
          uStack_f68 = local_1480._24_8_;
          uStack_f60 = local_1480._32_8_;
          uStack_f58 = local_1480._40_8_;
          uStack_f50 = local_1480._48_8_;
          uStack_f48 = local_1480._56_8_;
          local_fc0[0] = 0.14249323;
          local_fc0[1] = 0.14249323;
          local_fc0[2] = 0.14249323;
          local_fc0[3] = 0.14249323;
          local_fc0[4] = 0.14249323;
          local_fc0[5] = 0.14249323;
          local_fc0[6] = 0.14249323;
          local_fc0[7] = 0.14249323;
          local_fc0[8] = 0.14249323;
          local_fc0[9] = 0.14249323;
          local_fc0[10] = 0.14249323;
          local_fc0[0xb] = 0.14249323;
          local_fc0[0xc] = 0.14249323;
          local_fc0[0xd] = 0.14249323;
          local_fc0[0xe] = 0.14249323;
          local_fc0[0xf] = 0.14249323;
          auVar78._16_8_ = local_1480._16_8_;
          auVar78._0_16_ = local_1480._0_16_;
          auVar78._24_8_ = local_1480._24_8_;
          auVar78._32_8_ = local_1480._32_8_;
          auVar78._40_8_ = local_1480._40_8_;
          auVar78._48_8_ = local_1480._48_8_;
          auVar78._56_8_ = local_1480._56_8_;
          auVar77._8_4_ = 0.14249323;
          auVar77._12_4_ = 0.14249323;
          auVar77._0_4_ = 0.14249323;
          auVar77._4_4_ = 0.14249323;
          auVar77._16_4_ = 0.14249323;
          auVar77._20_4_ = 0.14249323;
          auVar77._24_4_ = 0.14249323;
          auVar77._28_4_ = 0.14249323;
          auVar77._32_4_ = 0.14249323;
          auVar77._36_4_ = 0.14249323;
          auVar77._40_4_ = 0.14249323;
          auVar77._44_4_ = 0.14249323;
          auVar77._48_4_ = 0.14249323;
          auVar77._52_4_ = 0.14249323;
          auVar77._56_4_ = 0.14249323;
          auVar77._60_4_ = 0.14249323;
          auVar139 = vfmadd213ps_avx512f(auVar78,auVar139,auVar77);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_1000 = local_1680;
          uStack_ff8 = uStack_1678;
          uStack_ff0 = uStack_1670;
          uStack_fe8 = uStack_1668;
          uStack_fe0 = uStack_1660;
          uStack_fd8 = uStack_1658;
          uStack_fd0 = uStack_1650;
          uStack_fc8 = uStack_1648;
          local_1040 = local_1480._0_8_;
          uStack_1038 = local_1480._8_8_;
          uStack_1030 = local_1480._16_8_;
          uStack_1028 = local_1480._24_8_;
          uStack_1020 = local_1480._32_8_;
          uStack_1018 = local_1480._40_8_;
          uStack_1010 = local_1480._48_8_;
          uStack_1008 = local_1480._56_8_;
          local_1080[0] = -0.16668057;
          local_1080[1] = -0.16668057;
          local_1080[2] = -0.16668057;
          local_1080[3] = -0.16668057;
          local_1080[4] = -0.16668057;
          local_1080[5] = -0.16668057;
          local_1080[6] = -0.16668057;
          local_1080[7] = -0.16668057;
          local_1080[8] = -0.16668057;
          local_1080[9] = -0.16668057;
          local_1080[10] = -0.16668057;
          local_1080[0xb] = -0.16668057;
          local_1080[0xc] = -0.16668057;
          local_1080[0xd] = -0.16668057;
          local_1080[0xe] = -0.16668057;
          local_1080[0xf] = -0.16668057;
          auVar76._16_8_ = local_1480._16_8_;
          auVar76._0_16_ = local_1480._0_16_;
          auVar76._24_8_ = local_1480._24_8_;
          auVar76._32_8_ = local_1480._32_8_;
          auVar76._40_8_ = local_1480._40_8_;
          auVar76._48_8_ = local_1480._48_8_;
          auVar76._56_8_ = local_1480._56_8_;
          auVar75._8_4_ = -0.16668057;
          auVar75._12_4_ = -0.16668057;
          auVar75._0_4_ = -0.16668057;
          auVar75._4_4_ = -0.16668057;
          auVar75._16_4_ = -0.16668057;
          auVar75._20_4_ = -0.16668057;
          auVar75._24_4_ = -0.16668057;
          auVar75._28_4_ = -0.16668057;
          auVar75._32_4_ = -0.16668057;
          auVar75._36_4_ = -0.16668057;
          auVar75._40_4_ = -0.16668057;
          auVar75._44_4_ = -0.16668057;
          auVar75._48_4_ = -0.16668057;
          auVar75._52_4_ = -0.16668057;
          auVar75._56_4_ = -0.16668057;
          auVar75._60_4_ = -0.16668057;
          auVar139 = vfmadd213ps_avx512f(auVar76,auVar139,auVar75);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_10c0 = local_1680;
          uStack_10b8 = uStack_1678;
          uStack_10b0 = uStack_1670;
          uStack_10a8 = uStack_1668;
          uStack_10a0 = uStack_1660;
          uStack_1098 = uStack_1658;
          uStack_1090 = uStack_1650;
          uStack_1088 = uStack_1648;
          local_1100 = local_1480._0_8_;
          uStack_10f8 = local_1480._8_8_;
          uStack_10f0 = local_1480._16_8_;
          uStack_10e8 = local_1480._24_8_;
          uStack_10e0 = local_1480._32_8_;
          uStack_10d8 = local_1480._40_8_;
          uStack_10d0 = local_1480._48_8_;
          uStack_10c8 = local_1480._56_8_;
          local_1140[0] = 0.20000714;
          local_1140[1] = 0.20000714;
          local_1140[2] = 0.20000714;
          local_1140[3] = 0.20000714;
          local_1140[4] = 0.20000714;
          local_1140[5] = 0.20000714;
          local_1140[6] = 0.20000714;
          local_1140[7] = 0.20000714;
          local_1140[8] = 0.20000714;
          local_1140[9] = 0.20000714;
          local_1140[10] = 0.20000714;
          local_1140[0xb] = 0.20000714;
          local_1140[0xc] = 0.20000714;
          local_1140[0xd] = 0.20000714;
          local_1140[0xe] = 0.20000714;
          local_1140[0xf] = 0.20000714;
          auVar74._16_8_ = local_1480._16_8_;
          auVar74._0_16_ = local_1480._0_16_;
          auVar74._24_8_ = local_1480._24_8_;
          auVar74._32_8_ = local_1480._32_8_;
          auVar74._40_8_ = local_1480._40_8_;
          auVar74._48_8_ = local_1480._48_8_;
          auVar74._56_8_ = local_1480._56_8_;
          auVar73._8_4_ = 0.20000714;
          auVar73._12_4_ = 0.20000714;
          auVar73._0_4_ = 0.20000714;
          auVar73._4_4_ = 0.20000714;
          auVar73._16_4_ = 0.20000714;
          auVar73._20_4_ = 0.20000714;
          auVar73._24_4_ = 0.20000714;
          auVar73._28_4_ = 0.20000714;
          auVar73._32_4_ = 0.20000714;
          auVar73._36_4_ = 0.20000714;
          auVar73._40_4_ = 0.20000714;
          auVar73._44_4_ = 0.20000714;
          auVar73._48_4_ = 0.20000714;
          auVar73._52_4_ = 0.20000714;
          auVar73._56_4_ = 0.20000714;
          auVar73._60_4_ = 0.20000714;
          auVar139 = vfmadd213ps_avx512f(auVar74,auVar139,auVar73);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_1180 = local_1680;
          uStack_1178 = uStack_1678;
          uStack_1170 = uStack_1670;
          uStack_1168 = uStack_1668;
          uStack_1160 = uStack_1660;
          uStack_1158 = uStack_1658;
          uStack_1150 = uStack_1650;
          uStack_1148 = uStack_1648;
          local_11c0 = local_1480._0_8_;
          uStack_11b8 = local_1480._8_8_;
          uStack_11b0 = local_1480._16_8_;
          uStack_11a8 = local_1480._24_8_;
          uStack_11a0 = local_1480._32_8_;
          uStack_1198 = local_1480._40_8_;
          uStack_1190 = local_1480._48_8_;
          uStack_1188 = local_1480._56_8_;
          local_1200[0] = -0.24999994;
          local_1200[1] = -0.24999994;
          local_1200[2] = -0.24999994;
          local_1200[3] = -0.24999994;
          local_1200[4] = -0.24999994;
          local_1200[5] = -0.24999994;
          local_1200[6] = -0.24999994;
          local_1200[7] = -0.24999994;
          local_1200[8] = -0.24999994;
          local_1200[9] = -0.24999994;
          local_1200[10] = -0.24999994;
          local_1200[0xb] = -0.24999994;
          local_1200[0xc] = -0.24999994;
          local_1200[0xd] = -0.24999994;
          local_1200[0xe] = -0.24999994;
          local_1200[0xf] = -0.24999994;
          auVar72._16_8_ = local_1480._16_8_;
          auVar72._0_16_ = local_1480._0_16_;
          auVar72._24_8_ = local_1480._24_8_;
          auVar72._32_8_ = local_1480._32_8_;
          auVar72._40_8_ = local_1480._40_8_;
          auVar72._48_8_ = local_1480._48_8_;
          auVar72._56_8_ = local_1480._56_8_;
          auVar71._8_4_ = -0.24999994;
          auVar71._12_4_ = -0.24999994;
          auVar71._0_4_ = -0.24999994;
          auVar71._4_4_ = -0.24999994;
          auVar71._16_4_ = -0.24999994;
          auVar71._20_4_ = -0.24999994;
          auVar71._24_4_ = -0.24999994;
          auVar71._28_4_ = -0.24999994;
          auVar71._32_4_ = -0.24999994;
          auVar71._36_4_ = -0.24999994;
          auVar71._40_4_ = -0.24999994;
          auVar71._44_4_ = -0.24999994;
          auVar71._48_4_ = -0.24999994;
          auVar71._52_4_ = -0.24999994;
          auVar71._56_4_ = -0.24999994;
          auVar71._60_4_ = -0.24999994;
          auVar139 = vfmadd213ps_avx512f(auVar72,auVar139,auVar71);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_1240 = local_1680;
          uStack_1238 = uStack_1678;
          uStack_1230 = uStack_1670;
          uStack_1228 = uStack_1668;
          uStack_1220 = uStack_1660;
          uStack_1218 = uStack_1658;
          uStack_1210 = uStack_1650;
          uStack_1208 = uStack_1648;
          local_1280 = local_1480._0_8_;
          uStack_1278 = local_1480._8_8_;
          uStack_1270 = local_1480._16_8_;
          uStack_1268 = local_1480._24_8_;
          uStack_1260 = local_1480._32_8_;
          uStack_1258 = local_1480._40_8_;
          uStack_1250 = local_1480._48_8_;
          uStack_1248 = local_1480._56_8_;
          local_12c0[0] = 0.3333333;
          local_12c0[1] = 0.3333333;
          local_12c0[2] = 0.3333333;
          local_12c0[3] = 0.3333333;
          local_12c0[4] = 0.3333333;
          local_12c0[5] = 0.3333333;
          local_12c0[6] = 0.3333333;
          local_12c0[7] = 0.3333333;
          local_12c0[8] = 0.3333333;
          local_12c0[9] = 0.3333333;
          local_12c0[10] = 0.3333333;
          local_12c0[0xb] = 0.3333333;
          local_12c0[0xc] = 0.3333333;
          local_12c0[0xd] = 0.3333333;
          local_12c0[0xe] = 0.3333333;
          local_12c0[0xf] = 0.3333333;
          auVar70._16_8_ = local_1480._16_8_;
          auVar70._0_16_ = local_1480._0_16_;
          auVar70._24_8_ = local_1480._24_8_;
          auVar70._32_8_ = local_1480._32_8_;
          auVar70._40_8_ = local_1480._40_8_;
          auVar70._48_8_ = local_1480._48_8_;
          auVar70._56_8_ = local_1480._56_8_;
          auVar69._8_4_ = 0.3333333;
          auVar69._12_4_ = 0.3333333;
          auVar69._0_4_ = 0.3333333;
          auVar69._4_4_ = 0.3333333;
          auVar69._16_4_ = 0.3333333;
          auVar69._20_4_ = 0.3333333;
          auVar69._24_4_ = 0.3333333;
          auVar69._28_4_ = 0.3333333;
          auVar69._32_4_ = 0.3333333;
          auVar69._36_4_ = 0.3333333;
          auVar69._40_4_ = 0.3333333;
          auVar69._44_4_ = 0.3333333;
          auVar69._48_4_ = 0.3333333;
          auVar69._52_4_ = 0.3333333;
          auVar69._56_4_ = 0.3333333;
          auVar69._60_4_ = 0.3333333;
          auVar139 = vfmadd213ps_avx512f(auVar70,auVar139,auVar69);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_a80 = local_1680;
          uStack_a78 = uStack_1678;
          uStack_a70 = uStack_1670;
          uStack_a68 = uStack_1668;
          uStack_a60 = uStack_1660;
          uStack_a58 = uStack_1658;
          uStack_a50 = uStack_1650;
          uStack_a48 = uStack_1648;
          local_ac0 = local_1480._0_8_;
          uStack_ab8 = local_1480._8_8_;
          uStack_ab0 = local_1480._16_8_;
          uStack_aa8 = local_1480._24_8_;
          uStack_aa0 = local_1480._32_8_;
          uStack_a98 = local_1480._40_8_;
          uStack_a90 = local_1480._48_8_;
          uStack_a88 = local_1480._56_8_;
          auVar89._16_8_ = local_1480._16_8_;
          auVar89._0_16_ = local_1480._0_16_;
          auVar89._24_8_ = local_1480._24_8_;
          auVar89._32_8_ = local_1480._32_8_;
          auVar89._40_8_ = local_1480._40_8_;
          auVar89._48_8_ = local_1480._48_8_;
          auVar89._56_8_ = local_1480._56_8_;
          auVar139 = vmulps_avx512f(auVar139,auVar89);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_b00 = local_1680;
          uStack_af8 = uStack_1678;
          uStack_af0 = uStack_1670;
          uStack_ae8 = uStack_1668;
          uStack_ae0 = uStack_1660;
          uStack_ad8 = uStack_1658;
          uStack_ad0 = uStack_1650;
          uStack_ac8 = uStack_1648;
          local_b40 = local_1640._0_8_;
          uStack_b38 = local_1640._8_8_;
          uStack_b30 = local_1640._16_8_;
          uStack_b28 = local_1640._24_8_;
          uStack_b20 = local_1640._32_8_;
          uStack_b18 = local_1640._40_8_;
          uStack_b10 = local_1640._48_8_;
          uStack_b08 = local_1640._56_8_;
          auVar139 = vmulps_avx512f(auVar139,local_1640);
          uStack_1570 = auVar105._16_8_;
          uStack_1568 = auVar106._24_8_;
          uStack_1560 = auVar107._32_8_;
          uStack_1558 = auVar108._40_8_;
          uStack_1550 = auVar109._48_8_;
          uStack_1548 = auVar141._56_8_;
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_1300 = local_1580._0_8_;
          uStack_12f8 = local_1580._8_8_;
          uStack_12f0 = uStack_1570;
          uStack_12e8 = uStack_1568;
          uStack_12e0 = uStack_1560;
          uStack_12d8 = uStack_1558;
          uStack_12d0 = uStack_1550;
          uStack_12c8 = uStack_1548;
          local_1340[0] = -0.00021219444;
          local_1340[1] = -0.00021219444;
          local_1340[2] = -0.00021219444;
          local_1340[3] = -0.00021219444;
          local_1340[4] = -0.00021219444;
          local_1340[5] = -0.00021219444;
          local_1340[6] = -0.00021219444;
          local_1340[7] = -0.00021219444;
          local_1340[8] = -0.00021219444;
          local_1340[9] = -0.00021219444;
          local_1340[10] = -0.00021219444;
          local_1340[0xb] = -0.00021219444;
          local_1340[0xc] = -0.00021219444;
          local_1340[0xd] = -0.00021219444;
          local_1340[0xe] = -0.00021219444;
          local_1340[0xf] = -0.00021219444;
          local_1380 = local_1680;
          uStack_1378 = uStack_1678;
          uStack_1370 = uStack_1670;
          uStack_1368 = uStack_1668;
          uStack_1360 = uStack_1660;
          uStack_1358 = uStack_1658;
          uStack_1350 = uStack_1650;
          uStack_1348 = uStack_1648;
          auVar68._16_8_ = uStack_1570;
          auVar68._0_16_ = local_1580;
          auVar68._24_8_ = uStack_1568;
          auVar68._32_8_ = uStack_1560;
          auVar68._40_8_ = uStack_1558;
          auVar68._48_8_ = uStack_1550;
          auVar68._56_8_ = uStack_1548;
          auVar67._8_4_ = -0.00021219444;
          auVar67._12_4_ = -0.00021219444;
          auVar67._0_4_ = -0.00021219444;
          auVar67._4_4_ = -0.00021219444;
          auVar67._16_4_ = -0.00021219444;
          auVar67._20_4_ = -0.00021219444;
          auVar67._24_4_ = -0.00021219444;
          auVar67._28_4_ = -0.00021219444;
          auVar67._32_4_ = -0.00021219444;
          auVar67._36_4_ = -0.00021219444;
          auVar67._40_4_ = -0.00021219444;
          auVar67._44_4_ = -0.00021219444;
          auVar67._48_4_ = -0.00021219444;
          auVar67._52_4_ = -0.00021219444;
          auVar67._56_4_ = -0.00021219444;
          auVar67._60_4_ = -0.00021219444;
          auVar139 = vfmadd213ps_avx512f(auVar67,auVar68,auVar139);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_700 = local_1640._0_8_;
          uStack_6f8 = local_1640._8_8_;
          uStack_6f0 = local_1640._16_8_;
          uStack_6e8 = local_1640._24_8_;
          uStack_6e0 = local_1640._32_8_;
          uStack_6d8 = local_1640._40_8_;
          uStack_6d0 = local_1640._48_8_;
          uStack_6c8 = local_1640._56_8_;
          local_740[0] = 0.5;
          local_740[1] = 0.5;
          local_740[2] = 0.5;
          local_740[3] = 0.5;
          local_740[4] = 0.5;
          local_740[5] = 0.5;
          local_740[6] = 0.5;
          local_740[7] = 0.5;
          local_740[8] = 0.5;
          local_740[9] = 0.5;
          local_740[10] = 0.5;
          local_740[0xb] = 0.5;
          local_740[0xc] = 0.5;
          local_740[0xd] = 0.5;
          local_740[0xe] = 0.5;
          local_740[0xf] = 0.5;
          local_780 = local_1680;
          uStack_778 = uStack_1678;
          uStack_770 = uStack_1670;
          uStack_768 = uStack_1668;
          uStack_760 = uStack_1660;
          uStack_758 = uStack_1658;
          uStack_750 = uStack_1650;
          uStack_748 = uStack_1648;
          auVar94._8_4_ = 0.5;
          auVar94._12_4_ = 0.5;
          auVar94._0_4_ = 0.5;
          auVar94._4_4_ = 0.5;
          auVar94._16_4_ = 0.5;
          auVar94._20_4_ = 0.5;
          auVar94._24_4_ = 0.5;
          auVar94._28_4_ = 0.5;
          auVar94._32_4_ = 0.5;
          auVar94._36_4_ = 0.5;
          auVar94._40_4_ = 0.5;
          auVar94._44_4_ = 0.5;
          auVar94._48_4_ = 0.5;
          auVar94._52_4_ = 0.5;
          auVar94._56_4_ = 0.5;
          auVar94._60_4_ = 0.5;
          auVar139 = vfnmadd213ps_avx512f(auVar94,local_1640,auVar139);
          local_1680 = auVar139._0_8_;
          uStack_1678 = auVar139._8_8_;
          uStack_1670 = auVar139._16_8_;
          uStack_1668 = auVar139._24_8_;
          uStack_1660 = auVar139._32_8_;
          uStack_1658 = auVar139._40_8_;
          uStack_1650 = auVar139._48_8_;
          uStack_1648 = auVar139._56_8_;
          local_c00 = local_1480._0_8_;
          uStack_bf8 = local_1480._8_8_;
          uStack_bf0 = local_1480._16_8_;
          uStack_be8 = local_1480._24_8_;
          uStack_be0 = local_1480._32_8_;
          uStack_bd8 = local_1480._40_8_;
          uStack_bd0 = local_1480._48_8_;
          uStack_bc8 = local_1480._56_8_;
          local_c40 = local_1680;
          uStack_c38 = uStack_1678;
          uStack_c30 = uStack_1670;
          uStack_c28 = uStack_1668;
          uStack_c20 = uStack_1660;
          uStack_c18 = uStack_1658;
          uStack_c10 = uStack_1650;
          uStack_c08 = uStack_1648;
          auVar87._16_8_ = local_1480._16_8_;
          auVar87._0_16_ = local_1480._0_16_;
          auVar87._24_8_ = local_1480._24_8_;
          auVar87._32_8_ = local_1480._32_8_;
          auVar87._40_8_ = local_1480._40_8_;
          auVar87._48_8_ = local_1480._48_8_;
          auVar87._56_8_ = local_1480._56_8_;
          auVar139 = vaddps_avx512f(auVar87,auVar139);
          local_1480._0_8_ = auVar139._0_8_;
          local_1480._8_8_ = auVar139._8_8_;
          local_1480._16_8_ = auVar139._16_8_;
          local_1480._24_8_ = auVar139._24_8_;
          local_1480._32_8_ = auVar139._32_8_;
          local_1480._40_8_ = auVar139._40_8_;
          local_1480._48_8_ = auVar139._48_8_;
          local_1480._56_8_ = auVar139._56_8_;
          local_13c0 = local_1580._0_8_;
          uStack_13b8 = local_1580._8_8_;
          uStack_13b0 = uStack_1570;
          uStack_13a8 = uStack_1568;
          uStack_13a0 = uStack_1560;
          uStack_1398 = uStack_1558;
          uStack_1390 = uStack_1550;
          uStack_1388 = uStack_1548;
          local_1400[0] = 0.6933594;
          local_1400[1] = 0.6933594;
          local_1400[2] = 0.6933594;
          local_1400[3] = 0.6933594;
          local_1400[4] = 0.6933594;
          local_1400[5] = 0.6933594;
          local_1400[6] = 0.6933594;
          local_1400[7] = 0.6933594;
          local_1400[8] = 0.6933594;
          local_1400[9] = 0.6933594;
          local_1400[10] = 0.6933594;
          local_1400[0xb] = 0.6933594;
          local_1400[0xc] = 0.6933594;
          local_1400[0xd] = 0.6933594;
          local_1400[0xe] = 0.6933594;
          local_1400[0xf] = 0.6933594;
          local_1440 = local_1480._0_8_;
          uStack_1438 = local_1480._8_8_;
          uStack_1430 = local_1480._16_8_;
          uStack_1428 = local_1480._24_8_;
          uStack_1420 = local_1480._32_8_;
          uStack_1418 = local_1480._40_8_;
          uStack_1410 = local_1480._48_8_;
          uStack_1408 = local_1480._56_8_;
          auVar66._16_8_ = uStack_1570;
          auVar66._0_16_ = local_1580;
          auVar66._24_8_ = uStack_1568;
          auVar66._32_8_ = uStack_1560;
          auVar66._40_8_ = uStack_1558;
          auVar66._48_8_ = uStack_1550;
          auVar66._56_8_ = uStack_1548;
          auVar65._8_4_ = 0.6933594;
          auVar65._12_4_ = 0.6933594;
          auVar65._0_4_ = 0.6933594;
          auVar65._4_4_ = 0.6933594;
          auVar65._16_4_ = 0.6933594;
          auVar65._20_4_ = 0.6933594;
          auVar65._24_4_ = 0.6933594;
          auVar65._28_4_ = 0.6933594;
          auVar65._32_4_ = 0.6933594;
          auVar65._36_4_ = 0.6933594;
          auVar65._40_4_ = 0.6933594;
          auVar65._44_4_ = 0.6933594;
          auVar65._48_4_ = 0.6933594;
          auVar65._52_4_ = 0.6933594;
          auVar65._56_4_ = 0.6933594;
          auVar65._60_4_ = 0.6933594;
          local_1480 = vfmadd213ps_avx512f(auVar65,auVar66,auVar139);
          auVar139 = vpmovm2d_avx512dq(uVar18 & 0xffff);
          local_6c0 = vmovdqa64_avx512f(auVar139);
          local_480 = vmovdqa64_avx512f(local_6c0);
          local_440 = local_1480._0_8_;
          uStack_438 = local_1480._8_8_;
          uStack_430 = local_1480._16_8_;
          uStack_428 = local_1480._24_8_;
          uStack_420 = local_1480._32_8_;
          uStack_418 = local_1480._40_8_;
          uStack_410 = local_1480._48_8_;
          uStack_408 = local_1480._56_8_;
          _local_1680 = vpord_avx512f(local_1480,local_480);
          local_29c0 = local_1680;
          uStack_29b8 = uStack_1678;
          uStack_29b0 = uStack_1670;
          uStack_29a8 = uStack_1668;
          uStack_29a0 = uStack_1660;
          uStack_2998 = uStack_1658;
          uStack_2990 = uStack_1650;
          uStack_2988 = uStack_1648;
          local_2884 = 0x3f800000;
          local_2900 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          local_2a00 = local_2900._0_8_;
          uStack_29f8 = local_2900._8_8_;
          uStack_29f0 = local_2900._16_8_;
          uStack_29e8 = local_2900._24_8_;
          uStack_29e0 = local_2900._32_8_;
          uStack_29d8 = local_2900._40_8_;
          uStack_29d0 = local_2900._48_8_;
          uStack_29c8 = local_2900._56_8_;
          local_2904 = 0x40000000;
          local_2980 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          local_2a40 = local_2980._0_8_;
          uStack_2a38 = local_2980._8_8_;
          uStack_2a30 = local_2980._16_8_;
          uStack_2a28 = local_2980._24_8_;
          uStack_2a20 = local_2980._32_8_;
          uStack_2a18 = local_2980._40_8_;
          uStack_2a10 = local_2980._48_8_;
          uStack_2a08 = local_2980._56_8_;
          local_2840 = local_1680;
          uStack_2838 = uStack_1678;
          uStack_2830 = uStack_1670;
          uStack_2828 = uStack_1668;
          uStack_2820 = uStack_1660;
          uStack_2818 = uStack_1658;
          uStack_2810 = uStack_1650;
          uStack_2808 = uStack_1648;
          local_2880 = local_2980._0_8_;
          uStack_2878 = local_2980._8_8_;
          uStack_2870 = local_2980._16_8_;
          uStack_2868 = local_2980._24_8_;
          uStack_2860 = local_2980._32_8_;
          uStack_2858 = local_2980._40_8_;
          uStack_2850 = local_2980._48_8_;
          uStack_2848 = local_2980._56_8_;
          local_27c0 = vmulps_avx512f(_local_1680,local_2980);
          local_2704 = 0x3f800000;
          local_2780 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          local_2800 = local_2780._0_8_;
          uStack_27f8 = local_2780._8_8_;
          uStack_27f0 = local_2780._16_8_;
          uStack_27e8 = local_2780._24_8_;
          uStack_27e0 = local_2780._32_8_;
          uStack_27d8 = local_2780._40_8_;
          uStack_27d0 = local_2780._48_8_;
          uStack_27c8 = local_2780._56_8_;
          local_2600 = 0;
          uStack_25f8 = 0;
          uStack_25f0 = 0;
          uStack_25e8 = 0;
          uStack_25e0 = 0;
          uStack_25d8 = 0;
          uStack_25d0 = 0;
          uStack_25c8 = 0;
          local_26c0 = 0;
          uStack_26b8 = 0;
          uStack_26b0 = 0;
          uStack_26a8 = 0;
          uStack_26a0 = 0;
          uStack_2698 = 0;
          uStack_2690 = 0;
          uStack_2688 = 0;
          local_2700 = local_27c0._0_8_;
          uStack_26f8 = local_27c0._8_8_;
          uStack_26f0 = local_27c0._16_8_;
          uStack_26e8 = local_27c0._24_8_;
          uStack_26e0 = local_27c0._32_8_;
          uStack_26d8 = local_27c0._40_8_;
          uStack_26d0 = local_27c0._48_8_;
          uStack_26c8 = local_27c0._56_8_;
          auVar139 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_27c0);
          local_1c80 = 0;
          uStack_1c78 = 0;
          uStack_1c70 = 0;
          uStack_1c68 = 0;
          uStack_1c60 = 0;
          uStack_1c58 = 0;
          uStack_1c50 = 0;
          uStack_1c48 = 0;
          local_2480[0] = 1.0;
          local_2480[1] = 1.0;
          local_2480[2] = 1.0;
          local_2480[3] = 1.0;
          local_2480[4] = 1.0;
          local_2480[5] = 1.0;
          local_2480[6] = 1.0;
          local_2480[7] = 1.0;
          local_2480[8] = 1.0;
          local_2480[9] = 1.0;
          local_2480[10] = 1.0;
          local_2480[0xb] = 1.0;
          local_2480[0xc] = 1.0;
          local_2480[0xd] = 1.0;
          local_2480[0xe] = 1.0;
          local_2480[0xf] = 1.0;
          local_2380._0_8_ = auVar139._0_8_;
          local_2380._8_8_ = auVar139._8_8_;
          local_2380._16_8_ = auVar139._16_8_;
          local_2380._24_8_ = auVar139._24_8_;
          local_2380._32_8_ = auVar139._32_8_;
          local_2380._40_8_ = auVar139._40_8_;
          local_2380._48_8_ = auVar139._48_8_;
          local_2380._56_8_ = auVar139._56_8_;
          local_1b80 = local_2380._0_8_;
          uStack_1b78 = local_2380._8_8_;
          uStack_1b70 = local_2380._16_8_;
          uStack_1b68 = local_2380._24_8_;
          uStack_1b60 = local_2380._32_8_;
          uStack_1b58 = local_2380._40_8_;
          uStack_1b50 = local_2380._48_8_;
          uStack_1b48 = local_2380._56_8_;
          local_1bc0[0] = 88.37626;
          local_1bc0[1] = 88.37626;
          local_1bc0[2] = 88.37626;
          local_1bc0[3] = 88.37626;
          local_1bc0[4] = 88.37626;
          local_1bc0[5] = 88.37626;
          local_1bc0[6] = 88.37626;
          local_1bc0[7] = 88.37626;
          local_1bc0[8] = 88.37626;
          local_1bc0[9] = 88.37626;
          local_1bc0[10] = 88.37626;
          local_1bc0[0xb] = 88.37626;
          local_1bc0[0xc] = 88.37626;
          local_1bc0[0xd] = 88.37626;
          local_1bc0[0xe] = 88.37626;
          local_1bc0[0xf] = 88.37626;
          auVar58._8_4_ = 88.37626;
          auVar58._12_4_ = 88.37626;
          auVar58._0_4_ = 88.37626;
          auVar58._4_4_ = 88.37626;
          auVar58._16_4_ = 88.37626;
          auVar58._20_4_ = 88.37626;
          auVar58._24_4_ = 88.37626;
          auVar58._28_4_ = 88.37626;
          auVar58._32_4_ = 88.37626;
          auVar58._36_4_ = 88.37626;
          auVar58._40_4_ = 88.37626;
          auVar58._44_4_ = 88.37626;
          auVar58._48_4_ = 88.37626;
          auVar58._52_4_ = 88.37626;
          auVar58._56_4_ = 88.37626;
          auVar58._60_4_ = 88.37626;
          auVar139 = vminps_avx512f(auVar139,auVar58);
          local_2380._0_8_ = auVar139._0_8_;
          local_2380._8_8_ = auVar139._8_8_;
          local_2380._16_8_ = auVar139._16_8_;
          local_2380._24_8_ = auVar139._24_8_;
          local_2380._32_8_ = auVar139._32_8_;
          local_2380._40_8_ = auVar139._40_8_;
          local_2380._48_8_ = auVar139._48_8_;
          local_2380._56_8_ = auVar139._56_8_;
          local_1c00 = local_2380._0_8_;
          uStack_1bf8 = local_2380._8_8_;
          uStack_1bf0 = local_2380._16_8_;
          uStack_1be8 = local_2380._24_8_;
          uStack_1be0 = local_2380._32_8_;
          uStack_1bd8 = local_2380._40_8_;
          uStack_1bd0 = local_2380._48_8_;
          uStack_1bc8 = local_2380._56_8_;
          local_1c40[0] = -88.37626;
          local_1c40[1] = -88.37626;
          local_1c40[2] = -88.37626;
          local_1c40[3] = -88.37626;
          local_1c40[4] = -88.37626;
          local_1c40[5] = -88.37626;
          local_1c40[6] = -88.37626;
          local_1c40[7] = -88.37626;
          local_1c40[8] = -88.37626;
          local_1c40[9] = -88.37626;
          local_1c40[10] = -88.37626;
          local_1c40[0xb] = -88.37626;
          local_1c40[0xc] = -88.37626;
          local_1c40[0xd] = -88.37626;
          local_1c40[0xe] = -88.37626;
          local_1c40[0xf] = -88.37626;
          auVar57._8_4_ = -88.37626;
          auVar57._12_4_ = -88.37626;
          auVar57._0_4_ = -88.37626;
          auVar57._4_4_ = -88.37626;
          auVar57._16_4_ = -88.37626;
          auVar57._20_4_ = -88.37626;
          auVar57._24_4_ = -88.37626;
          auVar57._28_4_ = -88.37626;
          auVar57._32_4_ = -88.37626;
          auVar57._36_4_ = -88.37626;
          auVar57._40_4_ = -88.37626;
          auVar57._44_4_ = -88.37626;
          auVar57._48_4_ = -88.37626;
          auVar57._52_4_ = -88.37626;
          auVar57._56_4_ = -88.37626;
          auVar57._60_4_ = -88.37626;
          auVar139 = vmaxps_avx512f(auVar139,auVar57);
          local_2380._0_8_ = auVar139._0_8_;
          local_2380._8_8_ = auVar139._8_8_;
          local_2380._16_8_ = auVar139._16_8_;
          local_2380._24_8_ = auVar139._24_8_;
          local_2380._32_8_ = auVar139._32_8_;
          local_2380._40_8_ = auVar139._40_8_;
          local_2380._48_8_ = auVar139._48_8_;
          local_2380._56_8_ = auVar139._56_8_;
          local_1e40 = local_2380._0_8_;
          uStack_1e38 = local_2380._8_8_;
          uStack_1e30 = local_2380._16_8_;
          uStack_1e28 = local_2380._24_8_;
          uStack_1e20 = local_2380._32_8_;
          uStack_1e18 = local_2380._40_8_;
          uStack_1e10 = local_2380._48_8_;
          uStack_1e08 = local_2380._56_8_;
          local_1f00[0x20] = 1.442695;
          local_1f00[0x21] = 1.442695;
          local_1f00[0x22] = 1.442695;
          local_1f00[0x23] = 1.442695;
          local_1f00[0x24] = 1.442695;
          local_1f00[0x25] = 1.442695;
          local_1f00[0x26] = 1.442695;
          local_1f00[0x27] = 1.442695;
          local_1f00[0x28] = 1.442695;
          local_1f00[0x29] = 1.442695;
          local_1f00[0x2a] = 1.442695;
          local_1f00[0x2b] = 1.442695;
          local_1f00[0x2c] = 1.442695;
          local_1f00[0x2d] = 1.442695;
          local_1f00[0x2e] = 1.442695;
          local_1f00[0x2f] = 1.442695;
          local_1f00[0x10] = 0.5;
          local_1f00[0x11] = 0.5;
          local_1f00[0x12] = 0.5;
          local_1f00[0x13] = 0.5;
          local_1f00[0x14] = 0.5;
          local_1f00[0x15] = 0.5;
          local_1f00[0x16] = 0.5;
          local_1f00[0x17] = 0.5;
          local_1f00[0x18] = 0.5;
          local_1f00[0x19] = 0.5;
          local_1f00[0x1a] = 0.5;
          local_1f00[0x1b] = 0.5;
          local_1f00[0x1c] = 0.5;
          local_1f00[0x1d] = 0.5;
          local_1f00[0x1e] = 0.5;
          local_1f00[0x1f] = 0.5;
          auVar55._8_4_ = 1.442695;
          auVar55._12_4_ = 1.442695;
          auVar55._0_4_ = 1.442695;
          auVar55._4_4_ = 1.442695;
          auVar55._16_4_ = 1.442695;
          auVar55._20_4_ = 1.442695;
          auVar55._24_4_ = 1.442695;
          auVar55._28_4_ = 1.442695;
          auVar55._32_4_ = 1.442695;
          auVar55._36_4_ = 1.442695;
          auVar55._40_4_ = 1.442695;
          auVar55._44_4_ = 1.442695;
          auVar55._48_4_ = 1.442695;
          auVar55._52_4_ = 1.442695;
          auVar55._56_4_ = 1.442695;
          auVar55._60_4_ = 1.442695;
          auVar54._8_4_ = 0.5;
          auVar54._12_4_ = 0.5;
          auVar54._0_4_ = 0.5;
          auVar54._4_4_ = 0.5;
          auVar54._16_4_ = 0.5;
          auVar54._20_4_ = 0.5;
          auVar54._24_4_ = 0.5;
          auVar54._28_4_ = 0.5;
          auVar54._32_4_ = 0.5;
          auVar54._36_4_ = 0.5;
          auVar54._40_4_ = 0.5;
          auVar54._44_4_ = 0.5;
          auVar54._48_4_ = 0.5;
          auVar54._52_4_ = 0.5;
          auVar54._56_4_ = 0.5;
          auVar54._60_4_ = 0.5;
          auVar140 = vfmadd213ps_avx512f(auVar55,auVar139,auVar54);
          auVar142 = vrndscaleps_avx512f(auVar140,1);
          uVar17 = vcmpps_avx512f(auVar140,auVar142,1);
          local_2482 = (ushort)uVar17;
          local_23c0._0_8_ = auVar142._0_8_;
          local_23c0._8_8_ = auVar142._8_8_;
          local_23c0._16_8_ = auVar142._16_8_;
          local_23c0._24_8_ = auVar142._24_8_;
          local_23c0._32_8_ = auVar142._32_8_;
          local_23c0._40_8_ = auVar142._40_8_;
          local_23c0._48_8_ = auVar142._48_8_;
          local_23c0._56_8_ = auVar142._56_8_;
          local_1a80 = local_23c0._0_8_;
          uVar110 = local_1a80;
          uStack_1a78 = local_23c0._8_8_;
          uVar111 = uStack_1a78;
          uStack_1a70 = local_23c0._16_8_;
          uVar112 = uStack_1a70;
          uStack_1a68 = local_23c0._24_8_;
          uVar113 = uStack_1a68;
          uStack_1a60 = local_23c0._32_8_;
          uVar114 = uStack_1a60;
          uStack_1a58 = local_23c0._40_8_;
          uVar115 = uStack_1a58;
          uStack_1a50 = local_23c0._48_8_;
          uVar116 = uStack_1a50;
          uStack_1a48 = local_23c0._56_8_;
          uVar117 = uStack_1a48;
          local_1b00 = local_23c0._0_8_;
          uStack_1af8 = local_23c0._8_8_;
          uStack_1af0 = local_23c0._16_8_;
          uStack_1ae8 = local_23c0._24_8_;
          uStack_1ae0 = local_23c0._32_8_;
          uStack_1ad8 = local_23c0._40_8_;
          uStack_1ad0 = local_23c0._48_8_;
          uStack_1ac8 = local_23c0._56_8_;
          local_1b40[0] = 1.0;
          local_1b40[1] = 1.0;
          local_1b40[2] = 1.0;
          local_1b40[3] = 1.0;
          local_1b40[4] = 1.0;
          local_1b40[5] = 1.0;
          local_1b40[6] = 1.0;
          local_1b40[7] = 1.0;
          local_1b40[8] = 1.0;
          local_1b40[9] = 1.0;
          local_1b40[10] = 1.0;
          local_1b40[0xb] = 1.0;
          local_1b40[0xc] = 1.0;
          local_1b40[0xd] = 1.0;
          local_1b40[0xe] = 1.0;
          local_1b40[0xf] = 1.0;
          local_1a00 = local_23c0._0_8_;
          uStack_19f8 = local_23c0._8_8_;
          uStack_19f0 = local_23c0._16_8_;
          uStack_19e8 = local_23c0._24_8_;
          uStack_19e0 = local_23c0._32_8_;
          uStack_19d8 = local_23c0._40_8_;
          uStack_19d0 = local_23c0._48_8_;
          uStack_19c8 = local_23c0._56_8_;
          local_1a40[0] = 1.0;
          local_1a40[1] = 1.0;
          local_1a40[2] = 1.0;
          local_1a40[3] = 1.0;
          local_1a40[4] = 1.0;
          local_1a40[5] = 1.0;
          local_1a40[6] = 1.0;
          local_1a40[7] = 1.0;
          local_1a40[8] = 1.0;
          local_1a40[9] = 1.0;
          local_1a40[10] = 1.0;
          local_1a40[0xb] = 1.0;
          local_1a40[0xc] = 1.0;
          local_1a40[0xd] = 1.0;
          local_1a40[0xe] = 1.0;
          local_1a40[0xf] = 1.0;
          auVar59._8_4_ = 1.0;
          auVar59._12_4_ = 1.0;
          auVar59._0_4_ = 1.0;
          auVar59._4_4_ = 1.0;
          auVar59._16_4_ = 1.0;
          auVar59._20_4_ = 1.0;
          auVar59._24_4_ = 1.0;
          auVar59._28_4_ = 1.0;
          auVar59._32_4_ = 1.0;
          auVar59._36_4_ = 1.0;
          auVar59._40_4_ = 1.0;
          auVar59._44_4_ = 1.0;
          auVar59._48_4_ = 1.0;
          auVar59._52_4_ = 1.0;
          auVar59._56_4_ = 1.0;
          auVar59._60_4_ = 1.0;
          local_1a80._0_4_ = auVar142._0_4_;
          local_1a80._4_4_ = auVar142._4_4_;
          uStack_1a78._0_4_ = auVar142._8_4_;
          uStack_1a78._4_4_ = auVar142._12_4_;
          uStack_1a70._0_4_ = auVar142._16_4_;
          uStack_1a70._4_4_ = auVar142._20_4_;
          uStack_1a68._0_4_ = auVar142._24_4_;
          uStack_1a68._4_4_ = auVar142._28_4_;
          uStack_1a60._0_4_ = auVar142._32_4_;
          uStack_1a60._4_4_ = auVar142._36_4_;
          uStack_1a58._0_4_ = auVar142._40_4_;
          uStack_1a58._4_4_ = auVar142._44_4_;
          uStack_1a50._0_4_ = auVar142._48_4_;
          uStack_1a50._4_4_ = auVar142._52_4_;
          uStack_1a48._0_4_ = auVar142._56_4_;
          uStack_1a48._4_4_ = auVar142._60_4_;
          auVar140 = vsubps_avx512f(auVar142,auVar59);
          bVar2 = (bool)((byte)uVar17 & 1);
          bVar3 = (bool)((byte)(local_2482 >> 1) & 1);
          bVar4 = (bool)((byte)(local_2482 >> 2) & 1);
          bVar5 = (bool)((byte)(local_2482 >> 3) & 1);
          bVar6 = (bool)((byte)(local_2482 >> 4) & 1);
          bVar7 = (bool)((byte)(local_2482 >> 5) & 1);
          bVar8 = (bool)((byte)(local_2482 >> 6) & 1);
          bVar9 = (bool)((byte)(local_2482 >> 7) & 1);
          bVar10 = (byte)((ulong)uVar17 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          local_2400._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * local_1a80._4_4_;
          local_2400._0_4_ = (uint)bVar2 * auVar140._0_4_ | (uint)!bVar2 * (int)local_1a80;
          local_2400._8_4_ = (uint)bVar4 * auVar140._8_4_ | (uint)!bVar4 * (int)uStack_1a78;
          local_2400._12_4_ = (uint)bVar5 * auVar140._12_4_ | (uint)!bVar5 * uStack_1a78._4_4_;
          uStack_23f0._0_4_ = (uint)bVar6 * auVar140._16_4_ | (uint)!bVar6 * (int)uStack_1a70;
          uStack_23f0._4_4_ = (uint)bVar7 * auVar140._20_4_ | (uint)!bVar7 * uStack_1a70._4_4_;
          auVar105 = _local_2400;
          uStack_23e8._0_4_ = (uint)bVar8 * auVar140._24_4_ | (uint)!bVar8 * (int)uStack_1a68;
          uStack_23e8._4_4_ = (uint)bVar9 * auVar140._28_4_ | (uint)!bVar9 * uStack_1a68._4_4_;
          auVar106 = _local_2400;
          uStack_23e0._0_4_ =
               (uint)(bVar10 & 1) * auVar140._32_4_ | (uint)!(bool)(bVar10 & 1) * (int)uStack_1a60;
          uStack_23e0._4_4_ = (uint)bVar11 * auVar140._36_4_ | (uint)!bVar11 * uStack_1a60._4_4_;
          auVar107 = _local_2400;
          uStack_23d8._0_4_ = (uint)bVar12 * auVar140._40_4_ | (uint)!bVar12 * (int)uStack_1a58;
          uStack_23d8._4_4_ = (uint)bVar13 * auVar140._44_4_ | (uint)!bVar13 * uStack_1a58._4_4_;
          auVar108 = _local_2400;
          uStack_23d0._0_4_ = (uint)bVar14 * auVar140._48_4_ | (uint)!bVar14 * (int)uStack_1a50;
          uStack_23d0._4_4_ = (uint)bVar15 * auVar140._52_4_ | (uint)!bVar15 * uStack_1a50._4_4_;
          auVar109 = _local_2400;
          uStack_23c8._0_4_ = (uint)bVar16 * auVar140._56_4_ | (uint)!bVar16 * (int)uStack_1a48;
          uStack_23c8._4_4_ =
               (uint)(bVar10 >> 7) * auVar140._60_4_ |
               (uint)!(bool)(bVar10 >> 7) * uStack_1a48._4_4_;
          auVar140 = _local_2400;
          uStack_23f0 = auVar105._16_8_;
          uStack_23e8 = auVar106._24_8_;
          uStack_23e0 = auVar107._32_8_;
          uStack_23d8 = auVar108._40_8_;
          uStack_23d0 = auVar109._48_8_;
          uStack_23c8 = auVar140._56_8_;
          local_1880 = local_2400._0_8_;
          uStack_1878 = local_2400._8_8_;
          uStack_1870 = uStack_23f0;
          uStack_1868 = uStack_23e8;
          uStack_1860 = uStack_23e0;
          uStack_1858 = uStack_23d8;
          uStack_1850 = uStack_23d0;
          uStack_1848 = uStack_23c8;
          local_18c0[0] = 0.6933594;
          local_18c0[1] = 0.6933594;
          local_18c0[2] = 0.6933594;
          local_18c0[3] = 0.6933594;
          local_18c0[4] = 0.6933594;
          local_18c0[5] = 0.6933594;
          local_18c0[6] = 0.6933594;
          local_18c0[7] = 0.6933594;
          local_18c0[8] = 0.6933594;
          local_18c0[9] = 0.6933594;
          local_18c0[10] = 0.6933594;
          local_18c0[0xb] = 0.6933594;
          local_18c0[0xc] = 0.6933594;
          local_18c0[0xd] = 0.6933594;
          local_18c0[0xe] = 0.6933594;
          local_18c0[0xf] = 0.6933594;
          local_1900 = local_2380._0_8_;
          uStack_18f8 = local_2380._8_8_;
          uStack_18f0 = local_2380._16_8_;
          uStack_18e8 = local_2380._24_8_;
          uStack_18e0 = local_2380._32_8_;
          uStack_18d8 = local_2380._40_8_;
          uStack_18d0 = local_2380._48_8_;
          uStack_18c8 = local_2380._56_8_;
          auVar63._16_8_ = uStack_23f0;
          auVar63._0_16_ = local_2400;
          auVar63._24_8_ = uStack_23e8;
          auVar63._32_8_ = uStack_23e0;
          auVar63._40_8_ = uStack_23d8;
          auVar63._48_8_ = uStack_23d0;
          auVar63._56_8_ = uStack_23c8;
          auVar62._8_4_ = 0.6933594;
          auVar62._12_4_ = 0.6933594;
          auVar62._0_4_ = 0.6933594;
          auVar62._4_4_ = 0.6933594;
          auVar62._16_4_ = 0.6933594;
          auVar62._20_4_ = 0.6933594;
          auVar62._24_4_ = 0.6933594;
          auVar62._28_4_ = 0.6933594;
          auVar62._32_4_ = 0.6933594;
          auVar62._36_4_ = 0.6933594;
          auVar62._40_4_ = 0.6933594;
          auVar62._44_4_ = 0.6933594;
          auVar62._48_4_ = 0.6933594;
          auVar62._52_4_ = 0.6933594;
          auVar62._56_4_ = 0.6933594;
          auVar62._60_4_ = 0.6933594;
          auVar139 = vfnmadd213ps_avx512f(auVar62,auVar63,auVar139);
          local_2380._0_8_ = auVar139._0_8_;
          local_2380._8_8_ = auVar139._8_8_;
          local_2380._16_8_ = auVar139._16_8_;
          local_2380._24_8_ = auVar139._24_8_;
          local_2380._32_8_ = auVar139._32_8_;
          local_2380._40_8_ = auVar139._40_8_;
          local_2380._48_8_ = auVar139._48_8_;
          local_2380._56_8_ = auVar139._56_8_;
          local_1940 = local_2400._0_8_;
          uStack_1938 = local_2400._8_8_;
          uStack_1930 = uStack_23f0;
          uStack_1928 = uStack_23e8;
          uStack_1920 = uStack_23e0;
          uStack_1918 = uStack_23d8;
          uStack_1910 = uStack_23d0;
          uStack_1908 = uStack_23c8;
          local_1980[0] = -0.00021219444;
          local_1980[1] = -0.00021219444;
          local_1980[2] = -0.00021219444;
          local_1980[3] = -0.00021219444;
          local_1980[4] = -0.00021219444;
          local_1980[5] = -0.00021219444;
          local_1980[6] = -0.00021219444;
          local_1980[7] = -0.00021219444;
          local_1980[8] = -0.00021219444;
          local_1980[9] = -0.00021219444;
          local_1980[10] = -0.00021219444;
          local_1980[0xb] = -0.00021219444;
          local_1980[0xc] = -0.00021219444;
          local_1980[0xd] = -0.00021219444;
          local_1980[0xe] = -0.00021219444;
          local_1980[0xf] = -0.00021219444;
          local_19c0 = local_2380._0_8_;
          uStack_19b8 = local_2380._8_8_;
          uStack_19b0 = local_2380._16_8_;
          uStack_19a8 = local_2380._24_8_;
          uStack_19a0 = local_2380._32_8_;
          uStack_1998 = local_2380._40_8_;
          uStack_1990 = local_2380._48_8_;
          uStack_1988 = local_2380._56_8_;
          auVar61._16_8_ = uStack_23f0;
          auVar61._0_16_ = local_2400;
          auVar61._24_8_ = uStack_23e8;
          auVar61._32_8_ = uStack_23e0;
          auVar61._40_8_ = uStack_23d8;
          auVar61._48_8_ = uStack_23d0;
          auVar61._56_8_ = uStack_23c8;
          auVar60._8_4_ = -0.00021219444;
          auVar60._12_4_ = -0.00021219444;
          auVar60._0_4_ = -0.00021219444;
          auVar60._4_4_ = -0.00021219444;
          auVar60._16_4_ = -0.00021219444;
          auVar60._20_4_ = -0.00021219444;
          auVar60._24_4_ = -0.00021219444;
          auVar60._28_4_ = -0.00021219444;
          auVar60._32_4_ = -0.00021219444;
          auVar60._36_4_ = -0.00021219444;
          auVar60._40_4_ = -0.00021219444;
          auVar60._44_4_ = -0.00021219444;
          auVar60._48_4_ = -0.00021219444;
          auVar60._52_4_ = -0.00021219444;
          auVar60._56_4_ = -0.00021219444;
          auVar60._60_4_ = -0.00021219444;
          local_2380 = vfnmadd213ps_avx512f(auVar60,auVar61,auVar139);
          local_1cc0 = local_2380._0_8_;
          uStack_1cb8 = local_2380._8_8_;
          uStack_1cb0 = local_2380._16_8_;
          uStack_1ca8 = local_2380._24_8_;
          uStack_1ca0 = local_2380._32_8_;
          uStack_1c98 = local_2380._40_8_;
          uStack_1c90 = local_2380._48_8_;
          uStack_1c88 = local_2380._56_8_;
          local_1d00 = local_2380._0_8_;
          uStack_1cf8 = local_2380._8_8_;
          uStack_1cf0 = local_2380._16_8_;
          uStack_1ce8 = local_2380._24_8_;
          uStack_1ce0 = local_2380._32_8_;
          uStack_1cd8 = local_2380._40_8_;
          uStack_1cd0 = local_2380._48_8_;
          uStack_1cc8 = local_2380._56_8_;
          local_23c0 = vmulps_avx512f(local_2380,local_2380);
          uStack_24f8._0_4_ = 0.00019875691;
          uStack_24f8._4_4_ = 0.00019875691;
          local_2500._0_4_ = 0.00019875691;
          local_2500._4_4_ = 0.00019875691;
          local_1f00[0] = 0.00019875691;
          local_1f00[1] = 0.00019875691;
          local_1f00[2] = 0.00019875691;
          local_1f00[3] = 0.00019875691;
          local_1f00[4] = 0.00019875691;
          local_1f00[5] = 0.00019875691;
          local_1f00[6] = 0.00019875691;
          local_1f00[7] = 0.00019875691;
          local_1f00[8] = 0.00019875691;
          local_1f00[9] = 0.00019875691;
          local_1f00[10] = 0.00019875691;
          local_1f00[0xb] = 0.00019875691;
          local_1f00[0xc] = 0.00019875691;
          local_1f00[0xd] = 0.00019875691;
          local_1f00[0xe] = 0.00019875691;
          local_1f00[0xf] = 0.00019875691;
          local_1f40 = local_2380._0_8_;
          uStack_1f38 = local_2380._8_8_;
          uStack_1f30 = local_2380._16_8_;
          uStack_1f28 = local_2380._24_8_;
          uStack_1f20 = local_2380._32_8_;
          uStack_1f18 = local_2380._40_8_;
          uStack_1f10 = local_2380._48_8_;
          uStack_1f08 = local_2380._56_8_;
          local_1f80[0] = 0.0013981999;
          local_1f80[1] = 0.0013981999;
          local_1f80[2] = 0.0013981999;
          local_1f80[3] = 0.0013981999;
          local_1f80[4] = 0.0013981999;
          local_1f80[5] = 0.0013981999;
          local_1f80[6] = 0.0013981999;
          local_1f80[7] = 0.0013981999;
          local_1f80[8] = 0.0013981999;
          local_1f80[9] = 0.0013981999;
          local_1f80[10] = 0.0013981999;
          local_1f80[0xb] = 0.0013981999;
          local_1f80[0xc] = 0.0013981999;
          local_1f80[0xd] = 0.0013981999;
          local_1f80[0xe] = 0.0013981999;
          local_1f80[0xf] = 0.0013981999;
          auVar53._16_4_ = 0.00019875691;
          auVar53._20_4_ = 0.00019875691;
          auVar53._0_16_ = _local_2500;
          auVar53._24_4_ = 0.00019875691;
          auVar53._28_4_ = 0.00019875691;
          auVar53._32_4_ = 0.00019875691;
          auVar53._36_4_ = 0.00019875691;
          auVar53._40_4_ = 0.00019875691;
          auVar53._44_4_ = 0.00019875691;
          auVar53._48_4_ = 0.00019875691;
          auVar53._52_4_ = 0.00019875691;
          auVar53._56_4_ = 0.00019875691;
          auVar53._60_4_ = 0.00019875691;
          auVar52._8_4_ = 0.0013981999;
          auVar52._12_4_ = 0.0013981999;
          auVar52._0_4_ = 0.0013981999;
          auVar52._4_4_ = 0.0013981999;
          auVar52._16_4_ = 0.0013981999;
          auVar52._20_4_ = 0.0013981999;
          auVar52._24_4_ = 0.0013981999;
          auVar52._28_4_ = 0.0013981999;
          auVar52._32_4_ = 0.0013981999;
          auVar52._36_4_ = 0.0013981999;
          auVar52._40_4_ = 0.0013981999;
          auVar52._44_4_ = 0.0013981999;
          auVar52._48_4_ = 0.0013981999;
          auVar52._52_4_ = 0.0013981999;
          auVar52._56_4_ = 0.0013981999;
          auVar52._60_4_ = 0.0013981999;
          auVar139 = vfmadd213ps_avx512f(local_2380,auVar53,auVar52);
          local_2500 = auVar139._0_8_;
          uStack_24f8 = auVar139._8_8_;
          uStack_24f0 = auVar139._16_8_;
          uStack_24e8 = auVar139._24_8_;
          uStack_24e0 = auVar139._32_8_;
          uStack_24d8 = auVar139._40_8_;
          uStack_24d0 = auVar139._48_8_;
          uStack_24c8 = auVar139._56_8_;
          local_1fc0 = local_2500;
          uStack_1fb8 = uStack_24f8;
          uStack_1fb0 = uStack_24f0;
          uStack_1fa8 = uStack_24e8;
          uStack_1fa0 = uStack_24e0;
          uStack_1f98 = uStack_24d8;
          uStack_1f90 = uStack_24d0;
          uStack_1f88 = uStack_24c8;
          local_2000 = local_2380._0_8_;
          uStack_1ff8 = local_2380._8_8_;
          uStack_1ff0 = local_2380._16_8_;
          uStack_1fe8 = local_2380._24_8_;
          uStack_1fe0 = local_2380._32_8_;
          uStack_1fd8 = local_2380._40_8_;
          uStack_1fd0 = local_2380._48_8_;
          uStack_1fc8 = local_2380._56_8_;
          local_2040[0] = 0.008333452;
          local_2040[1] = 0.008333452;
          local_2040[2] = 0.008333452;
          local_2040[3] = 0.008333452;
          local_2040[4] = 0.008333452;
          local_2040[5] = 0.008333452;
          local_2040[6] = 0.008333452;
          local_2040[7] = 0.008333452;
          local_2040[8] = 0.008333452;
          local_2040[9] = 0.008333452;
          local_2040[10] = 0.008333452;
          local_2040[0xb] = 0.008333452;
          local_2040[0xc] = 0.008333452;
          local_2040[0xd] = 0.008333452;
          local_2040[0xe] = 0.008333452;
          local_2040[0xf] = 0.008333452;
          auVar51._8_4_ = 0.008333452;
          auVar51._12_4_ = 0.008333452;
          auVar51._0_4_ = 0.008333452;
          auVar51._4_4_ = 0.008333452;
          auVar51._16_4_ = 0.008333452;
          auVar51._20_4_ = 0.008333452;
          auVar51._24_4_ = 0.008333452;
          auVar51._28_4_ = 0.008333452;
          auVar51._32_4_ = 0.008333452;
          auVar51._36_4_ = 0.008333452;
          auVar51._40_4_ = 0.008333452;
          auVar51._44_4_ = 0.008333452;
          auVar51._48_4_ = 0.008333452;
          auVar51._52_4_ = 0.008333452;
          auVar51._56_4_ = 0.008333452;
          auVar51._60_4_ = 0.008333452;
          auVar139 = vfmadd213ps_avx512f(local_2380,auVar139,auVar51);
          local_2500 = auVar139._0_8_;
          uStack_24f8 = auVar139._8_8_;
          uStack_24f0 = auVar139._16_8_;
          uStack_24e8 = auVar139._24_8_;
          uStack_24e0 = auVar139._32_8_;
          uStack_24d8 = auVar139._40_8_;
          uStack_24d0 = auVar139._48_8_;
          uStack_24c8 = auVar139._56_8_;
          local_2080 = local_2500;
          uStack_2078 = uStack_24f8;
          uStack_2070 = uStack_24f0;
          uStack_2068 = uStack_24e8;
          uStack_2060 = uStack_24e0;
          uStack_2058 = uStack_24d8;
          uStack_2050 = uStack_24d0;
          uStack_2048 = uStack_24c8;
          local_20c0 = local_2380._0_8_;
          uStack_20b8 = local_2380._8_8_;
          uStack_20b0 = local_2380._16_8_;
          uStack_20a8 = local_2380._24_8_;
          uStack_20a0 = local_2380._32_8_;
          uStack_2098 = local_2380._40_8_;
          uStack_2090 = local_2380._48_8_;
          uStack_2088 = local_2380._56_8_;
          local_2100[0] = 0.041665796;
          local_2100[1] = 0.041665796;
          local_2100[2] = 0.041665796;
          local_2100[3] = 0.041665796;
          local_2100[4] = 0.041665796;
          local_2100[5] = 0.041665796;
          local_2100[6] = 0.041665796;
          local_2100[7] = 0.041665796;
          local_2100[8] = 0.041665796;
          local_2100[9] = 0.041665796;
          local_2100[10] = 0.041665796;
          local_2100[0xb] = 0.041665796;
          local_2100[0xc] = 0.041665796;
          local_2100[0xd] = 0.041665796;
          local_2100[0xe] = 0.041665796;
          local_2100[0xf] = 0.041665796;
          auVar50._8_4_ = 0.041665796;
          auVar50._12_4_ = 0.041665796;
          auVar50._0_4_ = 0.041665796;
          auVar50._4_4_ = 0.041665796;
          auVar50._16_4_ = 0.041665796;
          auVar50._20_4_ = 0.041665796;
          auVar50._24_4_ = 0.041665796;
          auVar50._28_4_ = 0.041665796;
          auVar50._32_4_ = 0.041665796;
          auVar50._36_4_ = 0.041665796;
          auVar50._40_4_ = 0.041665796;
          auVar50._44_4_ = 0.041665796;
          auVar50._48_4_ = 0.041665796;
          auVar50._52_4_ = 0.041665796;
          auVar50._56_4_ = 0.041665796;
          auVar50._60_4_ = 0.041665796;
          auVar139 = vfmadd213ps_avx512f(local_2380,auVar139,auVar50);
          local_2500 = auVar139._0_8_;
          uStack_24f8 = auVar139._8_8_;
          uStack_24f0 = auVar139._16_8_;
          uStack_24e8 = auVar139._24_8_;
          uStack_24e0 = auVar139._32_8_;
          uStack_24d8 = auVar139._40_8_;
          uStack_24d0 = auVar139._48_8_;
          uStack_24c8 = auVar139._56_8_;
          local_2140 = local_2500;
          uStack_2138 = uStack_24f8;
          uStack_2130 = uStack_24f0;
          uStack_2128 = uStack_24e8;
          uStack_2120 = uStack_24e0;
          uStack_2118 = uStack_24d8;
          uStack_2110 = uStack_24d0;
          uStack_2108 = uStack_24c8;
          local_2180 = local_2380._0_8_;
          uStack_2178 = local_2380._8_8_;
          uStack_2170 = local_2380._16_8_;
          uStack_2168 = local_2380._24_8_;
          uStack_2160 = local_2380._32_8_;
          uStack_2158 = local_2380._40_8_;
          uStack_2150 = local_2380._48_8_;
          uStack_2148 = local_2380._56_8_;
          local_21c0[0] = 0.16666666;
          local_21c0[1] = 0.16666666;
          local_21c0[2] = 0.16666666;
          local_21c0[3] = 0.16666666;
          local_21c0[4] = 0.16666666;
          local_21c0[5] = 0.16666666;
          local_21c0[6] = 0.16666666;
          local_21c0[7] = 0.16666666;
          local_21c0[8] = 0.16666666;
          local_21c0[9] = 0.16666666;
          local_21c0[10] = 0.16666666;
          local_21c0[0xb] = 0.16666666;
          local_21c0[0xc] = 0.16666666;
          local_21c0[0xd] = 0.16666666;
          local_21c0[0xe] = 0.16666666;
          local_21c0[0xf] = 0.16666666;
          auVar49._8_4_ = 0.16666666;
          auVar49._12_4_ = 0.16666666;
          auVar49._0_4_ = 0.16666666;
          auVar49._4_4_ = 0.16666666;
          auVar49._16_4_ = 0.16666666;
          auVar49._20_4_ = 0.16666666;
          auVar49._24_4_ = 0.16666666;
          auVar49._28_4_ = 0.16666666;
          auVar49._32_4_ = 0.16666666;
          auVar49._36_4_ = 0.16666666;
          auVar49._40_4_ = 0.16666666;
          auVar49._44_4_ = 0.16666666;
          auVar49._48_4_ = 0.16666666;
          auVar49._52_4_ = 0.16666666;
          auVar49._56_4_ = 0.16666666;
          auVar49._60_4_ = 0.16666666;
          auVar139 = vfmadd213ps_avx512f(local_2380,auVar139,auVar49);
          local_2500 = auVar139._0_8_;
          uStack_24f8 = auVar139._8_8_;
          uStack_24f0 = auVar139._16_8_;
          uStack_24e8 = auVar139._24_8_;
          uStack_24e0 = auVar139._32_8_;
          uStack_24d8 = auVar139._40_8_;
          uStack_24d0 = auVar139._48_8_;
          uStack_24c8 = auVar139._56_8_;
          local_2200 = local_2500;
          uStack_21f8 = uStack_24f8;
          uStack_21f0 = uStack_24f0;
          uStack_21e8 = uStack_24e8;
          uStack_21e0 = uStack_24e0;
          uStack_21d8 = uStack_24d8;
          uStack_21d0 = uStack_24d0;
          uStack_21c8 = uStack_24c8;
          local_2240 = local_2380._0_8_;
          uStack_2238 = local_2380._8_8_;
          uStack_2230 = local_2380._16_8_;
          uStack_2228 = local_2380._24_8_;
          uStack_2220 = local_2380._32_8_;
          uStack_2218 = local_2380._40_8_;
          uStack_2210 = local_2380._48_8_;
          uStack_2208 = local_2380._56_8_;
          local_2280[0] = 0.5;
          local_2280[1] = 0.5;
          local_2280[2] = 0.5;
          local_2280[3] = 0.5;
          local_2280[4] = 0.5;
          local_2280[5] = 0.5;
          local_2280[6] = 0.5;
          local_2280[7] = 0.5;
          local_2280[8] = 0.5;
          local_2280[9] = 0.5;
          local_2280[10] = 0.5;
          local_2280[0xb] = 0.5;
          local_2280[0xc] = 0.5;
          local_2280[0xd] = 0.5;
          local_2280[0xe] = 0.5;
          local_2280[0xf] = 0.5;
          auVar48._8_4_ = 0.5;
          auVar48._12_4_ = 0.5;
          auVar48._0_4_ = 0.5;
          auVar48._4_4_ = 0.5;
          auVar48._16_4_ = 0.5;
          auVar48._20_4_ = 0.5;
          auVar48._24_4_ = 0.5;
          auVar48._28_4_ = 0.5;
          auVar48._32_4_ = 0.5;
          auVar48._36_4_ = 0.5;
          auVar48._40_4_ = 0.5;
          auVar48._44_4_ = 0.5;
          auVar48._48_4_ = 0.5;
          auVar48._52_4_ = 0.5;
          auVar48._56_4_ = 0.5;
          auVar48._60_4_ = 0.5;
          auVar139 = vfmadd213ps_avx512f(local_2380,auVar139,auVar48);
          local_2500 = auVar139._0_8_;
          uStack_24f8 = auVar139._8_8_;
          uStack_24f0 = auVar139._16_8_;
          uStack_24e8 = auVar139._24_8_;
          uStack_24e0 = auVar139._32_8_;
          uStack_24d8 = auVar139._40_8_;
          uStack_24d0 = auVar139._48_8_;
          uStack_24c8 = auVar139._56_8_;
          local_22c0 = local_2500;
          uStack_22b8 = uStack_24f8;
          uStack_22b0 = uStack_24f0;
          uStack_22a8 = uStack_24e8;
          uStack_22a0 = uStack_24e0;
          uStack_2298 = uStack_24d8;
          uStack_2290 = uStack_24d0;
          uStack_2288 = uStack_24c8;
          local_2300 = local_23c0._0_8_;
          uStack_22f8 = local_23c0._8_8_;
          uStack_22f0 = local_23c0._16_8_;
          uStack_22e8 = local_23c0._24_8_;
          uStack_22e0 = local_23c0._32_8_;
          uStack_22d8 = local_23c0._40_8_;
          uStack_22d0 = local_23c0._48_8_;
          uStack_22c8 = local_23c0._56_8_;
          local_2340 = local_2380._0_8_;
          uStack_2338 = local_2380._8_8_;
          uStack_2330 = local_2380._16_8_;
          uStack_2328 = local_2380._24_8_;
          uStack_2320 = local_2380._32_8_;
          uStack_2318 = local_2380._40_8_;
          uStack_2310 = local_2380._48_8_;
          uStack_2308 = local_2380._56_8_;
          auVar139 = vfmadd213ps_avx512f(local_23c0,auVar139,local_2380);
          local_2500 = auVar139._0_8_;
          uStack_24f8 = auVar139._8_8_;
          uStack_24f0 = auVar139._16_8_;
          uStack_24e8 = auVar139._24_8_;
          uStack_24e0 = auVar139._32_8_;
          uStack_24d8 = auVar139._40_8_;
          uStack_24d0 = auVar139._48_8_;
          uStack_24c8 = auVar139._56_8_;
          local_1dc0 = local_2500;
          uStack_1db8 = uStack_24f8;
          uStack_1db0 = uStack_24f0;
          uStack_1da8 = uStack_24e8;
          uStack_1da0 = uStack_24e0;
          uStack_1d98 = uStack_24d8;
          uStack_1d90 = uStack_24d0;
          uStack_1d88 = uStack_24c8;
          local_1e00[0] = 1.0;
          local_1e00[1] = 1.0;
          local_1e00[2] = 1.0;
          local_1e00[3] = 1.0;
          local_1e00[4] = 1.0;
          local_1e00[5] = 1.0;
          local_1e00[6] = 1.0;
          local_1e00[7] = 1.0;
          local_1e00[8] = 1.0;
          local_1e00[9] = 1.0;
          local_1e00[10] = 1.0;
          local_1e00[0xb] = 1.0;
          local_1e00[0xc] = 1.0;
          local_1e00[0xd] = 1.0;
          local_1e00[0xe] = 1.0;
          local_1e00[0xf] = 1.0;
          auVar56._8_4_ = 1.0;
          auVar56._12_4_ = 1.0;
          auVar56._0_4_ = 1.0;
          auVar56._4_4_ = 1.0;
          auVar56._16_4_ = 1.0;
          auVar56._20_4_ = 1.0;
          auVar56._24_4_ = 1.0;
          auVar56._28_4_ = 1.0;
          auVar56._32_4_ = 1.0;
          auVar56._36_4_ = 1.0;
          auVar56._40_4_ = 1.0;
          auVar56._44_4_ = 1.0;
          auVar56._48_4_ = 1.0;
          auVar56._52_4_ = 1.0;
          auVar56._56_4_ = 1.0;
          auVar56._60_4_ = 1.0;
          auVar142 = vaddps_avx512f(auVar139,auVar56);
          local_1840 = local_2400._0_8_;
          uStack_1838 = local_2400._8_8_;
          uStack_1830 = uStack_23f0;
          uStack_1828 = uStack_23e8;
          uStack_1820 = uStack_23e0;
          uStack_1818 = uStack_23d8;
          uStack_1810 = uStack_23d0;
          uStack_1808 = uStack_23c8;
          auVar64._16_8_ = uStack_23f0;
          auVar64._0_16_ = local_2400;
          auVar64._24_8_ = uStack_23e8;
          auVar64._32_8_ = uStack_23e0;
          auVar64._40_8_ = uStack_23d8;
          auVar64._48_8_ = uStack_23d0;
          auVar64._56_8_ = uStack_23c8;
          auVar139 = vcvttps2dq_avx512f(auVar64);
          local_16c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar143 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          local_17c0 = vmovdqa64_avx512f(auVar139);
          local_1800 = vmovdqa64_avx512f(auVar143);
          auVar139 = vmovdqa64_avx512f(local_17c0);
          auVar143 = vmovdqa64_avx512f(local_1800);
          auVar139 = vpaddd_avx512f(auVar139,auVar143);
          auVar139 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(auVar139);
          local_1740 = vmovdqa64_avx512f(auVar139);
          local_1744 = 0x17;
          auVar139 = vmovdqa64_avx512f(local_1740);
          auVar139 = vpslld_avx512f(auVar139,ZEXT416(0x17));
          local_2440 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(local_2440);
          local_1700 = vmovdqa64_avx512f(auVar139);
          auVar139 = vmovdqa64_avx512f(local_1700);
          local_2540 = vmovdqa64_avx512f(auVar139);
          local_2500 = auVar142._0_8_;
          uStack_24f8 = auVar142._8_8_;
          uStack_24f0 = auVar142._16_8_;
          uStack_24e8 = auVar142._24_8_;
          uStack_24e0 = auVar142._32_8_;
          uStack_24d8 = auVar142._40_8_;
          uStack_24d0 = auVar142._48_8_;
          uStack_24c8 = auVar142._56_8_;
          local_1d40 = local_2500;
          uStack_1d38 = uStack_24f8;
          uStack_1d30 = uStack_24f0;
          uStack_1d28 = uStack_24e8;
          uStack_1d20 = uStack_24e0;
          uStack_1d18 = uStack_24d8;
          uStack_1d10 = uStack_24d0;
          uStack_1d08 = uStack_24c8;
          local_1d80 = local_2540._0_8_;
          uStack_1d78 = local_2540._8_8_;
          uStack_1d70 = local_2540._16_8_;
          uStack_1d68 = local_2540._24_8_;
          uStack_1d60 = local_2540._32_8_;
          uStack_1d58 = local_2540._40_8_;
          uStack_1d50 = local_2540._48_8_;
          uStack_1d48 = local_2540._56_8_;
          _local_2500 = vmulps_avx512f(auVar142,local_2540);
          local_2640 = local_2780._0_8_;
          uStack_2638 = local_2780._8_8_;
          uStack_2630 = local_2780._16_8_;
          uStack_2628 = local_2780._24_8_;
          uStack_2620 = local_2780._32_8_;
          uStack_2618 = local_2780._40_8_;
          uStack_2610 = local_2780._48_8_;
          uStack_2608 = local_2780._56_8_;
          local_2680 = local_2500;
          uStack_2678 = uStack_24f8;
          uStack_2670 = uStack_24f0;
          uStack_2668 = uStack_24e8;
          uStack_2660 = uStack_24e0;
          uStack_2658 = uStack_24d8;
          uStack_2650 = uStack_24d0;
          uStack_2648 = uStack_24c8;
          local_25c0 = vaddps_avx512f(local_2780,_local_2500);
          local_2580 = local_2780._0_8_;
          uStack_2578 = local_2780._8_8_;
          uStack_2570 = local_2780._16_8_;
          uStack_2568 = local_2780._24_8_;
          uStack_2560 = local_2780._32_8_;
          uStack_2558 = local_2780._40_8_;
          uStack_2550 = local_2780._48_8_;
          uStack_2548 = local_2780._56_8_;
          auVar139 = vrcp14ps_avx512f(local_25c0);
          auVar142 = vmulps_avx512f(local_2780,auVar139);
          auVar143 = vfmsub213ps_avx512f(auVar142,local_25c0,local_2780);
          local_600 = vfnmadd213ps_avx512f(auVar143,auVar139,auVar142);
          local_640 = local_2980._0_8_;
          uStack_638 = local_2980._8_8_;
          uStack_630 = local_2980._16_8_;
          uStack_628 = local_2980._24_8_;
          uStack_620 = local_2980._32_8_;
          uStack_618 = local_2980._40_8_;
          uStack_610 = local_2980._48_8_;
          uStack_608 = local_2980._56_8_;
          local_680 = local_2900._0_8_;
          uStack_678 = local_2900._8_8_;
          uStack_670 = local_2900._16_8_;
          uStack_668 = local_2900._24_8_;
          uStack_660 = local_2900._32_8_;
          uStack_658 = local_2900._40_8_;
          uStack_650 = local_2900._48_8_;
          uStack_648 = local_2900._56_8_;
          auVar139 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar139 = vpxord_avx512f(local_2900,auVar139);
          auVar139 = vfmadd213ps_avx512f(local_2980,local_600,auVar139);
          local_7d80 = auVar139._0_8_;
          uStack_7d78 = auVar139._8_8_;
          uStack_7d70 = auVar139._16_8_;
          uStack_7d68 = auVar139._24_8_;
          uStack_7d60 = auVar139._32_8_;
          uStack_7d58 = auVar139._40_8_;
          uStack_7d50 = auVar139._48_8_;
          uStack_7d48 = auVar139._56_8_;
          local_4e00 = local_7140._0_8_;
          uStack_4df8 = local_7140._8_8_;
          uStack_4df0 = local_7140._16_8_;
          uStack_4de8 = local_7140._24_8_;
          uStack_4de0 = local_7140._32_8_;
          uStack_4dd8 = local_7140._40_8_;
          uStack_4dd0 = local_7140._48_8_;
          uStack_4dc8 = local_7140._56_8_;
          local_4e40 = local_7d80;
          uStack_4e38 = uStack_7d78;
          uStack_4e30 = uStack_7d70;
          uStack_4e28 = uStack_7d68;
          uStack_4e20 = uStack_7d60;
          uStack_4e18 = uStack_7d58;
          uStack_4e10 = uStack_7d50;
          uStack_4e08 = uStack_7d48;
          _local_5780 = vmulps_avx512f(local_7140,auVar139);
          _local_4680 = auVar20;
          local_3182 = local_4702;
          local_3180 = uVar97;
          uStack_3178 = uVar98;
          uStack_3170 = uVar99;
          uStack_3168 = uVar100;
          uStack_3160 = uVar101;
          uStack_3158 = uVar102;
          uStack_3150 = uVar103;
          uStack_3148 = uVar104;
          _local_2400 = auVar140;
          local_1a82 = local_2482;
          local_1a80 = uVar110;
          uStack_1a78 = uVar111;
          uStack_1a70 = uVar112;
          uStack_1a68 = uVar113;
          uStack_1a60 = uVar114;
          uStack_1a58 = uVar115;
          uStack_1a50 = uVar116;
          uStack_1a48 = uVar117;
          _local_1580 = auVar141;
          local_842 = local_1582;
          local_840 = uVar123;
          uStack_838 = uVar124;
          uStack_830 = uVar125;
          uStack_828 = uVar126;
          uStack_820 = uVar127;
          uStack_818 = uVar128;
          uStack_810 = uVar129;
          uStack_808 = uVar130;
          local_202 = local_1582;
          local_200 = uVar131;
          uStack_1f8 = uVar132;
          uStack_1f0 = uVar133;
          uStack_1e8 = uVar134;
          uStack_1e0 = uVar135;
          uStack_1d8 = uVar136;
          uStack_1d0 = uVar137;
          uStack_1c8 = uVar138;
          local_12a = local_1502;
          break;
        case 6:
          local_5700 = 0;
          local_55c4 = *(uint *)*local_57d0;
          local_5640 = vbroadcastss_avx512f(ZEXT416(local_55c4));
          local_58c0 = local_5640._0_8_;
          uStack_58b8 = local_5640._8_8_;
          uStack_58b0 = local_5640._16_8_;
          uStack_58a8 = local_5640._24_8_;
          uStack_58a0 = local_5640._32_8_;
          uStack_5898 = local_5640._40_8_;
          uStack_5890 = local_5640._48_8_;
          uStack_5888 = local_5640._56_8_;
          local_5710 = 1;
          local_5644 = *(uint *)(*local_57d0 + 4);
          local_56c0 = vbroadcastss_avx512f(ZEXT416(local_5644));
          local_5900 = local_56c0._0_8_;
          uStack_58f8 = local_56c0._8_8_;
          uStack_58f0 = local_56c0._16_8_;
          uStack_58e8 = local_56c0._24_8_;
          uStack_58e0 = local_56c0._32_8_;
          uStack_58d8 = local_56c0._40_8_;
          uStack_58d0 = local_56c0._48_8_;
          uStack_58c8 = local_56c0._56_8_;
          local_4d00 = local_7140._0_8_;
          uStack_4cf8 = local_7140._8_8_;
          uStack_4cf0 = local_7140._16_8_;
          uStack_4ce8 = local_7140._24_8_;
          uStack_4ce0 = local_7140._32_8_;
          uStack_4cd8 = local_7140._40_8_;
          uStack_4cd0 = local_7140._48_8_;
          uStack_4cc8 = local_7140._56_8_;
          local_4d40 = local_5640._0_8_;
          uStack_4d38 = local_5640._8_8_;
          uStack_4d30 = local_5640._16_8_;
          uStack_4d28 = local_5640._24_8_;
          uStack_4d20 = local_5640._32_8_;
          uStack_4d18 = local_5640._40_8_;
          uStack_4d10 = local_5640._48_8_;
          uStack_4d08 = local_5640._56_8_;
          local_4c44 = 0x3f800000;
          local_4cc0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          local_4dc0 = local_4cc0._0_8_;
          uStack_4db8 = local_4cc0._8_8_;
          uStack_4db0 = local_4cc0._16_8_;
          uStack_4da8 = local_4cc0._24_8_;
          uStack_4da0 = local_4cc0._32_8_;
          uStack_4d98 = local_4cc0._40_8_;
          uStack_4d90 = local_4cc0._48_8_;
          uStack_4d88 = local_4cc0._56_8_;
          local_4bc0 = local_7140._0_8_;
          uStack_4bb8 = local_7140._8_8_;
          uStack_4bb0 = local_7140._16_8_;
          uStack_4ba8 = local_7140._24_8_;
          uStack_4ba0 = local_7140._32_8_;
          uStack_4b98 = local_7140._40_8_;
          uStack_4b90 = local_7140._48_8_;
          uStack_4b88 = local_7140._56_8_;
          local_4c00 = local_5640._0_8_;
          uStack_4bf8 = local_5640._8_8_;
          uStack_4bf0 = local_5640._16_8_;
          uStack_4be8 = local_5640._24_8_;
          uStack_4be0 = local_5640._32_8_;
          uStack_4bd8 = local_5640._40_8_;
          uStack_4bd0 = local_5640._48_8_;
          uStack_4bc8 = local_5640._56_8_;
          local_4c40 = local_56c0._0_8_;
          uStack_4c38 = local_56c0._8_8_;
          uStack_4c30 = local_56c0._16_8_;
          uStack_4c28 = local_56c0._24_8_;
          uStack_4c20 = local_56c0._32_8_;
          uStack_4c18 = local_56c0._40_8_;
          uStack_4c10 = local_56c0._48_8_;
          uStack_4c08 = local_56c0._56_8_;
          auVar139 = vfmadd213ps_avx512f(local_5640,local_7140,local_56c0);
          local_4d80._0_8_ = auVar139._0_8_;
          local_4d80._8_8_ = auVar139._8_8_;
          local_4d80._16_8_ = auVar139._16_8_;
          local_4d80._24_8_ = auVar139._24_8_;
          local_4d80._32_8_ = auVar139._32_8_;
          local_4d80._40_8_ = auVar139._40_8_;
          local_4d80._48_8_ = auVar139._48_8_;
          local_4d80._56_8_ = auVar139._56_8_;
          local_4b00 = 0;
          uStack_4af8 = 0;
          uStack_4af0 = 0;
          uStack_4ae8 = 0;
          uStack_4ae0 = 0;
          uStack_4ad8 = 0;
          uStack_4ad0 = 0;
          uStack_4ac8 = 0;
          local_4a80 = local_4d80._0_8_;
          uStack_4a78 = local_4d80._8_8_;
          uStack_4a70 = local_4d80._16_8_;
          uStack_4a68 = local_4d80._24_8_;
          uStack_4a60 = local_4d80._32_8_;
          uStack_4a58 = local_4d80._40_8_;
          uStack_4a50 = local_4d80._48_8_;
          uStack_4a48 = local_4d80._56_8_;
          local_4ac0 = 0;
          uStack_4ab8 = 0;
          uStack_4ab0 = 0;
          uStack_4aa8 = 0;
          uStack_4aa0 = 0;
          uStack_4a98 = 0;
          uStack_4a90 = 0;
          uStack_4a88 = 0;
          auVar139 = vmaxps_avx512f(auVar139,ZEXT1664(ZEXT816(0)));
          local_4d80._0_8_ = auVar139._0_8_;
          local_4d80._8_8_ = auVar139._8_8_;
          local_4d80._16_8_ = auVar139._16_8_;
          local_4d80._24_8_ = auVar139._24_8_;
          local_4d80._32_8_ = auVar139._32_8_;
          local_4d80._40_8_ = auVar139._40_8_;
          local_4d80._48_8_ = auVar139._48_8_;
          local_4d80._56_8_ = auVar139._56_8_;
          local_4a00 = local_4d80._0_8_;
          uStack_49f8 = local_4d80._8_8_;
          uStack_49f0 = local_4d80._16_8_;
          uStack_49e8 = local_4d80._24_8_;
          uStack_49e0 = local_4d80._32_8_;
          uStack_49d8 = local_4d80._40_8_;
          uStack_49d0 = local_4d80._48_8_;
          uStack_49c8 = local_4d80._56_8_;
          local_4a40 = local_4cc0._0_8_;
          uStack_4a38 = local_4cc0._8_8_;
          uStack_4a30 = local_4cc0._16_8_;
          uStack_4a28 = local_4cc0._24_8_;
          uStack_4a20 = local_4cc0._32_8_;
          uStack_4a18 = local_4cc0._40_8_;
          uStack_4a10 = local_4cc0._48_8_;
          uStack_4a08 = local_4cc0._56_8_;
          local_4d80 = vminps_avx512f(auVar139,local_4cc0);
          local_4b40 = local_4d80._0_8_;
          uStack_4b38 = local_4d80._8_8_;
          uStack_4b30 = local_4d80._16_8_;
          uStack_4b28 = local_4d80._24_8_;
          uStack_4b20 = local_4d80._32_8_;
          uStack_4b18 = local_4d80._40_8_;
          uStack_4b10 = local_4d80._48_8_;
          uStack_4b08 = local_4d80._56_8_;
          local_4b80 = local_7140._0_8_;
          uStack_4b78 = local_7140._8_8_;
          uStack_4b70 = local_7140._16_8_;
          uStack_4b68 = local_7140._24_8_;
          uStack_4b60 = local_7140._32_8_;
          uStack_4b58 = local_7140._40_8_;
          uStack_4b50 = local_7140._48_8_;
          uStack_4b48 = local_7140._56_8_;
          _local_5780 = vmulps_avx512f(local_4d80,local_7140);
          local_5708 = local_57d0;
          local_56f8 = local_57d0;
          break;
        default:
          _local_5780 = local_7140;
        }
        local_7140 = _local_5780;
        local_5948 = local_7080;
        local_59c0 = local_5780._0_8_;
        uStack_59b8 = local_5780._8_8_;
        uStack_59b0 = local_5780._16_8_;
        paStack_59a8 = (allocator_type *)local_5780._24_8_;
        uStack_59a0 = uStack_5760;
        uStack_5998 = uStack_5758;
        uStack_5990 = uStack_5750;
        uStack_5988 = uStack_5748;
        *local_7080 = _local_5780;
        local_7080 = local_7080 + 1;
        in_stack_ffffffffffff8218 = (allocator_type *)local_5780._24_8_;
        local_6f70 = local_6fc8;
        local_7170 = local_128;
      }
    }
    local_6f50 = local_6fd8;
    local_70a8 = local_b8;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff8218);
  return;
}

Assistant:

static void convolution_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m512 _sum = _mm512_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm512_loadu_ps(bias_data_ptr + p * 16);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                    for (int k = 0; k < maxk; k++)
                    {
                        const float* slptr = sptr + space_ofs[k] * 16;

                        __m512 _val0 = _mm512_set1_ps(slptr[0]);
                        __m512 _val1 = _mm512_set1_ps(slptr[1]);
                        __m512 _val2 = _mm512_set1_ps(slptr[2]);
                        __m512 _val3 = _mm512_set1_ps(slptr[3]);
                        __m512 _val4 = _mm512_set1_ps(slptr[4]);
                        __m512 _val5 = _mm512_set1_ps(slptr[5]);
                        __m512 _val6 = _mm512_set1_ps(slptr[6]);
                        __m512 _val7 = _mm512_set1_ps(slptr[7]);
                        __m512 _val8 = _mm512_set1_ps(slptr[8]);
                        __m512 _val9 = _mm512_set1_ps(slptr[9]);
                        __m512 _vala = _mm512_set1_ps(slptr[10]);
                        __m512 _valb = _mm512_set1_ps(slptr[11]);
                        __m512 _valc = _mm512_set1_ps(slptr[12]);
                        __m512 _vald = _mm512_set1_ps(slptr[13]);
                        __m512 _vale = _mm512_set1_ps(slptr[14]);
                        __m512 _valf = _mm512_set1_ps(slptr[15]);

                        __m512 _w0 = _mm512_load_ps(kptr + 16 * 0);
                        __m512 _w1 = _mm512_load_ps(kptr + 16 * 1);
                        __m512 _w2 = _mm512_load_ps(kptr + 16 * 2);
                        __m512 _w3 = _mm512_load_ps(kptr + 16 * 3);
                        __m512 _w4 = _mm512_load_ps(kptr + 16 * 4);
                        __m512 _w5 = _mm512_load_ps(kptr + 16 * 5);
                        __m512 _w6 = _mm512_load_ps(kptr + 16 * 6);
                        __m512 _w7 = _mm512_load_ps(kptr + 16 * 7);
                        __m512 _w8 = _mm512_load_ps(kptr + 16 * 8);
                        __m512 _w9 = _mm512_load_ps(kptr + 16 * 9);
                        __m512 _wa = _mm512_load_ps(kptr + 16 * 10);
                        __m512 _wb = _mm512_load_ps(kptr + 16 * 11);
                        __m512 _wc = _mm512_load_ps(kptr + 16 * 12);
                        __m512 _wd = _mm512_load_ps(kptr + 16 * 13);
                        __m512 _we = _mm512_load_ps(kptr + 16 * 14);
                        __m512 _wf = _mm512_load_ps(kptr + 16 * 15);

                        _sum = _mm512_fmadd_ps(_val0, _w0, _sum);
                        _sum = _mm512_fmadd_ps(_val1, _w1, _sum);
                        _sum = _mm512_fmadd_ps(_val2, _w2, _sum);
                        _sum = _mm512_fmadd_ps(_val3, _w3, _sum);
                        _sum = _mm512_fmadd_ps(_val4, _w4, _sum);
                        _sum = _mm512_fmadd_ps(_val5, _w5, _sum);
                        _sum = _mm512_fmadd_ps(_val6, _w6, _sum);
                        _sum = _mm512_fmadd_ps(_val7, _w7, _sum);
                        _sum = _mm512_fmadd_ps(_val8, _w8, _sum);
                        _sum = _mm512_fmadd_ps(_val9, _w9, _sum);
                        _sum = _mm512_fmadd_ps(_vala, _wa, _sum);
                        _sum = _mm512_fmadd_ps(_valb, _wb, _sum);
                        _sum = _mm512_fmadd_ps(_valc, _wc, _sum);
                        _sum = _mm512_fmadd_ps(_vald, _wd, _sum);
                        _sum = _mm512_fmadd_ps(_vale, _we, _sum);
                        _sum = _mm512_fmadd_ps(_valf, _wf, _sum);

                        kptr += 256;
                    }
                }

                _sum = activation_avx512(_sum, activation_type, activation_params);

                _mm512_store_ps(outptr, _sum);
                outptr += 16;
            }
        }
    }
}